

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersectorK<8,16>::
     intersect_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Primitive PVar13;
  uint uVar14;
  int iVar15;
  undefined4 uVar16;
  __int_type_conflict _Var17;
  long lVar18;
  long lVar19;
  RTCFilterFunctionN p_Var20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  ulong uVar35;
  undefined8 uVar36;
  long lVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  int iVar90;
  undefined1 auVar91 [32];
  byte bVar92;
  ulong uVar93;
  uint uVar94;
  uint uVar95;
  long lVar96;
  long lVar97;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  Geometry *pGVar98;
  uint uVar99;
  ulong uVar100;
  byte bVar101;
  ulong uVar102;
  float fVar103;
  float fVar104;
  float fVar154;
  float fVar156;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar111 [16];
  float fVar155;
  float fVar157;
  float fVar159;
  float fVar160;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar112 [16];
  float fVar158;
  float fVar161;
  float fVar162;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  float fVar163;
  float fVar164;
  undefined1 auVar166 [16];
  undefined4 uVar165;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [64];
  undefined1 auVar188 [16];
  undefined8 uVar187;
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  float fVar191;
  float fVar192;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar200;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [64];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [64];
  undefined1 auVar225 [64];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  RTCFilterFunctionNArguments local_880;
  undefined1 (*local_850) [32];
  LinearSpace3fa *local_848;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined4 local_7e0;
  undefined4 uStack_7dc;
  undefined4 uStack_7d8;
  undefined4 uStack_7d4;
  undefined4 uStack_7d0;
  undefined4 uStack_7cc;
  undefined4 uStack_7c8;
  undefined4 uStack_7c4;
  undefined1 local_7c0 [64];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  undefined4 uStack_744;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined4 local_600;
  int local_5fc;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  float local_5a0 [4];
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_3e0 [32];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  PVar13 = prim[1];
  uVar93 = (ulong)(byte)PVar13;
  lVar37 = uVar93 * 0x25;
  fVar192 = *(float *)(prim + lVar37 + 0x12);
  auVar106 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x10);
  auVar106 = vinsertps_avx(auVar106,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar105 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar166 = vinsertps_avx(auVar105,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar188 = vsubps_avx(auVar106,*(undefined1 (*) [16])(prim + lVar37 + 6));
  fVar200 = fVar192 * auVar188._0_4_;
  fVar163 = fVar192 * auVar166._0_4_;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar93 * 4 + 6);
  auVar117 = vpmovsxbd_avx2(auVar106);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + uVar93 * 5 + 6);
  auVar116 = vpmovsxbd_avx2(auVar105);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar93 * 6 + 6);
  auVar128 = vpmovsxbd_avx2(auVar6);
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar93 * 0xf + 6);
  auVar127 = vpmovsxbd_avx2(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar13 * 0x10 + 6);
  auVar122 = vpmovsxbd_avx2(auVar8);
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar118 = vcvtdq2ps_avx(auVar122);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar13 * 0x10 + uVar93 + 6);
  auVar119 = vpmovsxbd_avx2(auVar9);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar93 * 0x1a + 6);
  auVar126 = vpmovsxbd_avx2(auVar10);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar93 * 0x1b + 6);
  auVar120 = vpmovsxbd_avx2(auVar11);
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar93 * 0x1c + 6);
  auVar115 = vpmovsxbd_avx2(auVar12);
  auVar121 = vcvtdq2ps_avx(auVar115);
  auVar218._4_4_ = fVar163;
  auVar218._0_4_ = fVar163;
  auVar218._8_4_ = fVar163;
  auVar218._12_4_ = fVar163;
  auVar218._16_4_ = fVar163;
  auVar218._20_4_ = fVar163;
  auVar218._24_4_ = fVar163;
  auVar218._28_4_ = fVar163;
  auVar237._8_4_ = 1;
  auVar237._0_8_ = 0x100000001;
  auVar237._12_4_ = 1;
  auVar237._16_4_ = 1;
  auVar237._20_4_ = 1;
  auVar237._24_4_ = 1;
  auVar237._28_4_ = 1;
  auVar113 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar242 = ZEXT3264(auVar113);
  auVar124 = ZEXT1632(CONCAT412(fVar192 * auVar166._12_4_,
                                CONCAT48(fVar192 * auVar166._8_4_,
                                         CONCAT44(fVar192 * auVar166._4_4_,fVar163))));
  auVar123 = vpermps_avx2(auVar237,auVar124);
  auVar114 = vpermps_avx512vl(auVar113,auVar124);
  fVar164 = auVar114._0_4_;
  fVar182 = auVar114._4_4_;
  auVar124._4_4_ = fVar182 * auVar128._4_4_;
  auVar124._0_4_ = fVar164 * auVar128._0_4_;
  fVar183 = auVar114._8_4_;
  auVar124._8_4_ = fVar183 * auVar128._8_4_;
  fVar184 = auVar114._12_4_;
  auVar124._12_4_ = fVar184 * auVar128._12_4_;
  fVar185 = auVar114._16_4_;
  auVar124._16_4_ = fVar185 * auVar128._16_4_;
  fVar186 = auVar114._20_4_;
  auVar124._20_4_ = fVar186 * auVar128._20_4_;
  fVar191 = auVar114._24_4_;
  auVar124._24_4_ = fVar191 * auVar128._24_4_;
  auVar124._28_4_ = auVar122._28_4_;
  auVar122._4_4_ = auVar119._4_4_ * fVar182;
  auVar122._0_4_ = auVar119._0_4_ * fVar164;
  auVar122._8_4_ = auVar119._8_4_ * fVar183;
  auVar122._12_4_ = auVar119._12_4_ * fVar184;
  auVar122._16_4_ = auVar119._16_4_ * fVar185;
  auVar122._20_4_ = auVar119._20_4_ * fVar186;
  auVar122._24_4_ = auVar119._24_4_ * fVar191;
  auVar122._28_4_ = auVar115._28_4_;
  auVar115._4_4_ = auVar121._4_4_ * fVar182;
  auVar115._0_4_ = auVar121._0_4_ * fVar164;
  auVar115._8_4_ = auVar121._8_4_ * fVar183;
  auVar115._12_4_ = auVar121._12_4_ * fVar184;
  auVar115._16_4_ = auVar121._16_4_ * fVar185;
  auVar115._20_4_ = auVar121._20_4_ * fVar186;
  auVar115._24_4_ = auVar121._24_4_ * fVar191;
  auVar115._28_4_ = auVar114._28_4_;
  auVar106 = vfmadd231ps_fma(auVar124,auVar123,auVar116);
  auVar105 = vfmadd231ps_fma(auVar122,auVar123,auVar118);
  auVar6 = vfmadd231ps_fma(auVar115,auVar120,auVar123);
  auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar218,auVar117);
  auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar218,auVar127);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar126,auVar218);
  auVar235._4_4_ = fVar200;
  auVar235._0_4_ = fVar200;
  auVar235._8_4_ = fVar200;
  auVar235._12_4_ = fVar200;
  auVar235._16_4_ = fVar200;
  auVar235._20_4_ = fVar200;
  auVar235._24_4_ = fVar200;
  auVar235._28_4_ = fVar200;
  auVar115 = ZEXT1632(CONCAT412(fVar192 * auVar188._12_4_,
                                CONCAT48(fVar192 * auVar188._8_4_,
                                         CONCAT44(fVar192 * auVar188._4_4_,fVar200))));
  auVar122 = vpermps_avx2(auVar237,auVar115);
  auVar115 = vpermps_avx512vl(auVar113,auVar115);
  fVar192 = auVar115._0_4_;
  fVar164 = auVar115._4_4_;
  auVar123._4_4_ = fVar164 * auVar128._4_4_;
  auVar123._0_4_ = fVar192 * auVar128._0_4_;
  fVar182 = auVar115._8_4_;
  auVar123._8_4_ = fVar182 * auVar128._8_4_;
  fVar183 = auVar115._12_4_;
  auVar123._12_4_ = fVar183 * auVar128._12_4_;
  fVar184 = auVar115._16_4_;
  auVar123._16_4_ = fVar184 * auVar128._16_4_;
  fVar185 = auVar115._20_4_;
  auVar123._20_4_ = fVar185 * auVar128._20_4_;
  fVar186 = auVar115._24_4_;
  auVar123._24_4_ = fVar186 * auVar128._24_4_;
  auVar123._28_4_ = fVar163;
  auVar113._4_4_ = auVar119._4_4_ * fVar164;
  auVar113._0_4_ = auVar119._0_4_ * fVar192;
  auVar113._8_4_ = auVar119._8_4_ * fVar182;
  auVar113._12_4_ = auVar119._12_4_ * fVar183;
  auVar113._16_4_ = auVar119._16_4_ * fVar184;
  auVar113._20_4_ = auVar119._20_4_ * fVar185;
  auVar113._24_4_ = auVar119._24_4_ * fVar186;
  auVar113._28_4_ = auVar128._28_4_;
  auVar119._4_4_ = auVar121._4_4_ * fVar164;
  auVar119._0_4_ = auVar121._0_4_ * fVar192;
  auVar119._8_4_ = auVar121._8_4_ * fVar182;
  auVar119._12_4_ = auVar121._12_4_ * fVar183;
  auVar119._16_4_ = auVar121._16_4_ * fVar184;
  auVar119._20_4_ = auVar121._20_4_ * fVar185;
  auVar119._24_4_ = auVar121._24_4_ * fVar186;
  auVar119._28_4_ = auVar115._28_4_;
  auVar7 = vfmadd231ps_fma(auVar123,auVar122,auVar116);
  auVar8 = vfmadd231ps_fma(auVar113,auVar122,auVar118);
  auVar9 = vfmadd231ps_fma(auVar119,auVar122,auVar120);
  auVar166 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar235,auVar117);
  auVar188 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar235,auVar127);
  auVar226._8_4_ = 0x7fffffff;
  auVar226._0_8_ = 0x7fffffff7fffffff;
  auVar226._12_4_ = 0x7fffffff;
  auVar226._16_4_ = 0x7fffffff;
  auVar226._20_4_ = 0x7fffffff;
  auVar226._24_4_ = 0x7fffffff;
  auVar226._28_4_ = 0x7fffffff;
  auVar107 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar235,auVar126);
  auVar117 = vandps_avx(auVar226,ZEXT1632(auVar106));
  auVar222._8_4_ = 0x219392ef;
  auVar222._0_8_ = 0x219392ef219392ef;
  auVar222._12_4_ = 0x219392ef;
  auVar222._16_4_ = 0x219392ef;
  auVar222._20_4_ = 0x219392ef;
  auVar222._24_4_ = 0x219392ef;
  auVar222._28_4_ = 0x219392ef;
  uVar100 = vcmpps_avx512vl(auVar117,auVar222,1);
  bVar21 = (bool)((byte)uVar100 & 1);
  auVar114._0_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar106._0_4_;
  bVar21 = (bool)((byte)(uVar100 >> 1) & 1);
  auVar114._4_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar106._4_4_;
  bVar21 = (bool)((byte)(uVar100 >> 2) & 1);
  auVar114._8_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar106._8_4_;
  bVar21 = (bool)((byte)(uVar100 >> 3) & 1);
  auVar114._12_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar106._12_4_;
  auVar114._16_4_ = (uint)((byte)(uVar100 >> 4) & 1) * 0x219392ef;
  auVar114._20_4_ = (uint)((byte)(uVar100 >> 5) & 1) * 0x219392ef;
  auVar114._24_4_ = (uint)((byte)(uVar100 >> 6) & 1) * 0x219392ef;
  auVar114._28_4_ = (uint)(byte)(uVar100 >> 7) * 0x219392ef;
  auVar117 = vandps_avx(auVar226,ZEXT1632(auVar105));
  uVar100 = vcmpps_avx512vl(auVar117,auVar222,1);
  bVar21 = (bool)((byte)uVar100 & 1);
  auVar125._0_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar105._0_4_;
  bVar21 = (bool)((byte)(uVar100 >> 1) & 1);
  auVar125._4_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar105._4_4_;
  bVar21 = (bool)((byte)(uVar100 >> 2) & 1);
  auVar125._8_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar105._8_4_;
  bVar21 = (bool)((byte)(uVar100 >> 3) & 1);
  auVar125._12_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar105._12_4_;
  auVar125._16_4_ = (uint)((byte)(uVar100 >> 4) & 1) * 0x219392ef;
  auVar125._20_4_ = (uint)((byte)(uVar100 >> 5) & 1) * 0x219392ef;
  auVar125._24_4_ = (uint)((byte)(uVar100 >> 6) & 1) * 0x219392ef;
  auVar125._28_4_ = (uint)(byte)(uVar100 >> 7) * 0x219392ef;
  auVar117 = vandps_avx(auVar226,ZEXT1632(auVar6));
  uVar100 = vcmpps_avx512vl(auVar117,auVar222,1);
  bVar21 = (bool)((byte)uVar100 & 1);
  auVar117._0_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar6._0_4_;
  bVar21 = (bool)((byte)(uVar100 >> 1) & 1);
  auVar117._4_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar6._4_4_;
  bVar21 = (bool)((byte)(uVar100 >> 2) & 1);
  auVar117._8_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar6._8_4_;
  bVar21 = (bool)((byte)(uVar100 >> 3) & 1);
  auVar117._12_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar6._12_4_;
  auVar117._16_4_ = (uint)((byte)(uVar100 >> 4) & 1) * 0x219392ef;
  auVar117._20_4_ = (uint)((byte)(uVar100 >> 5) & 1) * 0x219392ef;
  auVar117._24_4_ = (uint)((byte)(uVar100 >> 6) & 1) * 0x219392ef;
  auVar117._28_4_ = (uint)(byte)(uVar100 >> 7) * 0x219392ef;
  auVar116 = vrcp14ps_avx512vl(auVar114);
  auVar223._8_4_ = 0x3f800000;
  auVar223._0_8_ = 0x3f8000003f800000;
  auVar223._12_4_ = 0x3f800000;
  auVar223._16_4_ = 0x3f800000;
  auVar223._20_4_ = 0x3f800000;
  auVar223._24_4_ = 0x3f800000;
  auVar223._28_4_ = 0x3f800000;
  auVar106 = vfnmadd213ps_fma(auVar114,auVar116,auVar223);
  auVar106 = vfmadd132ps_fma(ZEXT1632(auVar106),auVar116,auVar116);
  auVar116 = vrcp14ps_avx512vl(auVar125);
  auVar105 = vfnmadd213ps_fma(auVar125,auVar116,auVar223);
  auVar105 = vfmadd132ps_fma(ZEXT1632(auVar105),auVar116,auVar116);
  auVar116 = vrcp14ps_avx512vl(auVar117);
  auVar6 = vfnmadd213ps_fma(auVar117,auVar116,auVar223);
  auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar116,auVar116);
  fVar192 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar37 + 0x16)) *
            *(float *)(prim + lVar37 + 0x1a);
  auVar221._4_4_ = fVar192;
  auVar221._0_4_ = fVar192;
  auVar221._8_4_ = fVar192;
  auVar221._12_4_ = fVar192;
  auVar221._16_4_ = fVar192;
  auVar221._20_4_ = fVar192;
  auVar221._24_4_ = fVar192;
  auVar221._28_4_ = fVar192;
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 * 7 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar116 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 * 0xb + 6));
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar116 = vsubps_avx(auVar116,auVar117);
  auVar128 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 * 9 + 6));
  auVar7 = vfmadd213ps_fma(auVar116,auVar221,auVar117);
  auVar117 = vcvtdq2ps_avx(auVar128);
  auVar116 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 * 0xd + 6));
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar116 = vsubps_avx(auVar116,auVar117);
  auVar8 = vfmadd213ps_fma(auVar116,auVar221,auVar117);
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 * 0x12 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  uVar100 = (ulong)(uint)((int)(uVar93 * 5) << 2);
  auVar116 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 * 2 + uVar100 + 6));
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar116 = vsubps_avx(auVar116,auVar117);
  auVar9 = vfmadd213ps_fma(auVar116,auVar221,auVar117);
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar116 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 * 0x18 + 6));
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar116 = vsubps_avx(auVar116,auVar117);
  auVar10 = vfmadd213ps_fma(auVar116,auVar221,auVar117);
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 * 0x1d + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar116 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 + (ulong)(byte)PVar13 * 0x20 + 6));
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar116 = vsubps_avx(auVar116,auVar117);
  auVar11 = vfmadd213ps_fma(auVar116,auVar221,auVar117);
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar13 * 0x20 - uVar93) + 6)
                           );
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar116 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 * 0x23 + 6));
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar116 = vsubps_avx(auVar116,auVar117);
  auVar12 = vfmadd213ps_fma(auVar116,auVar221,auVar117);
  auVar117 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar166));
  auVar126._4_4_ = auVar106._4_4_ * auVar117._4_4_;
  auVar126._0_4_ = auVar106._0_4_ * auVar117._0_4_;
  auVar126._8_4_ = auVar106._8_4_ * auVar117._8_4_;
  auVar126._12_4_ = auVar106._12_4_ * auVar117._12_4_;
  auVar126._16_4_ = auVar117._16_4_ * 0.0;
  auVar126._20_4_ = auVar117._20_4_ * 0.0;
  auVar126._24_4_ = auVar117._24_4_ * 0.0;
  auVar126._28_4_ = auVar117._28_4_;
  auVar117 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar166));
  auVar197._0_4_ = auVar106._0_4_ * auVar117._0_4_;
  auVar197._4_4_ = auVar106._4_4_ * auVar117._4_4_;
  auVar197._8_4_ = auVar106._8_4_ * auVar117._8_4_;
  auVar197._12_4_ = auVar106._12_4_ * auVar117._12_4_;
  auVar197._16_4_ = auVar117._16_4_ * 0.0;
  auVar197._20_4_ = auVar117._20_4_ * 0.0;
  auVar197._24_4_ = auVar117._24_4_ * 0.0;
  auVar197._28_4_ = 0;
  auVar117 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar188));
  auVar120._4_4_ = auVar105._4_4_ * auVar117._4_4_;
  auVar120._0_4_ = auVar105._0_4_ * auVar117._0_4_;
  auVar120._8_4_ = auVar105._8_4_ * auVar117._8_4_;
  auVar120._12_4_ = auVar105._12_4_ * auVar117._12_4_;
  auVar120._16_4_ = auVar117._16_4_ * 0.0;
  auVar120._20_4_ = auVar117._20_4_ * 0.0;
  auVar120._24_4_ = auVar117._24_4_ * 0.0;
  auVar120._28_4_ = auVar117._28_4_;
  auVar117 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar188));
  auVar189._0_4_ = auVar105._0_4_ * auVar117._0_4_;
  auVar189._4_4_ = auVar105._4_4_ * auVar117._4_4_;
  auVar189._8_4_ = auVar105._8_4_ * auVar117._8_4_;
  auVar189._12_4_ = auVar105._12_4_ * auVar117._12_4_;
  auVar189._16_4_ = auVar117._16_4_ * 0.0;
  auVar189._20_4_ = auVar117._20_4_ * 0.0;
  auVar189._24_4_ = auVar117._24_4_ * 0.0;
  auVar189._28_4_ = 0;
  auVar117 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar107));
  auVar121._4_4_ = auVar6._4_4_ * auVar117._4_4_;
  auVar121._0_4_ = auVar6._0_4_ * auVar117._0_4_;
  auVar121._8_4_ = auVar6._8_4_ * auVar117._8_4_;
  auVar121._12_4_ = auVar6._12_4_ * auVar117._12_4_;
  auVar121._16_4_ = auVar117._16_4_ * 0.0;
  auVar121._20_4_ = auVar117._20_4_ * 0.0;
  auVar121._24_4_ = auVar117._24_4_ * 0.0;
  auVar121._28_4_ = auVar117._28_4_;
  auVar117 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar107));
  auVar171._0_4_ = auVar6._0_4_ * auVar117._0_4_;
  auVar171._4_4_ = auVar6._4_4_ * auVar117._4_4_;
  auVar171._8_4_ = auVar6._8_4_ * auVar117._8_4_;
  auVar171._12_4_ = auVar6._12_4_ * auVar117._12_4_;
  auVar171._16_4_ = auVar117._16_4_ * 0.0;
  auVar171._20_4_ = auVar117._20_4_ * 0.0;
  auVar171._24_4_ = auVar117._24_4_ * 0.0;
  auVar171._28_4_ = 0;
  auVar117 = vpminsd_avx2(auVar126,auVar197);
  auVar116 = vpminsd_avx2(auVar120,auVar189);
  auVar117 = vmaxps_avx(auVar117,auVar116);
  auVar116 = vpminsd_avx2(auVar121,auVar171);
  uVar165 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar128._4_4_ = uVar165;
  auVar128._0_4_ = uVar165;
  auVar128._8_4_ = uVar165;
  auVar128._12_4_ = uVar165;
  auVar128._16_4_ = uVar165;
  auVar128._20_4_ = uVar165;
  auVar128._24_4_ = uVar165;
  auVar128._28_4_ = uVar165;
  auVar116 = vmaxps_avx512vl(auVar116,auVar128);
  auVar117 = vmaxps_avx(auVar117,auVar116);
  auVar116._8_4_ = 0x3f7ffffa;
  auVar116._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar116._12_4_ = 0x3f7ffffa;
  auVar116._16_4_ = 0x3f7ffffa;
  auVar116._20_4_ = 0x3f7ffffa;
  auVar116._24_4_ = 0x3f7ffffa;
  auVar116._28_4_ = 0x3f7ffffa;
  local_320 = vmulps_avx512vl(auVar117,auVar116);
  auVar117 = vpmaxsd_avx2(auVar126,auVar197);
  auVar116 = vpmaxsd_avx2(auVar120,auVar189);
  auVar117 = vminps_avx(auVar117,auVar116);
  auVar116 = vpmaxsd_avx2(auVar121,auVar171);
  uVar165 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar127._4_4_ = uVar165;
  auVar127._0_4_ = uVar165;
  auVar127._8_4_ = uVar165;
  auVar127._12_4_ = uVar165;
  auVar127._16_4_ = uVar165;
  auVar127._20_4_ = uVar165;
  auVar127._24_4_ = uVar165;
  auVar127._28_4_ = uVar165;
  auVar116 = vminps_avx512vl(auVar116,auVar127);
  auVar117 = vminps_avx(auVar117,auVar116);
  auVar118._8_4_ = 0x3f800003;
  auVar118._0_8_ = 0x3f8000033f800003;
  auVar118._12_4_ = 0x3f800003;
  auVar118._16_4_ = 0x3f800003;
  auVar118._20_4_ = 0x3f800003;
  auVar118._24_4_ = 0x3f800003;
  auVar118._28_4_ = 0x3f800003;
  auVar117 = vmulps_avx512vl(auVar117,auVar118);
  auVar116 = vpbroadcastd_avx512vl();
  uVar36 = vpcmpgtd_avx512vl(auVar116,_DAT_01fe9900);
  uVar187 = vcmpps_avx512vl(local_320,auVar117,2);
  if ((byte)((byte)uVar187 & (byte)uVar36) != 0) {
    uVar100 = (ulong)(byte)((byte)uVar187 & (byte)uVar36);
    local_848 = pre->ray_space + k;
    local_850 = (undefined1 (*) [32])local_100;
    auVar243 = ZEXT464(0xbf800000);
    auVar181 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar181);
    do {
      auVar181 = local_480;
      lVar37 = 0;
      for (uVar93 = uVar100; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x8000000000000000) {
        lVar37 = lVar37 + 1;
      }
      uVar99 = *(uint *)(prim + 2);
      uVar14 = *(uint *)(prim + lVar37 * 4 + 6);
      pGVar98 = (context->scene->geometries).items[uVar99].ptr;
      uVar93 = (ulong)*(uint *)(*(long *)&pGVar98->field_0x58 +
                               (ulong)uVar14 *
                               pGVar98[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar192 = (pGVar98->time_range).lower;
      fVar192 = pGVar98->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x1c0) - fVar192) /
                ((pGVar98->time_range).upper - fVar192));
      auVar106 = vroundss_avx(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192),9);
      auVar105 = vaddss_avx512f(ZEXT416((uint)pGVar98->fnumTimeSegments),auVar243._0_16_);
      auVar106 = vminss_avx(auVar106,auVar105);
      auVar106 = vmaxss_avx(ZEXT816(0) << 0x20,auVar106);
      fVar192 = fVar192 - auVar106._0_4_;
      fVar163 = 1.0 - fVar192;
      _Var17 = pGVar98[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar96 = (long)(int)auVar106._0_4_ * 0x38;
      lVar97 = *(long *)(_Var17 + 0x10 + lVar96);
      lVar18 = *(long *)(_Var17 + 0x38 + lVar96);
      lVar19 = *(long *)(_Var17 + 0x48 + lVar96);
      auVar166._4_4_ = fVar192;
      auVar166._0_4_ = fVar192;
      auVar166._8_4_ = fVar192;
      auVar166._12_4_ = fVar192;
      pfVar3 = (float *)(lVar18 + lVar19 * uVar93);
      auVar107._0_4_ = fVar192 * *pfVar3;
      auVar107._4_4_ = fVar192 * pfVar3[1];
      auVar107._8_4_ = fVar192 * pfVar3[2];
      auVar107._12_4_ = fVar192 * pfVar3[3];
      lVar37 = uVar93 + 1;
      auVar106 = vmulps_avx512vl(auVar166,*(undefined1 (*) [16])(lVar18 + lVar19 * lVar37));
      p_Var20 = pGVar98[4].occlusionFilterN;
      auVar188._4_4_ = fVar163;
      auVar188._0_4_ = fVar163;
      auVar188._8_4_ = fVar163;
      auVar188._12_4_ = fVar163;
      auVar7 = vfmadd231ps_fma(auVar107,auVar188,
                               *(undefined1 (*) [16])(*(long *)(_Var17 + lVar96) + lVar97 * uVar93))
      ;
      auVar107 = vfmadd231ps_avx512vl
                           (auVar106,auVar188,
                            *(undefined1 (*) [16])(*(long *)(_Var17 + lVar96) + lVar97 * lVar37));
      pfVar3 = (float *)(*(long *)(p_Var20 + lVar96 + 0x38) +
                        uVar93 * *(long *)(p_Var20 + lVar96 + 0x48));
      auVar228._0_4_ = fVar192 * *pfVar3;
      auVar228._4_4_ = fVar192 * pfVar3[1];
      auVar228._8_4_ = fVar192 * pfVar3[2];
      auVar228._12_4_ = fVar192 * pfVar3[3];
      pfVar3 = (float *)(*(long *)(p_Var20 + lVar96 + 0x38) +
                        *(long *)(p_Var20 + lVar96 + 0x48) * lVar37);
      auVar232._0_4_ = fVar192 * *pfVar3;
      auVar232._4_4_ = fVar192 * pfVar3[1];
      auVar232._8_4_ = fVar192 * pfVar3[2];
      auVar232._12_4_ = fVar192 * pfVar3[3];
      auVar105 = vfmadd231ps_fma(auVar228,auVar188,
                                 *(undefined1 (*) [16])
                                  (*(long *)(p_Var20 + lVar96) +
                                  *(long *)(p_Var20 + lVar96 + 0x10) * uVar93));
      auVar6 = vfmadd231ps_fma(auVar232,auVar188,
                               *(undefined1 (*) [16])
                                (*(long *)(p_Var20 + lVar96) +
                                *(long *)(p_Var20 + lVar96 + 0x10) * lVar37));
      iVar15 = (int)pGVar98[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar106 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x1c);
      auVar106 = vinsertps_avx(auVar106,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      lVar37 = (long)iVar15 * 0x44;
      auVar108._8_4_ = 0xbeaaaaab;
      auVar108._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar108._12_4_ = 0xbeaaaaab;
      auVar188 = vfnmadd213ps_fma(auVar105,auVar108,auVar7);
      auVar108 = vfmadd213ps_avx512vl(auVar6,auVar108,auVar107);
      auVar6 = vsubps_avx(auVar7,auVar106);
      uVar165 = auVar6._0_4_;
      auVar110._4_4_ = uVar165;
      auVar110._0_4_ = uVar165;
      auVar110._8_4_ = uVar165;
      auVar110._12_4_ = uVar165;
      auVar105 = vshufps_avx(auVar6,auVar6,0x55);
      aVar4 = (local_848->vx).field_0;
      aVar5 = (local_848->vy).field_0;
      fVar192 = (local_848->vz).field_0.m128[0];
      fVar163 = *(float *)((long)&(local_848->vz).field_0 + 4);
      fVar164 = *(float *)((long)&(local_848->vz).field_0 + 8);
      fVar182 = *(float *)((long)&(local_848->vz).field_0 + 0xc);
      auVar6 = vshufps_avx(auVar6,auVar6,0xaa);
      auVar231._0_4_ = fVar192 * auVar6._0_4_;
      auVar231._4_4_ = fVar163 * auVar6._4_4_;
      auVar231._8_4_ = fVar164 * auVar6._8_4_;
      auVar231._12_4_ = fVar182 * auVar6._12_4_;
      auVar105 = vfmadd231ps_fma(auVar231,(undefined1  [16])aVar5,auVar105);
      auVar8 = vfmadd231ps_fma(auVar105,(undefined1  [16])aVar4,auVar110);
      auVar6 = vsubps_avx(auVar188,auVar106);
      uVar165 = auVar6._0_4_;
      auVar111._4_4_ = uVar165;
      auVar111._0_4_ = uVar165;
      auVar111._8_4_ = uVar165;
      auVar111._12_4_ = uVar165;
      auVar105 = vshufps_avx(auVar6,auVar6,0x55);
      auVar6 = vshufps_avx(auVar6,auVar6,0xaa);
      auVar233._0_4_ = fVar192 * auVar6._0_4_;
      auVar233._4_4_ = fVar163 * auVar6._4_4_;
      auVar233._8_4_ = fVar164 * auVar6._8_4_;
      auVar233._12_4_ = fVar182 * auVar6._12_4_;
      auVar105 = vfmadd231ps_fma(auVar233,(undefined1  [16])aVar5,auVar105);
      auVar9 = vfmadd231ps_fma(auVar105,(undefined1  [16])aVar4,auVar111);
      auVar6 = vsubps_avx(auVar108,auVar106);
      uVar165 = auVar6._0_4_;
      auVar112._4_4_ = uVar165;
      auVar112._0_4_ = uVar165;
      auVar112._8_4_ = uVar165;
      auVar112._12_4_ = uVar165;
      auVar105 = vshufps_avx(auVar6,auVar6,0x55);
      auVar6 = vshufps_avx(auVar6,auVar6,0xaa);
      auVar234._0_4_ = fVar192 * auVar6._0_4_;
      auVar234._4_4_ = fVar163 * auVar6._4_4_;
      auVar234._8_4_ = fVar164 * auVar6._8_4_;
      auVar234._12_4_ = fVar182 * auVar6._12_4_;
      auVar105 = vfmadd231ps_fma(auVar234,(undefined1  [16])aVar5,auVar105);
      auVar6 = vfmadd231ps_fma(auVar105,(undefined1  [16])aVar4,auVar112);
      auVar105 = vsubps_avx512vl(auVar107,auVar106);
      uVar165 = auVar105._0_4_;
      auVar109._4_4_ = uVar165;
      auVar109._0_4_ = uVar165;
      auVar109._8_4_ = uVar165;
      auVar109._12_4_ = uVar165;
      auVar106 = vshufps_avx(auVar105,auVar105,0x55);
      auVar105 = vshufps_avx(auVar105,auVar105,0xaa);
      auVar236._0_4_ = fVar192 * auVar105._0_4_;
      auVar236._4_4_ = fVar163 * auVar105._4_4_;
      auVar236._8_4_ = fVar164 * auVar105._8_4_;
      auVar236._12_4_ = fVar182 * auVar105._12_4_;
      auVar106 = vfmadd231ps_fma(auVar236,(undefined1  [16])aVar5,auVar106);
      auVar10 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar4,auVar109);
      auVar117 = *(undefined1 (*) [32])(bezier_basis0 + lVar37);
      uVar165 = auVar8._0_4_;
      local_680._4_4_ = uVar165;
      local_680._0_4_ = uVar165;
      local_680._8_4_ = uVar165;
      local_680._12_4_ = uVar165;
      local_680._16_4_ = uVar165;
      local_680._20_4_ = uVar165;
      local_680._24_4_ = uVar165;
      local_680._28_4_ = uVar165;
      auVar116 = *(undefined1 (*) [32])(bezier_basis0 + lVar37 + 0x484);
      auVar172._8_4_ = 1;
      auVar172._0_8_ = 0x100000001;
      auVar172._12_4_ = 1;
      auVar172._16_4_ = 1;
      auVar172._20_4_ = 1;
      auVar172._24_4_ = 1;
      auVar172._28_4_ = 1;
      local_6a0 = vpermps_avx2(auVar172,ZEXT1632(auVar8));
      uVar165 = auVar9._0_4_;
      auVar201._4_4_ = uVar165;
      auVar201._0_4_ = uVar165;
      auVar201._8_4_ = uVar165;
      auVar201._12_4_ = uVar165;
      local_6c0._16_4_ = uVar165;
      local_6c0._0_16_ = auVar201;
      local_6c0._20_4_ = uVar165;
      local_6c0._24_4_ = uVar165;
      local_6c0._28_4_ = uVar165;
      local_6e0 = vpermps_avx512vl(auVar172,ZEXT1632(auVar9));
      auVar128 = *(undefined1 (*) [32])(bezier_basis0 + lVar37 + 0x908);
      local_700 = vbroadcastss_avx512vl(auVar6);
      local_720 = vpermps_avx512vl(auVar172,ZEXT1632(auVar6));
      auVar127 = *(undefined1 (*) [32])(bezier_basis0 + lVar37 + 0xd8c);
      uVar165 = auVar10._0_4_;
      local_740._4_4_ = uVar165;
      local_740._0_4_ = uVar165;
      fStack_738 = (float)uVar165;
      fStack_734 = (float)uVar165;
      fStack_730 = (float)uVar165;
      fStack_72c = (float)uVar165;
      fStack_728 = (float)uVar165;
      register0x0000139c = uVar165;
      _local_760 = vpermps_avx512vl(auVar172,ZEXT1632(auVar10));
      auVar118 = vmulps_avx512vl(_local_740,auVar127);
      auVar119 = vmulps_avx512vl(_local_760,auVar127);
      auVar118 = vfmadd231ps_avx512vl(auVar118,auVar128,local_700);
      auVar119 = vfmadd231ps_avx512vl(auVar119,auVar128,local_720);
      auVar118 = vfmadd231ps_avx512vl(auVar118,auVar116,local_6c0);
      auVar120 = vfmadd231ps_avx512vl(auVar119,auVar116,local_6e0);
      auVar121 = vfmadd231ps_avx512vl(auVar118,auVar117,local_680);
      auVar219 = ZEXT3264(auVar121);
      auVar118 = *(undefined1 (*) [32])(bezier_basis1 + lVar37);
      auVar119 = *(undefined1 (*) [32])(bezier_basis1 + lVar37 + 0x484);
      auVar126 = *(undefined1 (*) [32])(bezier_basis1 + lVar37 + 0x908);
      auVar122 = vfmadd231ps_avx512vl(auVar120,auVar117,local_6a0);
      auVar213 = ZEXT3264(auVar122);
      auVar120 = *(undefined1 (*) [32])(bezier_basis1 + lVar37 + 0xd8c);
      auVar115 = vmulps_avx512vl(_local_740,auVar120);
      auVar123 = vmulps_avx512vl(_local_760,auVar120);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar126,local_700);
      auVar123 = vfmadd231ps_avx512vl(auVar123,auVar126,local_720);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar119,local_6c0);
      auVar123 = vfmadd231ps_avx512vl(auVar123,auVar119,local_6e0);
      auVar11 = vfmadd231ps_fma(auVar115,auVar118,local_680);
      auVar224 = ZEXT1664(auVar11);
      auVar12 = vfmadd231ps_fma(auVar123,auVar118,local_6a0);
      auVar115 = vsubps_avx512vl(ZEXT1632(auVar11),auVar121);
      auVar123 = vsubps_avx512vl(ZEXT1632(auVar12),auVar122);
      auVar124 = vmulps_avx512vl(auVar122,auVar115);
      auVar113 = vmulps_avx512vl(auVar121,auVar123);
      auVar124 = vsubps_avx512vl(auVar124,auVar113);
      auVar106 = vshufps_avx(auVar7,auVar7,0xff);
      uVar187 = auVar106._0_8_;
      local_340._8_8_ = uVar187;
      local_340._0_8_ = uVar187;
      local_340._16_8_ = uVar187;
      local_340._24_8_ = uVar187;
      auVar106 = vshufps_avx(auVar188,auVar188,0xff);
      local_360 = vbroadcastsd_avx512vl(auVar106);
      auVar106 = vshufps_avx(auVar108,auVar108,0xff);
      local_380 = vbroadcastsd_avx512vl(auVar106);
      auVar106 = vshufps_avx512vl(auVar107,auVar107,0xff);
      uVar187 = auVar106._0_8_;
      local_3a0._8_8_ = uVar187;
      local_3a0._0_8_ = uVar187;
      local_3a0._16_8_ = uVar187;
      local_3a0._24_8_ = uVar187;
      auVar113 = vmulps_avx512vl(local_3a0,auVar127);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar128,local_380);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar116,local_360);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar117,local_340);
      auVar114 = vmulps_avx512vl(local_3a0,auVar120);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar126,local_380);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar119,local_360);
      auVar166 = vfmadd231ps_fma(auVar114,auVar118,local_340);
      auVar114 = vmulps_avx512vl(auVar123,auVar123);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar115,auVar115);
      auVar125 = vmaxps_avx512vl(auVar113,ZEXT1632(auVar166));
      auVar125 = vmulps_avx512vl(auVar125,auVar125);
      auVar114 = vmulps_avx512vl(auVar125,auVar114);
      auVar124 = vmulps_avx512vl(auVar124,auVar124);
      uVar187 = vcmpps_avx512vl(auVar124,auVar114,2);
      auVar106 = vblendps_avx(auVar8,auVar7,8);
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar105 = vandps_avx512vl(auVar106,auVar109);
      auVar106 = vblendps_avx(auVar9,auVar188,8);
      auVar106 = vandps_avx512vl(auVar106,auVar109);
      auVar105 = vmaxps_avx(auVar105,auVar106);
      auVar106 = vblendps_avx(auVar6,auVar108,8);
      auVar110 = vandps_avx512vl(auVar106,auVar109);
      auVar106 = vblendps_avx(auVar10,auVar107,8);
      auVar106 = vandps_avx512vl(auVar106,auVar109);
      auVar106 = vmaxps_avx(auVar110,auVar106);
      auVar106 = vmaxps_avx(auVar105,auVar106);
      auVar105 = vmovshdup_avx(auVar106);
      auVar105 = vmaxss_avx(auVar105,auVar106);
      auVar106 = vshufpd_avx(auVar106,auVar106,1);
      auVar106 = vmaxss_avx(auVar106,auVar105);
      auVar227._0_4_ = (float)iVar15;
      local_480._4_12_ = auVar108._4_12_;
      local_480._0_4_ = auVar227._0_4_;
      local_480._16_48_ = auVar181._16_48_;
      auVar227._4_4_ = auVar227._0_4_;
      auVar227._8_4_ = auVar227._0_4_;
      auVar227._12_4_ = auVar227._0_4_;
      auVar227._16_4_ = auVar227._0_4_;
      auVar227._20_4_ = auVar227._0_4_;
      auVar227._24_4_ = auVar227._0_4_;
      auVar227._28_4_ = auVar227._0_4_;
      uVar36 = vcmpps_avx512vl(auVar227,_DAT_01faff40,0xe);
      bVar101 = (byte)uVar187 & (byte)uVar36;
      fVar192 = auVar106._0_4_ * 4.7683716e-07;
      local_820._0_16_ = ZEXT416((uint)fVar192);
      auVar124 = auVar242._0_32_;
      local_4e0 = vpermps_avx512vl(auVar124,ZEXT1632(auVar8));
      local_500 = vpermps_avx512vl(auVar124,ZEXT1632(auVar9));
      local_520 = vpermps_avx512vl(auVar124,ZEXT1632(auVar6));
      local_540 = vpermps_avx512vl(auVar124,ZEXT1632(auVar10));
      local_7e0 = *(undefined4 *)(ray + k * 4 + 0xc0);
      uStack_7dc = 0;
      uStack_7d8 = 0;
      uStack_7d4 = 0;
      local_890 = auVar7._0_8_;
      uStack_888 = auVar7._8_8_;
      local_8b0 = auVar188._0_8_;
      uStack_8a8 = auVar188._8_8_;
      local_8c0 = auVar108._0_8_;
      uStack_8b8 = auVar108._8_8_;
      local_8a0._0_4_ = auVar107._0_4_;
      fVar163 = (float)local_8a0;
      local_8a0._4_4_ = auVar107._4_4_;
      fVar164 = local_8a0._4_4_;
      uStack_898._0_4_ = auVar107._8_4_;
      fVar182 = (float)uStack_898;
      uStack_898._4_4_ = auVar107._12_4_;
      fVar183 = uStack_898._4_4_;
      local_8a0 = auVar107._0_8_;
      uStack_898 = auVar107._8_8_;
      if (bVar101 != 0) {
        auVar120 = vmulps_avx512vl(local_540,auVar120);
        auVar126 = vfmadd213ps_avx512vl(auVar126,local_520,auVar120);
        auVar119 = vfmadd213ps_avx512vl(auVar119,local_500,auVar126);
        auVar119 = vfmadd213ps_avx512vl(auVar118,local_4e0,auVar119);
        auVar127 = vmulps_avx512vl(local_540,auVar127);
        auVar128 = vfmadd213ps_avx512vl(auVar128,local_520,auVar127);
        auVar126 = vfmadd213ps_avx512vl(auVar116,local_500,auVar128);
        auVar116 = *(undefined1 (*) [32])(bezier_basis0 + lVar37 + 0x1210);
        auVar128 = *(undefined1 (*) [32])(bezier_basis0 + lVar37 + 0x1694);
        auVar127 = *(undefined1 (*) [32])(bezier_basis0 + lVar37 + 0x1b18);
        auVar118 = *(undefined1 (*) [32])(bezier_basis0 + lVar37 + 0x1f9c);
        auVar126 = vfmadd213ps_avx512vl(auVar117,local_4e0,auVar126);
        auVar117 = vmulps_avx512vl(_local_740,auVar118);
        auVar120 = vmulps_avx512vl(_local_760,auVar118);
        auVar118 = vmulps_avx512vl(local_540,auVar118);
        auVar117 = vfmadd231ps_avx512vl(auVar117,auVar127,local_700);
        auVar120 = vfmadd231ps_avx512vl(auVar120,auVar127,local_720);
        auVar127 = vfmadd231ps_avx512vl(auVar118,local_520,auVar127);
        auVar117 = vfmadd231ps_avx512vl(auVar117,auVar128,local_6c0);
        auVar118 = vfmadd231ps_avx512vl(auVar120,auVar128,local_6e0);
        auVar120 = vfmadd231ps_avx512vl(auVar127,local_500,auVar128);
        auVar106 = vfmadd231ps_fma(auVar117,auVar116,local_680);
        auVar118 = vfmadd231ps_avx512vl(auVar118,auVar116,local_6a0);
        auVar117 = *(undefined1 (*) [32])(bezier_basis1 + lVar37 + 0x1210);
        auVar128 = *(undefined1 (*) [32])(bezier_basis1 + lVar37 + 0x1b18);
        auVar127 = *(undefined1 (*) [32])(bezier_basis1 + lVar37 + 0x1f9c);
        auVar120 = vfmadd231ps_avx512vl(auVar120,local_4e0,auVar116);
        auVar116 = vmulps_avx512vl(_local_740,auVar127);
        auVar124 = vmulps_avx512vl(_local_760,auVar127);
        auVar127 = vmulps_avx512vl(local_540,auVar127);
        auVar114 = vfmadd231ps_avx512vl(auVar116,auVar128,local_700);
        auVar124 = vfmadd231ps_avx512vl(auVar124,auVar128,local_720);
        auVar128 = vfmadd231ps_avx512vl(auVar127,local_520,auVar128);
        auVar116 = *(undefined1 (*) [32])(bezier_basis1 + lVar37 + 0x1694);
        auVar127 = vfmadd231ps_avx512vl(auVar114,auVar116,local_6c0);
        auVar124 = vfmadd231ps_avx512vl(auVar124,auVar116,local_6e0);
        auVar116 = vfmadd231ps_avx512vl(auVar128,local_500,auVar116);
        auVar105 = vfmadd231ps_fma(auVar127,auVar117,local_680);
        auVar128 = vfmadd231ps_avx512vl(auVar124,auVar117,local_6a0);
        auVar127 = vfmadd231ps_avx512vl(auVar116,local_4e0,auVar117);
        auVar243 = ZEXT1664(auVar243._0_16_);
        auVar117 = vbroadcastss_avx512vl(ZEXT416(2));
        auVar242 = ZEXT3264(auVar117);
        auVar238._8_4_ = 0x7fffffff;
        auVar238._0_8_ = 0x7fffffff7fffffff;
        auVar238._12_4_ = 0x7fffffff;
        auVar238._16_4_ = 0x7fffffff;
        auVar238._20_4_ = 0x7fffffff;
        auVar238._24_4_ = 0x7fffffff;
        auVar238._28_4_ = 0x7fffffff;
        auVar117 = vandps_avx(ZEXT1632(auVar106),auVar238);
        auVar116 = vandps_avx(auVar118,auVar238);
        auVar116 = vmaxps_avx(auVar117,auVar116);
        auVar117 = vandps_avx(auVar120,auVar238);
        auVar117 = vmaxps_avx(auVar116,auVar117);
        auVar229._4_4_ = fVar192;
        auVar229._0_4_ = fVar192;
        auVar229._8_4_ = fVar192;
        auVar229._12_4_ = fVar192;
        auVar229._16_4_ = fVar192;
        auVar229._20_4_ = fVar192;
        auVar229._24_4_ = fVar192;
        auVar229._28_4_ = fVar192;
        uVar93 = vcmpps_avx512vl(auVar117,auVar229,1);
        bVar21 = (bool)((byte)uVar93 & 1);
        auVar129._0_4_ = (float)((uint)bVar21 * auVar115._0_4_ | (uint)!bVar21 * auVar106._0_4_);
        bVar21 = (bool)((byte)(uVar93 >> 1) & 1);
        auVar129._4_4_ = (float)((uint)bVar21 * auVar115._4_4_ | (uint)!bVar21 * auVar106._4_4_);
        bVar21 = (bool)((byte)(uVar93 >> 2) & 1);
        auVar129._8_4_ = (float)((uint)bVar21 * auVar115._8_4_ | (uint)!bVar21 * auVar106._8_4_);
        bVar21 = (bool)((byte)(uVar93 >> 3) & 1);
        auVar129._12_4_ = (float)((uint)bVar21 * auVar115._12_4_ | (uint)!bVar21 * auVar106._12_4_);
        fVar192 = (float)((uint)((byte)(uVar93 >> 4) & 1) * auVar115._16_4_);
        auVar129._16_4_ = fVar192;
        fVar185 = (float)((uint)((byte)(uVar93 >> 5) & 1) * auVar115._20_4_);
        auVar129._20_4_ = fVar185;
        fVar184 = (float)((uint)((byte)(uVar93 >> 6) & 1) * auVar115._24_4_);
        auVar129._24_4_ = fVar184;
        auVar129._28_4_ = (uint)(byte)(uVar93 >> 7) * auVar115._28_4_;
        bVar21 = (bool)((byte)uVar93 & 1);
        auVar130._0_4_ = (float)((uint)bVar21 * auVar123._0_4_ | (uint)!bVar21 * auVar118._0_4_);
        bVar21 = (bool)((byte)(uVar93 >> 1) & 1);
        auVar130._4_4_ = (float)((uint)bVar21 * auVar123._4_4_ | (uint)!bVar21 * auVar118._4_4_);
        bVar21 = (bool)((byte)(uVar93 >> 2) & 1);
        auVar130._8_4_ = (float)((uint)bVar21 * auVar123._8_4_ | (uint)!bVar21 * auVar118._8_4_);
        bVar21 = (bool)((byte)(uVar93 >> 3) & 1);
        auVar130._12_4_ = (float)((uint)bVar21 * auVar123._12_4_ | (uint)!bVar21 * auVar118._12_4_);
        bVar21 = (bool)((byte)(uVar93 >> 4) & 1);
        auVar130._16_4_ = (float)((uint)bVar21 * auVar123._16_4_ | (uint)!bVar21 * auVar118._16_4_);
        bVar21 = (bool)((byte)(uVar93 >> 5) & 1);
        auVar130._20_4_ = (float)((uint)bVar21 * auVar123._20_4_ | (uint)!bVar21 * auVar118._20_4_);
        bVar21 = (bool)((byte)(uVar93 >> 6) & 1);
        auVar130._24_4_ = (float)((uint)bVar21 * auVar123._24_4_ | (uint)!bVar21 * auVar118._24_4_);
        bVar21 = SUB81(uVar93 >> 7,0);
        auVar130._28_4_ = (uint)bVar21 * auVar123._28_4_ | (uint)!bVar21 * auVar118._28_4_;
        auVar117 = vandps_avx(auVar238,ZEXT1632(auVar105));
        auVar116 = vandps_avx(auVar128,auVar238);
        auVar116 = vmaxps_avx(auVar117,auVar116);
        auVar117 = vandps_avx(auVar127,auVar238);
        auVar117 = vmaxps_avx(auVar116,auVar117);
        uVar93 = vcmpps_avx512vl(auVar117,auVar229,1);
        bVar21 = (bool)((byte)uVar93 & 1);
        auVar131._0_4_ = (float)((uint)bVar21 * auVar115._0_4_ | (uint)!bVar21 * auVar105._0_4_);
        bVar21 = (bool)((byte)(uVar93 >> 1) & 1);
        auVar131._4_4_ = (float)((uint)bVar21 * auVar115._4_4_ | (uint)!bVar21 * auVar105._4_4_);
        bVar21 = (bool)((byte)(uVar93 >> 2) & 1);
        auVar131._8_4_ = (float)((uint)bVar21 * auVar115._8_4_ | (uint)!bVar21 * auVar105._8_4_);
        bVar21 = (bool)((byte)(uVar93 >> 3) & 1);
        auVar131._12_4_ = (float)((uint)bVar21 * auVar115._12_4_ | (uint)!bVar21 * auVar105._12_4_);
        fVar200 = (float)((uint)((byte)(uVar93 >> 4) & 1) * auVar115._16_4_);
        auVar131._16_4_ = fVar200;
        fVar191 = (float)((uint)((byte)(uVar93 >> 5) & 1) * auVar115._20_4_);
        auVar131._20_4_ = fVar191;
        fVar186 = (float)((uint)((byte)(uVar93 >> 6) & 1) * auVar115._24_4_);
        auVar131._24_4_ = fVar186;
        uVar94 = (uint)(byte)(uVar93 >> 7) * auVar115._28_4_;
        auVar131._28_4_ = uVar94;
        bVar21 = (bool)((byte)uVar93 & 1);
        auVar132._0_4_ = (float)((uint)bVar21 * auVar123._0_4_ | (uint)!bVar21 * auVar128._0_4_);
        bVar21 = (bool)((byte)(uVar93 >> 1) & 1);
        auVar132._4_4_ = (float)((uint)bVar21 * auVar123._4_4_ | (uint)!bVar21 * auVar128._4_4_);
        bVar21 = (bool)((byte)(uVar93 >> 2) & 1);
        auVar132._8_4_ = (float)((uint)bVar21 * auVar123._8_4_ | (uint)!bVar21 * auVar128._8_4_);
        bVar21 = (bool)((byte)(uVar93 >> 3) & 1);
        auVar132._12_4_ = (float)((uint)bVar21 * auVar123._12_4_ | (uint)!bVar21 * auVar128._12_4_);
        bVar21 = (bool)((byte)(uVar93 >> 4) & 1);
        auVar132._16_4_ = (float)((uint)bVar21 * auVar123._16_4_ | (uint)!bVar21 * auVar128._16_4_);
        bVar21 = (bool)((byte)(uVar93 >> 5) & 1);
        auVar132._20_4_ = (float)((uint)bVar21 * auVar123._20_4_ | (uint)!bVar21 * auVar128._20_4_);
        bVar21 = (bool)((byte)(uVar93 >> 6) & 1);
        auVar132._24_4_ = (float)((uint)bVar21 * auVar123._24_4_ | (uint)!bVar21 * auVar128._24_4_);
        bVar21 = SUB81(uVar93 >> 7,0);
        auVar132._28_4_ = (uint)bVar21 * auVar123._28_4_ | (uint)!bVar21 * auVar128._28_4_;
        auVar111 = vxorps_avx512vl(auVar201,auVar201);
        auVar117 = vfmadd213ps_avx512vl(auVar129,auVar129,ZEXT1632(auVar111));
        auVar106 = vfmadd231ps_fma(auVar117,auVar130,auVar130);
        auVar117 = vrsqrt14ps_avx512vl(ZEXT1632(auVar106));
        fVar103 = auVar117._0_4_;
        fVar104 = auVar117._4_4_;
        fVar154 = auVar117._8_4_;
        fVar155 = auVar117._12_4_;
        fVar156 = auVar117._16_4_;
        fVar157 = auVar117._20_4_;
        fVar159 = auVar117._24_4_;
        auVar45._4_4_ = fVar104 * fVar104 * fVar104 * auVar106._4_4_ * -0.5;
        auVar45._0_4_ = fVar103 * fVar103 * fVar103 * auVar106._0_4_ * -0.5;
        auVar45._8_4_ = fVar154 * fVar154 * fVar154 * auVar106._8_4_ * -0.5;
        auVar45._12_4_ = fVar155 * fVar155 * fVar155 * auVar106._12_4_ * -0.5;
        auVar45._16_4_ = fVar156 * fVar156 * fVar156 * -0.0;
        auVar45._20_4_ = fVar157 * fVar157 * fVar157 * -0.0;
        auVar45._24_4_ = fVar159 * fVar159 * fVar159 * -0.0;
        auVar45._28_4_ = auVar127._28_4_;
        auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar117 = vfmadd231ps_avx512vl(auVar45,auVar116,auVar117);
        auVar46._4_4_ = auVar130._4_4_ * auVar117._4_4_;
        auVar46._0_4_ = auVar130._0_4_ * auVar117._0_4_;
        auVar46._8_4_ = auVar130._8_4_ * auVar117._8_4_;
        auVar46._12_4_ = auVar130._12_4_ * auVar117._12_4_;
        auVar46._16_4_ = auVar130._16_4_ * auVar117._16_4_;
        auVar46._20_4_ = auVar130._20_4_ * auVar117._20_4_;
        auVar46._24_4_ = auVar130._24_4_ * auVar117._24_4_;
        auVar46._28_4_ = 0;
        auVar47._4_4_ = auVar117._4_4_ * -auVar129._4_4_;
        auVar47._0_4_ = auVar117._0_4_ * -auVar129._0_4_;
        auVar47._8_4_ = auVar117._8_4_ * -auVar129._8_4_;
        auVar47._12_4_ = auVar117._12_4_ * -auVar129._12_4_;
        auVar47._16_4_ = auVar117._16_4_ * -fVar192;
        auVar47._20_4_ = auVar117._20_4_ * -fVar185;
        auVar47._24_4_ = auVar117._24_4_ * -fVar184;
        auVar47._28_4_ = auVar130._28_4_;
        auVar117 = vmulps_avx512vl(auVar117,ZEXT1632(auVar111));
        auVar115 = ZEXT1632(auVar111);
        auVar128 = vfmadd213ps_avx512vl(auVar131,auVar131,auVar115);
        auVar106 = vfmadd231ps_fma(auVar128,auVar132,auVar132);
        auVar128 = vrsqrt14ps_avx512vl(ZEXT1632(auVar106));
        fVar192 = auVar128._0_4_;
        fVar184 = auVar128._4_4_;
        fVar185 = auVar128._8_4_;
        fVar103 = auVar128._12_4_;
        fVar104 = auVar128._16_4_;
        fVar154 = auVar128._20_4_;
        fVar155 = auVar128._24_4_;
        auVar48._4_4_ = fVar184 * fVar184 * fVar184 * auVar106._4_4_ * -0.5;
        auVar48._0_4_ = fVar192 * fVar192 * fVar192 * auVar106._0_4_ * -0.5;
        auVar48._8_4_ = fVar185 * fVar185 * fVar185 * auVar106._8_4_ * -0.5;
        auVar48._12_4_ = fVar103 * fVar103 * fVar103 * auVar106._12_4_ * -0.5;
        auVar48._16_4_ = fVar104 * fVar104 * fVar104 * -0.0;
        auVar48._20_4_ = fVar154 * fVar154 * fVar154 * -0.0;
        auVar48._24_4_ = fVar155 * fVar155 * fVar155 * -0.0;
        auVar48._28_4_ = 0;
        auVar116 = vfmadd231ps_avx512vl(auVar48,auVar116,auVar128);
        auVar49._4_4_ = auVar132._4_4_ * auVar116._4_4_;
        auVar49._0_4_ = auVar132._0_4_ * auVar116._0_4_;
        auVar49._8_4_ = auVar132._8_4_ * auVar116._8_4_;
        auVar49._12_4_ = auVar132._12_4_ * auVar116._12_4_;
        auVar49._16_4_ = auVar132._16_4_ * auVar116._16_4_;
        auVar49._20_4_ = auVar132._20_4_ * auVar116._20_4_;
        auVar49._24_4_ = auVar132._24_4_ * auVar116._24_4_;
        auVar49._28_4_ = auVar128._28_4_;
        auVar50._4_4_ = -auVar131._4_4_ * auVar116._4_4_;
        auVar50._0_4_ = -auVar131._0_4_ * auVar116._0_4_;
        auVar50._8_4_ = -auVar131._8_4_ * auVar116._8_4_;
        auVar50._12_4_ = -auVar131._12_4_ * auVar116._12_4_;
        auVar50._16_4_ = -fVar200 * auVar116._16_4_;
        auVar50._20_4_ = -fVar191 * auVar116._20_4_;
        auVar50._24_4_ = -fVar186 * auVar116._24_4_;
        auVar50._28_4_ = uVar94 ^ 0x80000000;
        auVar116 = vmulps_avx512vl(auVar116,auVar115);
        auVar106 = vfmadd213ps_fma(auVar46,auVar113,auVar121);
        auVar105 = vfmadd213ps_fma(auVar47,auVar113,auVar122);
        auVar128 = vfmadd213ps_avx512vl(auVar117,auVar113,auVar126);
        auVar127 = vfmadd213ps_avx512vl(auVar49,ZEXT1632(auVar166),ZEXT1632(auVar11));
        auVar107 = vfnmadd213ps_fma(auVar46,auVar113,auVar121);
        auVar120 = ZEXT1632(auVar166);
        auVar6 = vfmadd213ps_fma(auVar50,auVar120,ZEXT1632(auVar12));
        auVar109 = vfnmadd213ps_fma(auVar47,auVar113,auVar122);
        auVar8 = vfmadd213ps_fma(auVar116,auVar120,auVar119);
        auVar118 = vfnmadd231ps_avx512vl(auVar126,auVar113,auVar117);
        auVar11 = vfnmadd213ps_fma(auVar49,auVar120,ZEXT1632(auVar11));
        auVar12 = vfnmadd213ps_fma(auVar50,auVar120,ZEXT1632(auVar12));
        auVar110 = vfnmadd231ps_fma(auVar119,ZEXT1632(auVar166),auVar116);
        auVar116 = vsubps_avx512vl(auVar127,ZEXT1632(auVar107));
        auVar117 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar109));
        auVar119 = vsubps_avx512vl(ZEXT1632(auVar8),auVar118);
        auVar126 = vmulps_avx512vl(auVar117,auVar118);
        auVar9 = vfmsub231ps_fma(auVar126,ZEXT1632(auVar109),auVar119);
        auVar51._4_4_ = auVar107._4_4_ * auVar119._4_4_;
        auVar51._0_4_ = auVar107._0_4_ * auVar119._0_4_;
        auVar51._8_4_ = auVar107._8_4_ * auVar119._8_4_;
        auVar51._12_4_ = auVar107._12_4_ * auVar119._12_4_;
        auVar51._16_4_ = auVar119._16_4_ * 0.0;
        auVar51._20_4_ = auVar119._20_4_ * 0.0;
        auVar51._24_4_ = auVar119._24_4_ * 0.0;
        auVar51._28_4_ = auVar119._28_4_;
        auVar119 = vfmsub231ps_avx512vl(auVar51,auVar118,auVar116);
        auVar52._4_4_ = auVar109._4_4_ * auVar116._4_4_;
        auVar52._0_4_ = auVar109._0_4_ * auVar116._0_4_;
        auVar52._8_4_ = auVar109._8_4_ * auVar116._8_4_;
        auVar52._12_4_ = auVar109._12_4_ * auVar116._12_4_;
        auVar52._16_4_ = auVar116._16_4_ * 0.0;
        auVar52._20_4_ = auVar116._20_4_ * 0.0;
        auVar52._24_4_ = auVar116._24_4_ * 0.0;
        auVar52._28_4_ = auVar116._28_4_;
        auVar10 = vfmsub231ps_fma(auVar52,ZEXT1632(auVar107),auVar117);
        auVar117 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar115,auVar119);
        auVar117 = vfmadd231ps_avx512vl(auVar117,auVar115,ZEXT1632(auVar9));
        auVar123 = ZEXT1632(auVar111);
        uVar93 = vcmpps_avx512vl(auVar117,auVar123,2);
        bVar92 = (byte)uVar93;
        fVar103 = (float)((uint)(bVar92 & 1) * auVar106._0_4_ |
                         (uint)!(bool)(bVar92 & 1) * auVar11._0_4_);
        bVar21 = (bool)((byte)(uVar93 >> 1) & 1);
        fVar154 = (float)((uint)bVar21 * auVar106._4_4_ | (uint)!bVar21 * auVar11._4_4_);
        bVar21 = (bool)((byte)(uVar93 >> 2) & 1);
        fVar156 = (float)((uint)bVar21 * auVar106._8_4_ | (uint)!bVar21 * auVar11._8_4_);
        bVar21 = (bool)((byte)(uVar93 >> 3) & 1);
        fVar159 = (float)((uint)bVar21 * auVar106._12_4_ | (uint)!bVar21 * auVar11._12_4_);
        auVar126 = ZEXT1632(CONCAT412(fVar159,CONCAT48(fVar156,CONCAT44(fVar154,fVar103))));
        fVar104 = (float)((uint)(bVar92 & 1) * auVar105._0_4_ |
                         (uint)!(bool)(bVar92 & 1) * auVar12._0_4_);
        bVar21 = (bool)((byte)(uVar93 >> 1) & 1);
        fVar155 = (float)((uint)bVar21 * auVar105._4_4_ | (uint)!bVar21 * auVar12._4_4_);
        bVar21 = (bool)((byte)(uVar93 >> 2) & 1);
        fVar157 = (float)((uint)bVar21 * auVar105._8_4_ | (uint)!bVar21 * auVar12._8_4_);
        bVar21 = (bool)((byte)(uVar93 >> 3) & 1);
        fVar160 = (float)((uint)bVar21 * auVar105._12_4_ | (uint)!bVar21 * auVar12._12_4_);
        auVar120 = ZEXT1632(CONCAT412(fVar160,CONCAT48(fVar157,CONCAT44(fVar155,fVar104))));
        auVar133._0_4_ =
             (float)((uint)(bVar92 & 1) * auVar128._0_4_ |
                    (uint)!(bool)(bVar92 & 1) * auVar110._0_4_);
        bVar21 = (bool)((byte)(uVar93 >> 1) & 1);
        auVar133._4_4_ = (float)((uint)bVar21 * auVar128._4_4_ | (uint)!bVar21 * auVar110._4_4_);
        bVar21 = (bool)((byte)(uVar93 >> 2) & 1);
        auVar133._8_4_ = (float)((uint)bVar21 * auVar128._8_4_ | (uint)!bVar21 * auVar110._8_4_);
        bVar21 = (bool)((byte)(uVar93 >> 3) & 1);
        auVar133._12_4_ = (float)((uint)bVar21 * auVar128._12_4_ | (uint)!bVar21 * auVar110._12_4_);
        fVar184 = (float)((uint)((byte)(uVar93 >> 4) & 1) * auVar128._16_4_);
        auVar133._16_4_ = fVar184;
        fVar185 = (float)((uint)((byte)(uVar93 >> 5) & 1) * auVar128._20_4_);
        auVar133._20_4_ = fVar185;
        fVar192 = (float)((uint)((byte)(uVar93 >> 6) & 1) * auVar128._24_4_);
        auVar133._24_4_ = fVar192;
        iVar1 = (uint)(byte)(uVar93 >> 7) * auVar128._28_4_;
        auVar133._28_4_ = iVar1;
        auVar116 = vblendmps_avx512vl(ZEXT1632(auVar107),auVar127);
        auVar134._0_4_ =
             (uint)(bVar92 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar92 & 1) * auVar9._0_4_;
        bVar21 = (bool)((byte)(uVar93 >> 1) & 1);
        auVar134._4_4_ = (uint)bVar21 * auVar116._4_4_ | (uint)!bVar21 * auVar9._4_4_;
        bVar21 = (bool)((byte)(uVar93 >> 2) & 1);
        auVar134._8_4_ = (uint)bVar21 * auVar116._8_4_ | (uint)!bVar21 * auVar9._8_4_;
        bVar21 = (bool)((byte)(uVar93 >> 3) & 1);
        auVar134._12_4_ = (uint)bVar21 * auVar116._12_4_ | (uint)!bVar21 * auVar9._12_4_;
        auVar134._16_4_ = (uint)((byte)(uVar93 >> 4) & 1) * auVar116._16_4_;
        auVar134._20_4_ = (uint)((byte)(uVar93 >> 5) & 1) * auVar116._20_4_;
        auVar134._24_4_ = (uint)((byte)(uVar93 >> 6) & 1) * auVar116._24_4_;
        auVar134._28_4_ = (uint)(byte)(uVar93 >> 7) * auVar116._28_4_;
        auVar116 = vblendmps_avx512vl(ZEXT1632(auVar109),ZEXT1632(auVar6));
        auVar135._0_4_ =
             (float)((uint)(bVar92 & 1) * auVar116._0_4_ |
                    (uint)!(bool)(bVar92 & 1) * auVar105._0_4_);
        bVar21 = (bool)((byte)(uVar93 >> 1) & 1);
        auVar135._4_4_ = (float)((uint)bVar21 * auVar116._4_4_ | (uint)!bVar21 * auVar105._4_4_);
        bVar21 = (bool)((byte)(uVar93 >> 2) & 1);
        auVar135._8_4_ = (float)((uint)bVar21 * auVar116._8_4_ | (uint)!bVar21 * auVar105._8_4_);
        bVar21 = (bool)((byte)(uVar93 >> 3) & 1);
        auVar135._12_4_ = (float)((uint)bVar21 * auVar116._12_4_ | (uint)!bVar21 * auVar105._12_4_);
        fVar200 = (float)((uint)((byte)(uVar93 >> 4) & 1) * auVar116._16_4_);
        auVar135._16_4_ = fVar200;
        fVar191 = (float)((uint)((byte)(uVar93 >> 5) & 1) * auVar116._20_4_);
        auVar135._20_4_ = fVar191;
        fVar186 = (float)((uint)((byte)(uVar93 >> 6) & 1) * auVar116._24_4_);
        auVar135._24_4_ = fVar186;
        auVar135._28_4_ = (uint)(byte)(uVar93 >> 7) * auVar116._28_4_;
        auVar116 = vblendmps_avx512vl(auVar118,ZEXT1632(auVar8));
        auVar136._0_4_ =
             (float)((uint)(bVar92 & 1) * auVar116._0_4_ |
                    (uint)!(bool)(bVar92 & 1) * auVar128._0_4_);
        bVar21 = (bool)((byte)(uVar93 >> 1) & 1);
        auVar136._4_4_ = (float)((uint)bVar21 * auVar116._4_4_ | (uint)!bVar21 * auVar128._4_4_);
        bVar21 = (bool)((byte)(uVar93 >> 2) & 1);
        auVar136._8_4_ = (float)((uint)bVar21 * auVar116._8_4_ | (uint)!bVar21 * auVar128._8_4_);
        bVar21 = (bool)((byte)(uVar93 >> 3) & 1);
        auVar136._12_4_ = (float)((uint)bVar21 * auVar116._12_4_ | (uint)!bVar21 * auVar128._12_4_);
        bVar21 = (bool)((byte)(uVar93 >> 4) & 1);
        auVar136._16_4_ = (float)((uint)bVar21 * auVar116._16_4_ | (uint)!bVar21 * auVar128._16_4_);
        bVar21 = (bool)((byte)(uVar93 >> 5) & 1);
        auVar136._20_4_ = (float)((uint)bVar21 * auVar116._20_4_ | (uint)!bVar21 * auVar128._20_4_);
        bVar21 = (bool)((byte)(uVar93 >> 6) & 1);
        auVar136._24_4_ = (float)((uint)bVar21 * auVar116._24_4_ | (uint)!bVar21 * auVar128._24_4_);
        bVar21 = SUB81(uVar93 >> 7,0);
        auVar136._28_4_ = (uint)bVar21 * auVar116._28_4_ | (uint)!bVar21 * auVar128._28_4_;
        auVar137._0_4_ =
             (uint)(bVar92 & 1) * (int)auVar107._0_4_ | (uint)!(bool)(bVar92 & 1) * auVar127._0_4_;
        bVar21 = (bool)((byte)(uVar93 >> 1) & 1);
        auVar137._4_4_ = (uint)bVar21 * (int)auVar107._4_4_ | (uint)!bVar21 * auVar127._4_4_;
        bVar21 = (bool)((byte)(uVar93 >> 2) & 1);
        auVar137._8_4_ = (uint)bVar21 * (int)auVar107._8_4_ | (uint)!bVar21 * auVar127._8_4_;
        bVar21 = (bool)((byte)(uVar93 >> 3) & 1);
        auVar137._12_4_ = (uint)bVar21 * (int)auVar107._12_4_ | (uint)!bVar21 * auVar127._12_4_;
        auVar137._16_4_ = (uint)!(bool)((byte)(uVar93 >> 4) & 1) * auVar127._16_4_;
        auVar137._20_4_ = (uint)!(bool)((byte)(uVar93 >> 5) & 1) * auVar127._20_4_;
        auVar137._24_4_ = (uint)!(bool)((byte)(uVar93 >> 6) & 1) * auVar127._24_4_;
        auVar137._28_4_ = (uint)!SUB81(uVar93 >> 7,0) * auVar127._28_4_;
        bVar21 = (bool)((byte)(uVar93 >> 1) & 1);
        bVar23 = (bool)((byte)(uVar93 >> 2) & 1);
        bVar24 = (bool)((byte)(uVar93 >> 3) & 1);
        auVar138._0_4_ =
             (uint)(bVar92 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar92 & 1) * auVar8._0_4_;
        bVar22 = (bool)((byte)(uVar93 >> 1) & 1);
        auVar138._4_4_ = (uint)bVar22 * auVar118._4_4_ | (uint)!bVar22 * auVar8._4_4_;
        bVar22 = (bool)((byte)(uVar93 >> 2) & 1);
        auVar138._8_4_ = (uint)bVar22 * auVar118._8_4_ | (uint)!bVar22 * auVar8._8_4_;
        bVar22 = (bool)((byte)(uVar93 >> 3) & 1);
        auVar138._12_4_ = (uint)bVar22 * auVar118._12_4_ | (uint)!bVar22 * auVar8._12_4_;
        auVar138._16_4_ = (uint)((byte)(uVar93 >> 4) & 1) * auVar118._16_4_;
        auVar138._20_4_ = (uint)((byte)(uVar93 >> 5) & 1) * auVar118._20_4_;
        auVar138._24_4_ = (uint)((byte)(uVar93 >> 6) & 1) * auVar118._24_4_;
        iVar2 = (uint)(byte)(uVar93 >> 7) * auVar118._28_4_;
        auVar138._28_4_ = iVar2;
        auVar121 = vsubps_avx512vl(auVar137,auVar126);
        auVar116 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar24 * (int)auVar109._12_4_ |
                                                 (uint)!bVar24 * auVar6._12_4_,
                                                 CONCAT48((uint)bVar23 * (int)auVar109._8_4_ |
                                                          (uint)!bVar23 * auVar6._8_4_,
                                                          CONCAT44((uint)bVar21 *
                                                                   (int)auVar109._4_4_ |
                                                                   (uint)!bVar21 * auVar6._4_4_,
                                                                   (uint)(bVar92 & 1) *
                                                                   (int)auVar109._0_4_ |
                                                                   (uint)!(bool)(bVar92 & 1) *
                                                                   auVar6._0_4_)))),auVar120);
        auVar219 = ZEXT3264(auVar116);
        auVar128 = vsubps_avx(auVar138,auVar133);
        auVar127 = vsubps_avx(auVar126,auVar134);
        auVar224 = ZEXT3264(auVar127);
        auVar118 = vsubps_avx(auVar120,auVar135);
        auVar119 = vsubps_avx(auVar133,auVar136);
        auVar53._4_4_ = auVar128._4_4_ * fVar154;
        auVar53._0_4_ = auVar128._0_4_ * fVar103;
        auVar53._8_4_ = auVar128._8_4_ * fVar156;
        auVar53._12_4_ = auVar128._12_4_ * fVar159;
        auVar53._16_4_ = auVar128._16_4_ * 0.0;
        auVar53._20_4_ = auVar128._20_4_ * 0.0;
        auVar53._24_4_ = auVar128._24_4_ * 0.0;
        auVar53._28_4_ = iVar2;
        auVar106 = vfmsub231ps_fma(auVar53,auVar133,auVar121);
        auVar54._4_4_ = fVar155 * auVar121._4_4_;
        auVar54._0_4_ = fVar104 * auVar121._0_4_;
        auVar54._8_4_ = fVar157 * auVar121._8_4_;
        auVar54._12_4_ = fVar160 * auVar121._12_4_;
        auVar54._16_4_ = auVar121._16_4_ * 0.0;
        auVar54._20_4_ = auVar121._20_4_ * 0.0;
        auVar54._24_4_ = auVar121._24_4_ * 0.0;
        auVar54._28_4_ = auVar117._28_4_;
        auVar105 = vfmsub231ps_fma(auVar54,auVar126,auVar116);
        auVar117 = vfmadd231ps_avx512vl(ZEXT1632(auVar105),auVar123,ZEXT1632(auVar106));
        auVar209._0_4_ = auVar116._0_4_ * auVar133._0_4_;
        auVar209._4_4_ = auVar116._4_4_ * auVar133._4_4_;
        auVar209._8_4_ = auVar116._8_4_ * auVar133._8_4_;
        auVar209._12_4_ = auVar116._12_4_ * auVar133._12_4_;
        auVar209._16_4_ = auVar116._16_4_ * fVar184;
        auVar209._20_4_ = auVar116._20_4_ * fVar185;
        auVar209._24_4_ = auVar116._24_4_ * fVar192;
        auVar209._28_4_ = 0;
        auVar106 = vfmsub231ps_fma(auVar209,auVar120,auVar128);
        auVar122 = vfmadd231ps_avx512vl(auVar117,auVar123,ZEXT1632(auVar106));
        auVar117 = vmulps_avx512vl(auVar119,auVar134);
        auVar117 = vfmsub231ps_avx512vl(auVar117,auVar127,auVar136);
        auVar55._4_4_ = auVar118._4_4_ * auVar136._4_4_;
        auVar55._0_4_ = auVar118._0_4_ * auVar136._0_4_;
        auVar55._8_4_ = auVar118._8_4_ * auVar136._8_4_;
        auVar55._12_4_ = auVar118._12_4_ * auVar136._12_4_;
        auVar55._16_4_ = auVar118._16_4_ * auVar136._16_4_;
        auVar55._20_4_ = auVar118._20_4_ * auVar136._20_4_;
        auVar55._24_4_ = auVar118._24_4_ * auVar136._24_4_;
        auVar55._28_4_ = auVar136._28_4_;
        auVar106 = vfmsub231ps_fma(auVar55,auVar135,auVar119);
        auVar210._0_4_ = auVar135._0_4_ * auVar127._0_4_;
        auVar210._4_4_ = auVar135._4_4_ * auVar127._4_4_;
        auVar210._8_4_ = auVar135._8_4_ * auVar127._8_4_;
        auVar210._12_4_ = auVar135._12_4_ * auVar127._12_4_;
        auVar210._16_4_ = fVar200 * auVar127._16_4_;
        auVar210._20_4_ = fVar191 * auVar127._20_4_;
        auVar210._24_4_ = fVar186 * auVar127._24_4_;
        auVar210._28_4_ = 0;
        auVar105 = vfmsub231ps_fma(auVar210,auVar118,auVar134);
        auVar117 = vfmadd231ps_avx512vl(ZEXT1632(auVar105),auVar123,auVar117);
        auVar115 = vfmadd231ps_avx512vl(auVar117,auVar123,ZEXT1632(auVar106));
        auVar213 = ZEXT3264(auVar115);
        auVar117 = vmaxps_avx(auVar122,auVar115);
        uVar187 = vcmpps_avx512vl(auVar117,auVar123,2);
        bVar101 = bVar101 & (byte)uVar187;
        if (bVar101 != 0) {
          uVar165 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar239._4_4_ = uVar165;
          auVar239._0_4_ = uVar165;
          auVar239._8_4_ = uVar165;
          auVar239._12_4_ = uVar165;
          auVar239._16_4_ = uVar165;
          auVar239._20_4_ = uVar165;
          auVar239._24_4_ = uVar165;
          auVar239._28_4_ = uVar165;
          auVar181 = ZEXT3264(auVar239);
          auVar56._4_4_ = auVar119._4_4_ * auVar116._4_4_;
          auVar56._0_4_ = auVar119._0_4_ * auVar116._0_4_;
          auVar56._8_4_ = auVar119._8_4_ * auVar116._8_4_;
          auVar56._12_4_ = auVar119._12_4_ * auVar116._12_4_;
          auVar56._16_4_ = auVar119._16_4_ * auVar116._16_4_;
          auVar56._20_4_ = auVar119._20_4_ * auVar116._20_4_;
          auVar56._24_4_ = auVar119._24_4_ * auVar116._24_4_;
          auVar56._28_4_ = auVar117._28_4_;
          auVar8 = vfmsub231ps_fma(auVar56,auVar118,auVar128);
          auVar57._4_4_ = auVar128._4_4_ * auVar127._4_4_;
          auVar57._0_4_ = auVar128._0_4_ * auVar127._0_4_;
          auVar57._8_4_ = auVar128._8_4_ * auVar127._8_4_;
          auVar57._12_4_ = auVar128._12_4_ * auVar127._12_4_;
          auVar57._16_4_ = auVar128._16_4_ * auVar127._16_4_;
          auVar57._20_4_ = auVar128._20_4_ * auVar127._20_4_;
          auVar57._24_4_ = auVar128._24_4_ * auVar127._24_4_;
          auVar57._28_4_ = auVar128._28_4_;
          auVar6 = vfmsub231ps_fma(auVar57,auVar121,auVar119);
          auVar58._4_4_ = auVar118._4_4_ * auVar121._4_4_;
          auVar58._0_4_ = auVar118._0_4_ * auVar121._0_4_;
          auVar58._8_4_ = auVar118._8_4_ * auVar121._8_4_;
          auVar58._12_4_ = auVar118._12_4_ * auVar121._12_4_;
          auVar58._16_4_ = auVar118._16_4_ * auVar121._16_4_;
          auVar58._20_4_ = auVar118._20_4_ * auVar121._20_4_;
          auVar58._24_4_ = auVar118._24_4_ * auVar121._24_4_;
          auVar58._28_4_ = auVar118._28_4_;
          auVar9 = vfmsub231ps_fma(auVar58,auVar127,auVar116);
          auVar106 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar6),ZEXT1632(auVar9));
          auVar105 = vfmadd231ps_fma(ZEXT1632(auVar106),ZEXT1632(auVar8),
                                     ZEXT1232(ZEXT412(0)) << 0x20);
          auVar117 = vrcp14ps_avx512vl(ZEXT1632(auVar105));
          auVar38._8_4_ = 0x3f800000;
          auVar38._0_8_ = 0x3f8000003f800000;
          auVar38._12_4_ = 0x3f800000;
          auVar38._16_4_ = 0x3f800000;
          auVar38._20_4_ = 0x3f800000;
          auVar38._24_4_ = 0x3f800000;
          auVar38._28_4_ = 0x3f800000;
          auVar116 = vfnmadd213ps_avx512vl(auVar117,ZEXT1632(auVar105),auVar38);
          auVar106 = vfmadd132ps_fma(auVar116,auVar117,auVar117);
          auVar219 = ZEXT1664(auVar106);
          auVar59._4_4_ = auVar9._4_4_ * auVar133._4_4_;
          auVar59._0_4_ = auVar9._0_4_ * auVar133._0_4_;
          auVar59._8_4_ = auVar9._8_4_ * auVar133._8_4_;
          auVar59._12_4_ = auVar9._12_4_ * auVar133._12_4_;
          auVar59._16_4_ = fVar184 * 0.0;
          auVar59._20_4_ = fVar185 * 0.0;
          auVar59._24_4_ = fVar192 * 0.0;
          auVar59._28_4_ = iVar1;
          auVar6 = vfmadd231ps_fma(auVar59,auVar120,ZEXT1632(auVar6));
          auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar126,ZEXT1632(auVar8));
          fVar192 = auVar106._0_4_;
          fVar184 = auVar106._4_4_;
          fVar185 = auVar106._8_4_;
          fVar186 = auVar106._12_4_;
          local_620._28_4_ = auVar117._28_4_;
          local_620._0_28_ =
               ZEXT1628(CONCAT412(auVar6._12_4_ * fVar186,
                                  CONCAT48(auVar6._8_4_ * fVar185,
                                           CONCAT44(auVar6._4_4_ * fVar184,auVar6._0_4_ * fVar192)))
                       );
          auVar224 = ZEXT3264(local_620);
          auVar173._4_4_ = local_7e0;
          auVar173._0_4_ = local_7e0;
          auVar173._8_4_ = local_7e0;
          auVar173._12_4_ = local_7e0;
          auVar173._16_4_ = local_7e0;
          auVar173._20_4_ = local_7e0;
          auVar173._24_4_ = local_7e0;
          auVar173._28_4_ = local_7e0;
          uVar187 = vcmpps_avx512vl(local_620,auVar239,2);
          uVar36 = vcmpps_avx512vl(auVar173,local_620,2);
          bVar101 = (byte)uVar187 & (byte)uVar36 & bVar101;
          if (bVar101 != 0) {
            uVar102 = vcmpps_avx512vl(ZEXT1632(auVar105),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar102 = bVar101 & uVar102;
            if ((char)uVar102 != '\0') {
              fVar191 = auVar122._0_4_ * fVar192;
              fVar200 = auVar122._4_4_ * fVar184;
              auVar60._4_4_ = fVar200;
              auVar60._0_4_ = fVar191;
              fVar103 = auVar122._8_4_ * fVar185;
              auVar60._8_4_ = fVar103;
              fVar104 = auVar122._12_4_ * fVar186;
              auVar60._12_4_ = fVar104;
              fVar154 = auVar122._16_4_ * 0.0;
              auVar60._16_4_ = fVar154;
              fVar155 = auVar122._20_4_ * 0.0;
              auVar60._20_4_ = fVar155;
              fVar156 = auVar122._24_4_ * 0.0;
              auVar60._24_4_ = fVar156;
              auVar60._28_4_ = auVar122._28_4_;
              auVar174._8_4_ = 0x3f800000;
              auVar174._0_8_ = 0x3f8000003f800000;
              auVar174._12_4_ = 0x3f800000;
              auVar174._16_4_ = 0x3f800000;
              auVar174._20_4_ = 0x3f800000;
              auVar174._24_4_ = 0x3f800000;
              auVar174._28_4_ = 0x3f800000;
              auVar117 = vsubps_avx(auVar174,auVar60);
              local_660._0_4_ =
                   (float)((uint)(bVar92 & 1) * (int)fVar191 |
                          (uint)!(bool)(bVar92 & 1) * auVar117._0_4_);
              bVar21 = (bool)((byte)(uVar93 >> 1) & 1);
              local_660._4_4_ =
                   (float)((uint)bVar21 * (int)fVar200 | (uint)!bVar21 * auVar117._4_4_);
              bVar21 = (bool)((byte)(uVar93 >> 2) & 1);
              local_660._8_4_ =
                   (float)((uint)bVar21 * (int)fVar103 | (uint)!bVar21 * auVar117._8_4_);
              bVar21 = (bool)((byte)(uVar93 >> 3) & 1);
              local_660._12_4_ =
                   (float)((uint)bVar21 * (int)fVar104 | (uint)!bVar21 * auVar117._12_4_);
              bVar21 = (bool)((byte)(uVar93 >> 4) & 1);
              local_660._16_4_ =
                   (float)((uint)bVar21 * (int)fVar154 | (uint)!bVar21 * auVar117._16_4_);
              bVar21 = (bool)((byte)(uVar93 >> 5) & 1);
              local_660._20_4_ =
                   (float)((uint)bVar21 * (int)fVar155 | (uint)!bVar21 * auVar117._20_4_);
              bVar21 = (bool)((byte)(uVar93 >> 6) & 1);
              local_660._24_4_ =
                   (float)((uint)bVar21 * (int)fVar156 | (uint)!bVar21 * auVar117._24_4_);
              bVar21 = SUB81(uVar93 >> 7,0);
              local_660._28_4_ =
                   (float)((uint)bVar21 * auVar122._28_4_ | (uint)!bVar21 * auVar117._28_4_);
              auVar117 = vsubps_avx(ZEXT1632(auVar166),auVar113);
              auVar106 = vfmadd213ps_fma(auVar117,local_660,auVar113);
              uVar165 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar39._4_4_ = uVar165;
              auVar39._0_4_ = uVar165;
              auVar39._8_4_ = uVar165;
              auVar39._12_4_ = uVar165;
              auVar39._16_4_ = uVar165;
              auVar39._20_4_ = uVar165;
              auVar39._24_4_ = uVar165;
              auVar39._28_4_ = uVar165;
              auVar117 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar106._12_4_ + auVar106._12_4_,
                                                            CONCAT48(auVar106._8_4_ + auVar106._8_4_
                                                                     ,CONCAT44(auVar106._4_4_ +
                                                                               auVar106._4_4_,
                                                                               auVar106._0_4_ +
                                                                               auVar106._0_4_)))),
                                         auVar39);
              uVar35 = vcmpps_avx512vl(local_620,auVar117,6);
              uVar102 = uVar102 & uVar35;
              bVar101 = (byte)uVar102;
              if (bVar101 != 0) {
                auVar198._0_4_ = auVar115._0_4_ * fVar192;
                auVar198._4_4_ = auVar115._4_4_ * fVar184;
                auVar198._8_4_ = auVar115._8_4_ * fVar185;
                auVar198._12_4_ = auVar115._12_4_ * fVar186;
                auVar198._16_4_ = auVar115._16_4_ * 0.0;
                auVar198._20_4_ = auVar115._20_4_ * 0.0;
                auVar198._24_4_ = auVar115._24_4_ * 0.0;
                auVar198._28_4_ = 0;
                auVar206._8_4_ = 0x3f800000;
                auVar206._0_8_ = 0x3f8000003f800000;
                auVar206._12_4_ = 0x3f800000;
                auVar206._16_4_ = 0x3f800000;
                auVar206._20_4_ = 0x3f800000;
                auVar206._24_4_ = 0x3f800000;
                auVar206._28_4_ = 0x3f800000;
                auVar117 = vsubps_avx(auVar206,auVar198);
                auVar139._0_4_ =
                     (uint)(bVar92 & 1) * (int)auVar198._0_4_ |
                     (uint)!(bool)(bVar92 & 1) * auVar117._0_4_;
                bVar21 = (bool)((byte)(uVar93 >> 1) & 1);
                auVar139._4_4_ = (uint)bVar21 * (int)auVar198._4_4_ | (uint)!bVar21 * auVar117._4_4_
                ;
                bVar21 = (bool)((byte)(uVar93 >> 2) & 1);
                auVar139._8_4_ = (uint)bVar21 * (int)auVar198._8_4_ | (uint)!bVar21 * auVar117._8_4_
                ;
                bVar21 = (bool)((byte)(uVar93 >> 3) & 1);
                auVar139._12_4_ =
                     (uint)bVar21 * (int)auVar198._12_4_ | (uint)!bVar21 * auVar117._12_4_;
                bVar21 = (bool)((byte)(uVar93 >> 4) & 1);
                auVar139._16_4_ =
                     (uint)bVar21 * (int)auVar198._16_4_ | (uint)!bVar21 * auVar117._16_4_;
                bVar21 = (bool)((byte)(uVar93 >> 5) & 1);
                auVar139._20_4_ =
                     (uint)bVar21 * (int)auVar198._20_4_ | (uint)!bVar21 * auVar117._20_4_;
                bVar21 = (bool)((byte)(uVar93 >> 6) & 1);
                auVar139._24_4_ =
                     (uint)bVar21 * (int)auVar198._24_4_ | (uint)!bVar21 * auVar117._24_4_;
                auVar139._28_4_ = (uint)!SUB81(uVar93 >> 7,0) * auVar117._28_4_;
                auVar40._8_4_ = 0x40000000;
                auVar40._0_8_ = 0x4000000040000000;
                auVar40._12_4_ = 0x40000000;
                auVar40._16_4_ = 0x40000000;
                auVar40._20_4_ = 0x40000000;
                auVar40._24_4_ = 0x40000000;
                auVar40._28_4_ = 0x40000000;
                local_640 = vfmsub132ps_avx512vl(auVar139,auVar206,auVar40);
                local_600 = 0;
                local_5f0 = local_890;
                uStack_5e8 = uStack_888;
                local_5e0 = local_8b0;
                uStack_5d8 = uStack_8a8;
                local_5d0 = local_8c0;
                uStack_5c8 = uStack_8b8;
                local_5c0 = local_8a0;
                uStack_5b8 = uStack_898;
                if ((pGVar98->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  fVar192 = 1.0 / auVar227._0_4_;
                  local_5a0[0] = fVar192 * (local_660._0_4_ + 0.0);
                  local_5a0[1] = fVar192 * (local_660._4_4_ + 1.0);
                  local_5a0[2] = fVar192 * (local_660._8_4_ + 2.0);
                  local_5a0[3] = fVar192 * (local_660._12_4_ + 3.0);
                  fStack_590 = fVar192 * (local_660._16_4_ + 4.0);
                  fStack_58c = fVar192 * (local_660._20_4_ + 5.0);
                  fStack_588 = fVar192 * (local_660._24_4_ + 6.0);
                  fStack_584 = local_660._28_4_ + 7.0;
                  local_580 = local_640;
                  local_560 = local_620;
                  auVar175._8_4_ = 0x7f800000;
                  auVar175._0_8_ = 0x7f8000007f800000;
                  auVar175._12_4_ = 0x7f800000;
                  auVar175._16_4_ = 0x7f800000;
                  auVar175._20_4_ = 0x7f800000;
                  auVar175._24_4_ = 0x7f800000;
                  auVar175._28_4_ = 0x7f800000;
                  auVar117 = vblendmps_avx512vl(auVar175,local_620);
                  auVar140._0_4_ =
                       (uint)(bVar101 & 1) * auVar117._0_4_ |
                       (uint)!(bool)(bVar101 & 1) * 0x7f800000;
                  bVar21 = (bool)((byte)(uVar102 >> 1) & 1);
                  auVar140._4_4_ = (uint)bVar21 * auVar117._4_4_ | (uint)!bVar21 * 0x7f800000;
                  bVar21 = (bool)((byte)(uVar102 >> 2) & 1);
                  auVar140._8_4_ = (uint)bVar21 * auVar117._8_4_ | (uint)!bVar21 * 0x7f800000;
                  bVar21 = (bool)((byte)(uVar102 >> 3) & 1);
                  auVar140._12_4_ = (uint)bVar21 * auVar117._12_4_ | (uint)!bVar21 * 0x7f800000;
                  bVar21 = (bool)((byte)(uVar102 >> 4) & 1);
                  auVar140._16_4_ = (uint)bVar21 * auVar117._16_4_ | (uint)!bVar21 * 0x7f800000;
                  bVar21 = (bool)((byte)(uVar102 >> 5) & 1);
                  auVar140._20_4_ = (uint)bVar21 * auVar117._20_4_ | (uint)!bVar21 * 0x7f800000;
                  bVar21 = (bool)((byte)(uVar102 >> 6) & 1);
                  auVar140._24_4_ = (uint)bVar21 * auVar117._24_4_ | (uint)!bVar21 * 0x7f800000;
                  bVar21 = SUB81(uVar102 >> 7,0);
                  auVar140._28_4_ = (uint)bVar21 * auVar117._28_4_ | (uint)!bVar21 * 0x7f800000;
                  auVar117 = vshufps_avx(auVar140,auVar140,0xb1);
                  auVar117 = vminps_avx(auVar140,auVar117);
                  auVar116 = vshufpd_avx(auVar117,auVar117,5);
                  auVar117 = vminps_avx(auVar117,auVar116);
                  auVar116 = vpermpd_avx2(auVar117,0x4e);
                  auVar117 = vminps_avx(auVar117,auVar116);
                  uVar187 = vcmpps_avx512vl(auVar140,auVar117,0);
                  uVar94 = (uint)uVar102;
                  if (((byte)uVar187 & bVar101) != 0) {
                    uVar94 = (uint)((byte)uVar187 & bVar101);
                  }
                  uVar95 = 0;
                  for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
                    uVar95 = uVar95 + 1;
                  }
                  uVar93 = (ulong)uVar95;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar98->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar213 = vpbroadcastd_avx512f();
                    local_440 = vmovdqa64_avx512f(auVar213);
                    auVar213 = vpbroadcastd_avx512f();
                    local_4c0 = vmovdqa64_avx512f(auVar213);
                    local_840 = local_620;
                    local_5fc = iVar15;
                    do {
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_5a0[uVar93]));
                      local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_580 + uVar93 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_560 + uVar93 * 4)
                      ;
                      local_880.context = context->user;
                      fVar186 = local_200._0_4_;
                      fVar184 = 1.0 - fVar186;
                      fVar192 = fVar184 * fVar184 * -3.0;
                      auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar184 * fVar184)),
                                                 ZEXT416((uint)(fVar186 * fVar184)),
                                                 ZEXT416(0xc0000000));
                      auVar105 = vfmsub132ss_fma(ZEXT416((uint)(fVar186 * fVar184)),
                                                 ZEXT416((uint)(fVar186 * fVar186)),
                                                 ZEXT416(0x40000000));
                      fVar184 = auVar106._0_4_ * 3.0;
                      fVar185 = auVar105._0_4_ * 3.0;
                      fVar186 = fVar186 * fVar186 * 3.0;
                      auVar217._0_4_ = fVar186 * fVar163;
                      auVar217._4_4_ = fVar186 * fVar164;
                      auVar217._8_4_ = fVar186 * fVar182;
                      auVar217._12_4_ = fVar186 * fVar183;
                      auVar169._4_4_ = fVar185;
                      auVar169._0_4_ = fVar185;
                      auVar169._8_4_ = fVar185;
                      auVar169._12_4_ = fVar185;
                      auVar106 = vfmadd132ps_fma(auVar169,auVar217,auVar108);
                      auVar205._4_4_ = fVar184;
                      auVar205._0_4_ = fVar184;
                      auVar205._8_4_ = fVar184;
                      auVar205._12_4_ = fVar184;
                      auVar106 = vfmadd132ps_fma(auVar205,auVar106,auVar188);
                      auVar170._4_4_ = fVar192;
                      auVar170._0_4_ = fVar192;
                      auVar170._8_4_ = fVar192;
                      auVar170._12_4_ = fVar192;
                      auVar106 = vfmadd132ps_fma(auVar170,auVar106,auVar7);
                      auVar244 = vbroadcastss_avx512f(auVar106);
                      auVar213 = vbroadcastss_avx512f(ZEXT416(1));
                      auVar213 = vpermps_avx512f(auVar213,ZEXT1664(auVar106));
                      auVar219 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar219,ZEXT1664(auVar106));
                      local_2c0[0] = (RTCHitN)auVar244[0];
                      local_2c0[1] = (RTCHitN)auVar244[1];
                      local_2c0[2] = (RTCHitN)auVar244[2];
                      local_2c0[3] = (RTCHitN)auVar244[3];
                      local_2c0[4] = (RTCHitN)auVar244[4];
                      local_2c0[5] = (RTCHitN)auVar244[5];
                      local_2c0[6] = (RTCHitN)auVar244[6];
                      local_2c0[7] = (RTCHitN)auVar244[7];
                      local_2c0[8] = (RTCHitN)auVar244[8];
                      local_2c0[9] = (RTCHitN)auVar244[9];
                      local_2c0[10] = (RTCHitN)auVar244[10];
                      local_2c0[0xb] = (RTCHitN)auVar244[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar244[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar244[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar244[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar244[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar244[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar244[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar244[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar244[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar244[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar244[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar244[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar244[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar244[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar244[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar244[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar244[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar244[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar244[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar244[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar244[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar244[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar244[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar244[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar244[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar244[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar244[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar244[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar244[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar244[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar244[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar244[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar244[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar244[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar244[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar244[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar244[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar244[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar244[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar244[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar244[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar244[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar244[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar244[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar244[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar244[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar244[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar244[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar244[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar244[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar244[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar244[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar244[0x3f];
                      local_280 = auVar213;
                      local_180 = local_4c0._0_8_;
                      uStack_178 = local_4c0._8_8_;
                      uStack_170 = local_4c0._16_8_;
                      uStack_168 = local_4c0._24_8_;
                      uStack_160 = local_4c0._32_8_;
                      uStack_158 = local_4c0._40_8_;
                      uStack_150 = local_4c0._48_8_;
                      uStack_148 = local_4c0._56_8_;
                      auVar244 = vmovdqa64_avx512f(local_440);
                      local_140 = vmovdqa64_avx512f(auVar244);
                      auVar117 = vpcmpeqd_avx2(auVar244._0_32_,auVar244._0_32_);
                      local_850[3] = auVar117;
                      local_850[2] = auVar117;
                      local_850[1] = auVar117;
                      *local_850 = auVar117;
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_880.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_880.context)->instPrimID[0]));
                      auVar244 = vmovdqa64_avx512f(local_300);
                      local_7c0 = vmovdqa64_avx512f(auVar244);
                      local_880.valid = (int *)local_7c0;
                      local_880.geometryUserPtr = pGVar98->userPtr;
                      local_880.hit = local_2c0;
                      local_880.N = 0x10;
                      local_800 = auVar181._0_32_;
                      local_880.ray = (RTCRayN *)ray;
                      if (pGVar98->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar213 = ZEXT1664(auVar213._0_16_);
                        auVar219 = ZEXT1664(auVar219._0_16_);
                        (*pGVar98->intersectionFilterN)(&local_880);
                        auVar224 = ZEXT3264(local_840);
                        auVar181 = ZEXT3264(local_800);
                        auVar243 = ZEXT464(0xbf800000);
                        auVar117 = vbroadcastss_avx512vl(ZEXT416(2));
                        auVar242 = ZEXT3264(auVar117);
                        auVar244 = vmovdqa64_avx512f(local_7c0);
                      }
                      uVar187 = vptestmd_avx512f(auVar244,auVar244);
                      if ((short)uVar187 == 0) {
LAB_01e4f9a2:
                        *(int *)(ray + k * 4 + 0x200) = auVar181._0_4_;
                      }
                      else {
                        p_Var20 = context->args->filter;
                        if ((p_Var20 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar98->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar213 = ZEXT1664(auVar213._0_16_);
                          auVar219 = ZEXT1664(auVar219._0_16_);
                          (*p_Var20)(&local_880);
                          auVar224 = ZEXT3264(local_840);
                          auVar181 = ZEXT3264(local_800);
                          auVar243 = ZEXT464(0xbf800000);
                          auVar117 = vbroadcastss_avx512vl(ZEXT416(2));
                          auVar242 = ZEXT3264(auVar117);
                          auVar244 = vmovdqa64_avx512f(local_7c0);
                        }
                        uVar35 = vptestmd_avx512f(auVar244,auVar244);
                        if ((short)uVar35 == 0) goto LAB_01e4f9a2;
                        iVar1 = *(int *)(local_880.hit + 4);
                        iVar2 = *(int *)(local_880.hit + 8);
                        iVar78 = *(int *)(local_880.hit + 0xc);
                        iVar79 = *(int *)(local_880.hit + 0x10);
                        iVar80 = *(int *)(local_880.hit + 0x14);
                        iVar81 = *(int *)(local_880.hit + 0x18);
                        iVar82 = *(int *)(local_880.hit + 0x1c);
                        iVar83 = *(int *)(local_880.hit + 0x20);
                        iVar84 = *(int *)(local_880.hit + 0x24);
                        iVar85 = *(int *)(local_880.hit + 0x28);
                        iVar86 = *(int *)(local_880.hit + 0x2c);
                        iVar87 = *(int *)(local_880.hit + 0x30);
                        iVar88 = *(int *)(local_880.hit + 0x34);
                        iVar89 = *(int *)(local_880.hit + 0x38);
                        iVar90 = *(int *)(local_880.hit + 0x3c);
                        bVar101 = (byte)uVar35;
                        bVar21 = (bool)((byte)(uVar35 >> 1) & 1);
                        bVar22 = (bool)((byte)(uVar35 >> 2) & 1);
                        bVar23 = (bool)((byte)(uVar35 >> 3) & 1);
                        bVar24 = (bool)((byte)(uVar35 >> 4) & 1);
                        bVar25 = (bool)((byte)(uVar35 >> 5) & 1);
                        bVar26 = (bool)((byte)(uVar35 >> 6) & 1);
                        bVar27 = (bool)((byte)(uVar35 >> 7) & 1);
                        bVar92 = (byte)(uVar35 >> 8);
                        bVar28 = (bool)((byte)(uVar35 >> 9) & 1);
                        bVar29 = (bool)((byte)(uVar35 >> 10) & 1);
                        bVar30 = (bool)((byte)(uVar35 >> 0xb) & 1);
                        bVar31 = (bool)((byte)(uVar35 >> 0xc) & 1);
                        bVar32 = (bool)((byte)(uVar35 >> 0xd) & 1);
                        bVar33 = (bool)((byte)(uVar35 >> 0xe) & 1);
                        bVar34 = SUB81(uVar35 >> 0xf,0);
                        *(uint *)(local_880.ray + 0x300) =
                             (uint)(bVar101 & 1) * *(int *)local_880.hit |
                             (uint)!(bool)(bVar101 & 1) * *(int *)(local_880.ray + 0x300);
                        *(uint *)(local_880.ray + 0x304) =
                             (uint)bVar21 * iVar1 | (uint)!bVar21 * *(int *)(local_880.ray + 0x304);
                        *(uint *)(local_880.ray + 0x308) =
                             (uint)bVar22 * iVar2 | (uint)!bVar22 * *(int *)(local_880.ray + 0x308);
                        *(uint *)(local_880.ray + 0x30c) =
                             (uint)bVar23 * iVar78 | (uint)!bVar23 * *(int *)(local_880.ray + 0x30c)
                        ;
                        *(uint *)(local_880.ray + 0x310) =
                             (uint)bVar24 * iVar79 | (uint)!bVar24 * *(int *)(local_880.ray + 0x310)
                        ;
                        *(uint *)(local_880.ray + 0x314) =
                             (uint)bVar25 * iVar80 | (uint)!bVar25 * *(int *)(local_880.ray + 0x314)
                        ;
                        *(uint *)(local_880.ray + 0x318) =
                             (uint)bVar26 * iVar81 | (uint)!bVar26 * *(int *)(local_880.ray + 0x318)
                        ;
                        *(uint *)(local_880.ray + 0x31c) =
                             (uint)bVar27 * iVar82 | (uint)!bVar27 * *(int *)(local_880.ray + 0x31c)
                        ;
                        *(uint *)(local_880.ray + 800) =
                             (uint)(bVar92 & 1) * iVar83 |
                             (uint)!(bool)(bVar92 & 1) * *(int *)(local_880.ray + 800);
                        *(uint *)(local_880.ray + 0x324) =
                             (uint)bVar28 * iVar84 | (uint)!bVar28 * *(int *)(local_880.ray + 0x324)
                        ;
                        *(uint *)(local_880.ray + 0x328) =
                             (uint)bVar29 * iVar85 | (uint)!bVar29 * *(int *)(local_880.ray + 0x328)
                        ;
                        *(uint *)(local_880.ray + 0x32c) =
                             (uint)bVar30 * iVar86 | (uint)!bVar30 * *(int *)(local_880.ray + 0x32c)
                        ;
                        *(uint *)(local_880.ray + 0x330) =
                             (uint)bVar31 * iVar87 | (uint)!bVar31 * *(int *)(local_880.ray + 0x330)
                        ;
                        *(uint *)(local_880.ray + 0x334) =
                             (uint)bVar32 * iVar88 | (uint)!bVar32 * *(int *)(local_880.ray + 0x334)
                        ;
                        *(uint *)(local_880.ray + 0x338) =
                             (uint)bVar33 * iVar89 | (uint)!bVar33 * *(int *)(local_880.ray + 0x338)
                        ;
                        *(uint *)(local_880.ray + 0x33c) =
                             (uint)bVar34 * iVar90 | (uint)!bVar34 * *(int *)(local_880.ray + 0x33c)
                        ;
                        iVar1 = *(int *)(local_880.hit + 0x44);
                        iVar2 = *(int *)(local_880.hit + 0x48);
                        iVar78 = *(int *)(local_880.hit + 0x4c);
                        iVar79 = *(int *)(local_880.hit + 0x50);
                        iVar80 = *(int *)(local_880.hit + 0x54);
                        iVar81 = *(int *)(local_880.hit + 0x58);
                        iVar82 = *(int *)(local_880.hit + 0x5c);
                        iVar83 = *(int *)(local_880.hit + 0x60);
                        iVar84 = *(int *)(local_880.hit + 100);
                        iVar85 = *(int *)(local_880.hit + 0x68);
                        iVar86 = *(int *)(local_880.hit + 0x6c);
                        iVar87 = *(int *)(local_880.hit + 0x70);
                        iVar88 = *(int *)(local_880.hit + 0x74);
                        iVar89 = *(int *)(local_880.hit + 0x78);
                        iVar90 = *(int *)(local_880.hit + 0x7c);
                        bVar21 = (bool)((byte)(uVar35 >> 1) & 1);
                        bVar22 = (bool)((byte)(uVar35 >> 2) & 1);
                        bVar23 = (bool)((byte)(uVar35 >> 3) & 1);
                        bVar24 = (bool)((byte)(uVar35 >> 4) & 1);
                        bVar25 = (bool)((byte)(uVar35 >> 5) & 1);
                        bVar26 = (bool)((byte)(uVar35 >> 6) & 1);
                        bVar27 = (bool)((byte)(uVar35 >> 7) & 1);
                        bVar28 = (bool)((byte)(uVar35 >> 9) & 1);
                        bVar29 = (bool)((byte)(uVar35 >> 10) & 1);
                        bVar30 = (bool)((byte)(uVar35 >> 0xb) & 1);
                        bVar31 = (bool)((byte)(uVar35 >> 0xc) & 1);
                        bVar32 = (bool)((byte)(uVar35 >> 0xd) & 1);
                        bVar33 = (bool)((byte)(uVar35 >> 0xe) & 1);
                        bVar34 = SUB81(uVar35 >> 0xf,0);
                        *(uint *)(local_880.ray + 0x340) =
                             (uint)(bVar101 & 1) * *(int *)(local_880.hit + 0x40) |
                             (uint)!(bool)(bVar101 & 1) * *(int *)(local_880.ray + 0x340);
                        *(uint *)(local_880.ray + 0x344) =
                             (uint)bVar21 * iVar1 | (uint)!bVar21 * *(int *)(local_880.ray + 0x344);
                        *(uint *)(local_880.ray + 0x348) =
                             (uint)bVar22 * iVar2 | (uint)!bVar22 * *(int *)(local_880.ray + 0x348);
                        *(uint *)(local_880.ray + 0x34c) =
                             (uint)bVar23 * iVar78 | (uint)!bVar23 * *(int *)(local_880.ray + 0x34c)
                        ;
                        *(uint *)(local_880.ray + 0x350) =
                             (uint)bVar24 * iVar79 | (uint)!bVar24 * *(int *)(local_880.ray + 0x350)
                        ;
                        *(uint *)(local_880.ray + 0x354) =
                             (uint)bVar25 * iVar80 | (uint)!bVar25 * *(int *)(local_880.ray + 0x354)
                        ;
                        *(uint *)(local_880.ray + 0x358) =
                             (uint)bVar26 * iVar81 | (uint)!bVar26 * *(int *)(local_880.ray + 0x358)
                        ;
                        *(uint *)(local_880.ray + 0x35c) =
                             (uint)bVar27 * iVar82 | (uint)!bVar27 * *(int *)(local_880.ray + 0x35c)
                        ;
                        *(uint *)(local_880.ray + 0x360) =
                             (uint)(bVar92 & 1) * iVar83 |
                             (uint)!(bool)(bVar92 & 1) * *(int *)(local_880.ray + 0x360);
                        *(uint *)(local_880.ray + 0x364) =
                             (uint)bVar28 * iVar84 | (uint)!bVar28 * *(int *)(local_880.ray + 0x364)
                        ;
                        *(uint *)(local_880.ray + 0x368) =
                             (uint)bVar29 * iVar85 | (uint)!bVar29 * *(int *)(local_880.ray + 0x368)
                        ;
                        *(uint *)(local_880.ray + 0x36c) =
                             (uint)bVar30 * iVar86 | (uint)!bVar30 * *(int *)(local_880.ray + 0x36c)
                        ;
                        *(uint *)(local_880.ray + 0x370) =
                             (uint)bVar31 * iVar87 | (uint)!bVar31 * *(int *)(local_880.ray + 0x370)
                        ;
                        *(uint *)(local_880.ray + 0x374) =
                             (uint)bVar32 * iVar88 | (uint)!bVar32 * *(int *)(local_880.ray + 0x374)
                        ;
                        *(uint *)(local_880.ray + 0x378) =
                             (uint)bVar33 * iVar89 | (uint)!bVar33 * *(int *)(local_880.ray + 0x378)
                        ;
                        *(uint *)(local_880.ray + 0x37c) =
                             (uint)bVar34 * iVar90 | (uint)!bVar34 * *(int *)(local_880.ray + 0x37c)
                        ;
                        iVar1 = *(int *)(local_880.hit + 0x84);
                        iVar2 = *(int *)(local_880.hit + 0x88);
                        iVar78 = *(int *)(local_880.hit + 0x8c);
                        iVar79 = *(int *)(local_880.hit + 0x90);
                        iVar80 = *(int *)(local_880.hit + 0x94);
                        iVar81 = *(int *)(local_880.hit + 0x98);
                        iVar82 = *(int *)(local_880.hit + 0x9c);
                        iVar83 = *(int *)(local_880.hit + 0xa0);
                        iVar84 = *(int *)(local_880.hit + 0xa4);
                        iVar85 = *(int *)(local_880.hit + 0xa8);
                        iVar86 = *(int *)(local_880.hit + 0xac);
                        iVar87 = *(int *)(local_880.hit + 0xb0);
                        iVar88 = *(int *)(local_880.hit + 0xb4);
                        iVar89 = *(int *)(local_880.hit + 0xb8);
                        iVar90 = *(int *)(local_880.hit + 0xbc);
                        bVar21 = (bool)((byte)(uVar35 >> 1) & 1);
                        bVar22 = (bool)((byte)(uVar35 >> 2) & 1);
                        bVar23 = (bool)((byte)(uVar35 >> 3) & 1);
                        bVar24 = (bool)((byte)(uVar35 >> 4) & 1);
                        bVar25 = (bool)((byte)(uVar35 >> 5) & 1);
                        bVar26 = (bool)((byte)(uVar35 >> 6) & 1);
                        bVar27 = (bool)((byte)(uVar35 >> 7) & 1);
                        bVar28 = (bool)((byte)(uVar35 >> 9) & 1);
                        bVar29 = (bool)((byte)(uVar35 >> 10) & 1);
                        bVar30 = (bool)((byte)(uVar35 >> 0xb) & 1);
                        bVar31 = (bool)((byte)(uVar35 >> 0xc) & 1);
                        bVar32 = (bool)((byte)(uVar35 >> 0xd) & 1);
                        bVar33 = (bool)((byte)(uVar35 >> 0xe) & 1);
                        bVar34 = SUB81(uVar35 >> 0xf,0);
                        *(uint *)(local_880.ray + 0x380) =
                             (uint)(bVar101 & 1) * *(int *)(local_880.hit + 0x80) |
                             (uint)!(bool)(bVar101 & 1) * *(int *)(local_880.ray + 0x380);
                        *(uint *)(local_880.ray + 900) =
                             (uint)bVar21 * iVar1 | (uint)!bVar21 * *(int *)(local_880.ray + 900);
                        *(uint *)(local_880.ray + 0x388) =
                             (uint)bVar22 * iVar2 | (uint)!bVar22 * *(int *)(local_880.ray + 0x388);
                        *(uint *)(local_880.ray + 0x38c) =
                             (uint)bVar23 * iVar78 | (uint)!bVar23 * *(int *)(local_880.ray + 0x38c)
                        ;
                        *(uint *)(local_880.ray + 0x390) =
                             (uint)bVar24 * iVar79 | (uint)!bVar24 * *(int *)(local_880.ray + 0x390)
                        ;
                        *(uint *)(local_880.ray + 0x394) =
                             (uint)bVar25 * iVar80 | (uint)!bVar25 * *(int *)(local_880.ray + 0x394)
                        ;
                        *(uint *)(local_880.ray + 0x398) =
                             (uint)bVar26 * iVar81 | (uint)!bVar26 * *(int *)(local_880.ray + 0x398)
                        ;
                        *(uint *)(local_880.ray + 0x39c) =
                             (uint)bVar27 * iVar82 | (uint)!bVar27 * *(int *)(local_880.ray + 0x39c)
                        ;
                        *(uint *)(local_880.ray + 0x3a0) =
                             (uint)(bVar92 & 1) * iVar83 |
                             (uint)!(bool)(bVar92 & 1) * *(int *)(local_880.ray + 0x3a0);
                        *(uint *)(local_880.ray + 0x3a4) =
                             (uint)bVar28 * iVar84 | (uint)!bVar28 * *(int *)(local_880.ray + 0x3a4)
                        ;
                        *(uint *)(local_880.ray + 0x3a8) =
                             (uint)bVar29 * iVar85 | (uint)!bVar29 * *(int *)(local_880.ray + 0x3a8)
                        ;
                        *(uint *)(local_880.ray + 0x3ac) =
                             (uint)bVar30 * iVar86 | (uint)!bVar30 * *(int *)(local_880.ray + 0x3ac)
                        ;
                        *(uint *)(local_880.ray + 0x3b0) =
                             (uint)bVar31 * iVar87 | (uint)!bVar31 * *(int *)(local_880.ray + 0x3b0)
                        ;
                        *(uint *)(local_880.ray + 0x3b4) =
                             (uint)bVar32 * iVar88 | (uint)!bVar32 * *(int *)(local_880.ray + 0x3b4)
                        ;
                        *(uint *)(local_880.ray + 0x3b8) =
                             (uint)bVar33 * iVar89 | (uint)!bVar33 * *(int *)(local_880.ray + 0x3b8)
                        ;
                        *(uint *)(local_880.ray + 0x3bc) =
                             (uint)bVar34 * iVar90 | (uint)!bVar34 * *(int *)(local_880.ray + 0x3bc)
                        ;
                        iVar1 = *(int *)(local_880.hit + 0xc4);
                        iVar2 = *(int *)(local_880.hit + 200);
                        iVar78 = *(int *)(local_880.hit + 0xcc);
                        iVar79 = *(int *)(local_880.hit + 0xd0);
                        iVar80 = *(int *)(local_880.hit + 0xd4);
                        iVar81 = *(int *)(local_880.hit + 0xd8);
                        iVar82 = *(int *)(local_880.hit + 0xdc);
                        iVar83 = *(int *)(local_880.hit + 0xe0);
                        iVar84 = *(int *)(local_880.hit + 0xe4);
                        iVar85 = *(int *)(local_880.hit + 0xe8);
                        iVar86 = *(int *)(local_880.hit + 0xec);
                        iVar87 = *(int *)(local_880.hit + 0xf0);
                        iVar88 = *(int *)(local_880.hit + 0xf4);
                        iVar89 = *(int *)(local_880.hit + 0xf8);
                        iVar90 = *(int *)(local_880.hit + 0xfc);
                        bVar21 = (bool)((byte)(uVar35 >> 1) & 1);
                        bVar22 = (bool)((byte)(uVar35 >> 2) & 1);
                        bVar23 = (bool)((byte)(uVar35 >> 3) & 1);
                        bVar24 = (bool)((byte)(uVar35 >> 4) & 1);
                        bVar25 = (bool)((byte)(uVar35 >> 5) & 1);
                        bVar26 = (bool)((byte)(uVar35 >> 6) & 1);
                        bVar27 = (bool)((byte)(uVar35 >> 7) & 1);
                        bVar28 = (bool)((byte)(uVar35 >> 9) & 1);
                        bVar29 = (bool)((byte)(uVar35 >> 10) & 1);
                        bVar30 = (bool)((byte)(uVar35 >> 0xb) & 1);
                        bVar31 = (bool)((byte)(uVar35 >> 0xc) & 1);
                        bVar32 = (bool)((byte)(uVar35 >> 0xd) & 1);
                        bVar33 = (bool)((byte)(uVar35 >> 0xe) & 1);
                        bVar34 = SUB81(uVar35 >> 0xf,0);
                        *(uint *)(local_880.ray + 0x3c0) =
                             (uint)(bVar101 & 1) * *(int *)(local_880.hit + 0xc0) |
                             (uint)!(bool)(bVar101 & 1) * *(int *)(local_880.ray + 0x3c0);
                        *(uint *)(local_880.ray + 0x3c4) =
                             (uint)bVar21 * iVar1 | (uint)!bVar21 * *(int *)(local_880.ray + 0x3c4);
                        *(uint *)(local_880.ray + 0x3c8) =
                             (uint)bVar22 * iVar2 | (uint)!bVar22 * *(int *)(local_880.ray + 0x3c8);
                        *(uint *)(local_880.ray + 0x3cc) =
                             (uint)bVar23 * iVar78 | (uint)!bVar23 * *(int *)(local_880.ray + 0x3cc)
                        ;
                        *(uint *)(local_880.ray + 0x3d0) =
                             (uint)bVar24 * iVar79 | (uint)!bVar24 * *(int *)(local_880.ray + 0x3d0)
                        ;
                        *(uint *)(local_880.ray + 0x3d4) =
                             (uint)bVar25 * iVar80 | (uint)!bVar25 * *(int *)(local_880.ray + 0x3d4)
                        ;
                        *(uint *)(local_880.ray + 0x3d8) =
                             (uint)bVar26 * iVar81 | (uint)!bVar26 * *(int *)(local_880.ray + 0x3d8)
                        ;
                        *(uint *)(local_880.ray + 0x3dc) =
                             (uint)bVar27 * iVar82 | (uint)!bVar27 * *(int *)(local_880.ray + 0x3dc)
                        ;
                        *(uint *)(local_880.ray + 0x3e0) =
                             (uint)(bVar92 & 1) * iVar83 |
                             (uint)!(bool)(bVar92 & 1) * *(int *)(local_880.ray + 0x3e0);
                        *(uint *)(local_880.ray + 0x3e4) =
                             (uint)bVar28 * iVar84 | (uint)!bVar28 * *(int *)(local_880.ray + 0x3e4)
                        ;
                        *(uint *)(local_880.ray + 1000) =
                             (uint)bVar29 * iVar85 | (uint)!bVar29 * *(int *)(local_880.ray + 1000);
                        *(uint *)(local_880.ray + 0x3ec) =
                             (uint)bVar30 * iVar86 | (uint)!bVar30 * *(int *)(local_880.ray + 0x3ec)
                        ;
                        *(uint *)(local_880.ray + 0x3f0) =
                             (uint)bVar31 * iVar87 | (uint)!bVar31 * *(int *)(local_880.ray + 0x3f0)
                        ;
                        *(uint *)(local_880.ray + 0x3f4) =
                             (uint)bVar32 * iVar88 | (uint)!bVar32 * *(int *)(local_880.ray + 0x3f4)
                        ;
                        *(uint *)(local_880.ray + 0x3f8) =
                             (uint)bVar33 * iVar89 | (uint)!bVar33 * *(int *)(local_880.ray + 0x3f8)
                        ;
                        *(uint *)(local_880.ray + 0x3fc) =
                             (uint)bVar34 * iVar90 | (uint)!bVar34 * *(int *)(local_880.ray + 0x3fc)
                        ;
                        iVar1 = *(int *)(local_880.hit + 0x104);
                        iVar2 = *(int *)(local_880.hit + 0x108);
                        iVar78 = *(int *)(local_880.hit + 0x10c);
                        iVar79 = *(int *)(local_880.hit + 0x110);
                        iVar80 = *(int *)(local_880.hit + 0x114);
                        iVar81 = *(int *)(local_880.hit + 0x118);
                        iVar82 = *(int *)(local_880.hit + 0x11c);
                        iVar83 = *(int *)(local_880.hit + 0x120);
                        iVar84 = *(int *)(local_880.hit + 0x124);
                        iVar85 = *(int *)(local_880.hit + 0x128);
                        iVar86 = *(int *)(local_880.hit + 300);
                        iVar87 = *(int *)(local_880.hit + 0x130);
                        iVar88 = *(int *)(local_880.hit + 0x134);
                        iVar89 = *(int *)(local_880.hit + 0x138);
                        iVar90 = *(int *)(local_880.hit + 0x13c);
                        bVar21 = (bool)((byte)(uVar35 >> 1) & 1);
                        bVar22 = (bool)((byte)(uVar35 >> 2) & 1);
                        bVar23 = (bool)((byte)(uVar35 >> 3) & 1);
                        bVar24 = (bool)((byte)(uVar35 >> 4) & 1);
                        bVar25 = (bool)((byte)(uVar35 >> 5) & 1);
                        bVar26 = (bool)((byte)(uVar35 >> 6) & 1);
                        bVar27 = (bool)((byte)(uVar35 >> 7) & 1);
                        bVar28 = (bool)((byte)(uVar35 >> 9) & 1);
                        bVar29 = (bool)((byte)(uVar35 >> 10) & 1);
                        bVar30 = (bool)((byte)(uVar35 >> 0xb) & 1);
                        bVar31 = (bool)((byte)(uVar35 >> 0xc) & 1);
                        bVar32 = (bool)((byte)(uVar35 >> 0xd) & 1);
                        bVar33 = (bool)((byte)(uVar35 >> 0xe) & 1);
                        bVar34 = SUB81(uVar35 >> 0xf,0);
                        *(uint *)(local_880.ray + 0x400) =
                             (uint)(bVar101 & 1) * *(int *)(local_880.hit + 0x100) |
                             (uint)!(bool)(bVar101 & 1) * *(int *)(local_880.ray + 0x400);
                        *(uint *)(local_880.ray + 0x404) =
                             (uint)bVar21 * iVar1 | (uint)!bVar21 * *(int *)(local_880.ray + 0x404);
                        *(uint *)(local_880.ray + 0x408) =
                             (uint)bVar22 * iVar2 | (uint)!bVar22 * *(int *)(local_880.ray + 0x408);
                        *(uint *)(local_880.ray + 0x40c) =
                             (uint)bVar23 * iVar78 | (uint)!bVar23 * *(int *)(local_880.ray + 0x40c)
                        ;
                        *(uint *)(local_880.ray + 0x410) =
                             (uint)bVar24 * iVar79 | (uint)!bVar24 * *(int *)(local_880.ray + 0x410)
                        ;
                        *(uint *)(local_880.ray + 0x414) =
                             (uint)bVar25 * iVar80 | (uint)!bVar25 * *(int *)(local_880.ray + 0x414)
                        ;
                        *(uint *)(local_880.ray + 0x418) =
                             (uint)bVar26 * iVar81 | (uint)!bVar26 * *(int *)(local_880.ray + 0x418)
                        ;
                        *(uint *)(local_880.ray + 0x41c) =
                             (uint)bVar27 * iVar82 | (uint)!bVar27 * *(int *)(local_880.ray + 0x41c)
                        ;
                        *(uint *)(local_880.ray + 0x420) =
                             (uint)(bVar92 & 1) * iVar83 |
                             (uint)!(bool)(bVar92 & 1) * *(int *)(local_880.ray + 0x420);
                        *(uint *)(local_880.ray + 0x424) =
                             (uint)bVar28 * iVar84 | (uint)!bVar28 * *(int *)(local_880.ray + 0x424)
                        ;
                        *(uint *)(local_880.ray + 0x428) =
                             (uint)bVar29 * iVar85 | (uint)!bVar29 * *(int *)(local_880.ray + 0x428)
                        ;
                        *(uint *)(local_880.ray + 0x42c) =
                             (uint)bVar30 * iVar86 | (uint)!bVar30 * *(int *)(local_880.ray + 0x42c)
                        ;
                        *(uint *)(local_880.ray + 0x430) =
                             (uint)bVar31 * iVar87 | (uint)!bVar31 * *(int *)(local_880.ray + 0x430)
                        ;
                        *(uint *)(local_880.ray + 0x434) =
                             (uint)bVar32 * iVar88 | (uint)!bVar32 * *(int *)(local_880.ray + 0x434)
                        ;
                        *(uint *)(local_880.ray + 0x438) =
                             (uint)bVar33 * iVar89 | (uint)!bVar33 * *(int *)(local_880.ray + 0x438)
                        ;
                        *(uint *)(local_880.ray + 0x43c) =
                             (uint)bVar34 * iVar90 | (uint)!bVar34 * *(int *)(local_880.ray + 0x43c)
                        ;
                        auVar181 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_880.hit + 0x140));
                        auVar181 = vmovdqu32_avx512f(auVar181);
                        *(undefined1 (*) [64])(local_880.ray + 0x440) = auVar181;
                        auVar181 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_880.hit + 0x180));
                        auVar181 = vmovdqu32_avx512f(auVar181);
                        *(undefined1 (*) [64])(local_880.ray + 0x480) = auVar181;
                        auVar181 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_880.hit + 0x1c0));
                        auVar181 = vmovdqa32_avx512f(auVar181);
                        *(undefined1 (*) [64])(local_880.ray + 0x4c0) = auVar181;
                        auVar181 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_880.hit + 0x200));
                        auVar181 = vmovdqa32_avx512f(auVar181);
                        *(undefined1 (*) [64])(local_880.ray + 0x500) = auVar181;
                        auVar181 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
                      }
                      bVar101 = ~(byte)(1 << ((uint)uVar93 & 0x1f)) & (byte)uVar102;
                      uVar165 = auVar181._0_4_;
                      auVar179._4_4_ = uVar165;
                      auVar179._0_4_ = uVar165;
                      auVar179._8_4_ = uVar165;
                      auVar179._12_4_ = uVar165;
                      auVar179._16_4_ = uVar165;
                      auVar179._20_4_ = uVar165;
                      auVar179._24_4_ = uVar165;
                      auVar179._28_4_ = uVar165;
                      uVar187 = vcmpps_avx512vl(auVar224._0_32_,auVar179,2);
                      if ((bVar101 & (byte)uVar187) == 0) goto LAB_01e4e90d;
                      bVar101 = bVar101 & (byte)uVar187;
                      uVar102 = (ulong)bVar101;
                      auVar180._8_4_ = 0x7f800000;
                      auVar180._0_8_ = 0x7f8000007f800000;
                      auVar180._12_4_ = 0x7f800000;
                      auVar180._16_4_ = 0x7f800000;
                      auVar180._20_4_ = 0x7f800000;
                      auVar180._24_4_ = 0x7f800000;
                      auVar180._28_4_ = 0x7f800000;
                      auVar117 = vblendmps_avx512vl(auVar180,auVar224._0_32_);
                      auVar153._0_4_ =
                           (uint)(bVar101 & 1) * auVar117._0_4_ |
                           (uint)!(bool)(bVar101 & 1) * 0x7f800000;
                      bVar21 = (bool)(bVar101 >> 1 & 1);
                      auVar153._4_4_ = (uint)bVar21 * auVar117._4_4_ | (uint)!bVar21 * 0x7f800000;
                      bVar21 = (bool)(bVar101 >> 2 & 1);
                      auVar153._8_4_ = (uint)bVar21 * auVar117._8_4_ | (uint)!bVar21 * 0x7f800000;
                      bVar21 = (bool)(bVar101 >> 3 & 1);
                      auVar153._12_4_ = (uint)bVar21 * auVar117._12_4_ | (uint)!bVar21 * 0x7f800000;
                      bVar21 = (bool)(bVar101 >> 4 & 1);
                      auVar153._16_4_ = (uint)bVar21 * auVar117._16_4_ | (uint)!bVar21 * 0x7f800000;
                      bVar21 = (bool)(bVar101 >> 5 & 1);
                      auVar153._20_4_ = (uint)bVar21 * auVar117._20_4_ | (uint)!bVar21 * 0x7f800000;
                      bVar21 = (bool)(bVar101 >> 6 & 1);
                      auVar153._24_4_ = (uint)bVar21 * auVar117._24_4_ | (uint)!bVar21 * 0x7f800000;
                      auVar153._28_4_ =
                           (uint)(bVar101 >> 7) * auVar117._28_4_ |
                           (uint)!(bool)(bVar101 >> 7) * 0x7f800000;
                      auVar117 = vshufps_avx(auVar153,auVar153,0xb1);
                      auVar117 = vminps_avx(auVar153,auVar117);
                      auVar116 = vshufpd_avx(auVar117,auVar117,5);
                      auVar117 = vminps_avx(auVar117,auVar116);
                      auVar116 = vpermpd_avx2(auVar117,0x4e);
                      auVar117 = vminps_avx(auVar117,auVar116);
                      uVar187 = vcmpps_avx512vl(auVar153,auVar117,0);
                      bVar92 = (byte)uVar187 & bVar101;
                      if (bVar92 != 0) {
                        bVar101 = bVar92;
                      }
                      uVar94 = 0;
                      for (uVar95 = (uint)bVar101; (uVar95 & 1) == 0;
                          uVar95 = uVar95 >> 1 | 0x80000000) {
                        uVar94 = uVar94 + 1;
                      }
                      uVar93 = (ulong)uVar94;
                    } while( true );
                  }
                  fVar192 = local_5a0[uVar93];
                  uVar165 = *(undefined4 *)(local_580 + uVar93 * 4);
                  fVar185 = 1.0 - fVar192;
                  fVar184 = fVar185 * fVar185 * -3.0;
                  auVar213 = ZEXT464((uint)fVar184);
                  auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar185 * fVar185)),
                                             ZEXT416((uint)(fVar192 * fVar185)),ZEXT416(0xc0000000))
                  ;
                  auVar105 = vfmsub132ss_fma(ZEXT416((uint)(fVar192 * fVar185)),
                                             ZEXT416((uint)(fVar192 * fVar192)),ZEXT416(0x40000000))
                  ;
                  fVar185 = auVar106._0_4_ * 3.0;
                  fVar186 = auVar105._0_4_ * 3.0;
                  fVar191 = fVar192 * fVar192 * 3.0;
                  auVar214._0_4_ = fVar191 * fVar163;
                  auVar214._4_4_ = fVar191 * fVar164;
                  auVar214._8_4_ = fVar191 * fVar182;
                  auVar214._12_4_ = fVar191 * fVar183;
                  auVar219 = ZEXT1664(auVar214);
                  auVar193._4_4_ = fVar186;
                  auVar193._0_4_ = fVar186;
                  auVar193._8_4_ = fVar186;
                  auVar193._12_4_ = fVar186;
                  auVar106 = vfmadd132ps_fma(auVar193,auVar214,auVar108);
                  auVar202._4_4_ = fVar185;
                  auVar202._0_4_ = fVar185;
                  auVar202._8_4_ = fVar185;
                  auVar202._12_4_ = fVar185;
                  auVar106 = vfmadd132ps_fma(auVar202,auVar106,auVar188);
                  auVar194._4_4_ = fVar184;
                  auVar194._0_4_ = fVar184;
                  auVar194._8_4_ = fVar184;
                  auVar194._12_4_ = fVar184;
                  auVar106 = vfmadd132ps_fma(auVar194,auVar106,auVar7);
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_560 + uVar93 * 4);
                  *(int *)(ray + k * 4 + 0x300) = auVar106._0_4_;
                  uVar16 = vextractps_avx(auVar106,1);
                  *(undefined4 *)(ray + k * 4 + 0x340) = uVar16;
                  uVar16 = vextractps_avx(auVar106,2);
                  *(undefined4 *)(ray + k * 4 + 0x380) = uVar16;
                  *(float *)(ray + k * 4 + 0x3c0) = fVar192;
                  *(undefined4 *)(ray + k * 4 + 0x400) = uVar165;
                  *(uint *)(ray + k * 4 + 0x440) = uVar14;
                  *(uint *)(ray + k * 4 + 0x480) = uVar99;
                  *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                }
              }
            }
          }
        }
      }
LAB_01e4e90d:
      if (8 < iVar15) {
        auVar117 = vpbroadcastd_avx512vl();
        auVar244 = ZEXT3264(auVar117);
        local_800._4_4_ = local_820._0_4_;
        local_800._0_4_ = local_820._0_4_;
        local_800._8_4_ = local_820._0_4_;
        local_800._12_4_ = local_820._0_4_;
        local_800._16_4_ = local_820._0_4_;
        local_800._20_4_ = local_820._0_4_;
        local_800._24_4_ = local_820._0_4_;
        local_800._28_4_ = local_820._0_4_;
        uStack_7dc = local_7e0;
        uStack_7d8 = local_7e0;
        uStack_7d4 = local_7e0;
        uStack_7d0 = local_7e0;
        uStack_7cc = local_7e0;
        uStack_7c8 = local_7e0;
        uStack_7c4 = local_7e0;
        local_3c0 = 1.0 / (float)local_480._0_4_;
        fStack_3bc = local_3c0;
        fStack_3b8 = local_3c0;
        fStack_3b4 = local_3c0;
        fStack_3b0 = local_3c0;
        fStack_3ac = local_3c0;
        fStack_3a8 = local_3c0;
        fStack_3a4 = local_3c0;
        auVar181 = vpbroadcastd_avx512f();
        local_480 = vmovdqa64_avx512f(auVar181);
        auVar181 = vpbroadcastd_avx512f();
        local_440 = vmovdqa64_avx512f(auVar181);
        lVar97 = 8;
LAB_01e4e9be:
        auVar117 = vpbroadcastd_avx512vl();
        auVar117 = vpor_avx2(auVar117,_DAT_01fe9900);
        uVar36 = vpcmpgtd_avx512vl(auVar244._0_32_,auVar117);
        auVar117 = *(undefined1 (*) [32])(bezier_basis0 + lVar97 * 4 + lVar37);
        auVar116 = *(undefined1 (*) [32])(lVar37 + 0x21aa768 + lVar97 * 4);
        auVar128 = *(undefined1 (*) [32])(lVar37 + 0x21aabec + lVar97 * 4);
        auVar127 = *(undefined1 (*) [32])(lVar37 + 0x21ab070 + lVar97 * 4);
        auVar220._0_4_ = auVar127._0_4_ * (float)local_740._0_4_;
        auVar220._4_4_ = auVar127._4_4_ * (float)local_740._4_4_;
        auVar220._8_4_ = auVar127._8_4_ * fStack_738;
        auVar220._12_4_ = auVar127._12_4_ * fStack_734;
        auVar220._16_4_ = auVar127._16_4_ * fStack_730;
        auVar220._20_4_ = auVar127._20_4_ * fStack_72c;
        auVar220._28_36_ = auVar219._28_36_;
        auVar220._24_4_ = auVar127._24_4_ * fStack_728;
        auVar181._0_4_ = auVar127._0_4_ * (float)local_760._0_4_;
        auVar181._4_4_ = auVar127._4_4_ * (float)local_760._4_4_;
        auVar181._8_4_ = auVar127._8_4_ * fStack_758;
        auVar181._12_4_ = auVar127._12_4_ * fStack_754;
        auVar181._16_4_ = auVar127._16_4_ * fStack_750;
        auVar181._20_4_ = auVar127._20_4_ * fStack_74c;
        auVar181._28_36_ = auVar213._28_36_;
        auVar181._24_4_ = auVar127._24_4_ * fStack_748;
        auVar118 = vmulps_avx512vl(local_3a0,auVar127);
        auVar119 = vfmadd231ps_avx512vl(auVar220._0_32_,auVar128,local_700);
        auVar126 = vfmadd231ps_avx512vl(auVar181._0_32_,auVar128,local_720);
        auVar118 = vfmadd231ps_avx512vl(auVar118,auVar128,local_380);
        auVar119 = vfmadd231ps_avx512vl(auVar119,auVar116,local_6c0);
        auVar126 = vfmadd231ps_avx512vl(auVar126,auVar116,local_6e0);
        auVar120 = vfmadd231ps_avx512vl(auVar118,auVar116,local_360);
        auVar106 = vfmadd231ps_fma(auVar119,auVar117,local_680);
        auVar219 = ZEXT1664(auVar106);
        auVar105 = vfmadd231ps_fma(auVar126,auVar117,local_6a0);
        auVar213 = ZEXT1664(auVar105);
        auVar118 = *(undefined1 (*) [32])(bezier_basis1 + lVar97 * 4 + lVar37);
        auVar119 = *(undefined1 (*) [32])(lVar37 + 0x21acb88 + lVar97 * 4);
        auVar115 = vfmadd231ps_avx512vl(auVar120,auVar117,local_340);
        auVar126 = *(undefined1 (*) [32])(lVar37 + 0x21ad00c + lVar97 * 4);
        auVar120 = *(undefined1 (*) [32])(lVar37 + 0x21ad490 + lVar97 * 4);
        auVar225._0_4_ = auVar120._0_4_ * (float)local_740._0_4_;
        auVar225._4_4_ = auVar120._4_4_ * (float)local_740._4_4_;
        auVar225._8_4_ = auVar120._8_4_ * fStack_738;
        auVar225._12_4_ = auVar120._12_4_ * fStack_734;
        auVar225._16_4_ = auVar120._16_4_ * fStack_730;
        auVar225._20_4_ = auVar120._20_4_ * fStack_72c;
        auVar225._28_36_ = auVar224._28_36_;
        auVar225._24_4_ = auVar120._24_4_ * fStack_728;
        auVar61._4_4_ = auVar120._4_4_ * (float)local_760._4_4_;
        auVar61._0_4_ = auVar120._0_4_ * (float)local_760._0_4_;
        auVar61._8_4_ = auVar120._8_4_ * fStack_758;
        auVar61._12_4_ = auVar120._12_4_ * fStack_754;
        auVar61._16_4_ = auVar120._16_4_ * fStack_750;
        auVar61._20_4_ = auVar120._20_4_ * fStack_74c;
        auVar61._24_4_ = auVar120._24_4_ * fStack_748;
        auVar61._28_4_ = uStack_744;
        auVar121 = vmulps_avx512vl(local_3a0,auVar120);
        auVar122 = vfmadd231ps_avx512vl(auVar225._0_32_,auVar126,local_700);
        auVar123 = vfmadd231ps_avx512vl(auVar61,auVar126,local_720);
        auVar121 = vfmadd231ps_avx512vl(auVar121,auVar126,local_380);
        auVar122 = vfmadd231ps_avx512vl(auVar122,auVar119,local_6c0);
        auVar123 = vfmadd231ps_avx512vl(auVar123,auVar119,local_6e0);
        auVar121 = vfmadd231ps_avx512vl(auVar121,auVar119,local_360);
        auVar6 = vfmadd231ps_fma(auVar122,auVar118,local_680);
        auVar224 = ZEXT1664(auVar6);
        auVar8 = vfmadd231ps_fma(auVar123,auVar118,local_6a0);
        auVar123 = vfmadd231ps_avx512vl(auVar121,auVar118,local_340);
        auVar124 = vmaxps_avx512vl(auVar115,auVar123);
        auVar121 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar106));
        auVar122 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar105));
        auVar113 = vmulps_avx512vl(ZEXT1632(auVar105),auVar121);
        auVar114 = vmulps_avx512vl(ZEXT1632(auVar106),auVar122);
        auVar113 = vsubps_avx512vl(auVar113,auVar114);
        auVar114 = vmulps_avx512vl(auVar122,auVar122);
        auVar114 = vfmadd231ps_avx512vl(auVar114,auVar121,auVar121);
        auVar124 = vmulps_avx512vl(auVar124,auVar124);
        auVar124 = vmulps_avx512vl(auVar124,auVar114);
        auVar113 = vmulps_avx512vl(auVar113,auVar113);
        uVar187 = vcmpps_avx512vl(auVar113,auVar124,2);
        bVar101 = (byte)uVar36 & (byte)uVar187;
        if (bVar101 != 0) {
          auVar120 = vmulps_avx512vl(local_540,auVar120);
          auVar126 = vfmadd213ps_avx512vl(auVar126,local_520,auVar120);
          auVar119 = vfmadd213ps_avx512vl(auVar119,local_500,auVar126);
          auVar118 = vfmadd213ps_avx512vl(auVar118,local_4e0,auVar119);
          auVar127 = vmulps_avx512vl(local_540,auVar127);
          auVar128 = vfmadd213ps_avx512vl(auVar128,local_520,auVar127);
          auVar116 = vfmadd213ps_avx512vl(auVar116,local_500,auVar128);
          auVar119 = vfmadd213ps_avx512vl(auVar117,local_4e0,auVar116);
          auVar117 = *(undefined1 (*) [32])(lVar37 + 0x21ab4f4 + lVar97 * 4);
          auVar116 = *(undefined1 (*) [32])(lVar37 + 0x21ab978 + lVar97 * 4);
          auVar128 = *(undefined1 (*) [32])(lVar37 + 0x21abdfc + lVar97 * 4);
          auVar127 = *(undefined1 (*) [32])(lVar37 + 0x21ac280 + lVar97 * 4);
          auVar126 = vmulps_avx512vl(_local_740,auVar127);
          auVar120 = vmulps_avx512vl(_local_760,auVar127);
          auVar127 = vmulps_avx512vl(local_540,auVar127);
          auVar126 = vfmadd231ps_avx512vl(auVar126,auVar128,local_700);
          auVar120 = vfmadd231ps_avx512vl(auVar120,auVar128,local_720);
          auVar128 = vfmadd231ps_avx512vl(auVar127,local_520,auVar128);
          auVar127 = vfmadd231ps_avx512vl(auVar126,auVar116,local_6c0);
          auVar126 = vfmadd231ps_avx512vl(auVar120,auVar116,local_6e0);
          auVar116 = vfmadd231ps_avx512vl(auVar128,local_500,auVar116);
          auVar127 = vfmadd231ps_avx512vl(auVar127,auVar117,local_680);
          auVar126 = vfmadd231ps_avx512vl(auVar126,auVar117,local_6a0);
          auVar120 = vfmadd231ps_avx512vl(auVar116,local_4e0,auVar117);
          auVar117 = *(undefined1 (*) [32])(lVar37 + 0x21ad914 + lVar97 * 4);
          auVar116 = *(undefined1 (*) [32])(lVar37 + 0x21ae21c + lVar97 * 4);
          auVar128 = *(undefined1 (*) [32])(lVar37 + 0x21ae6a0 + lVar97 * 4);
          auVar124 = vmulps_avx512vl(_local_740,auVar128);
          auVar113 = vmulps_avx512vl(_local_760,auVar128);
          auVar128 = vmulps_avx512vl(local_540,auVar128);
          auVar124 = vfmadd231ps_avx512vl(auVar124,auVar116,local_700);
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar116,local_720);
          auVar128 = vfmadd231ps_avx512vl(auVar128,local_520,auVar116);
          auVar116 = *(undefined1 (*) [32])(lVar37 + 0x21add98 + lVar97 * 4);
          auVar124 = vfmadd231ps_avx512vl(auVar124,auVar116,local_6c0);
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar116,local_6e0);
          auVar116 = vfmadd231ps_avx512vl(auVar128,local_500,auVar116);
          auVar128 = vfmadd231ps_avx512vl(auVar124,auVar117,local_680);
          auVar124 = vfmadd231ps_avx512vl(auVar113,auVar117,local_6a0);
          auVar116 = vfmadd231ps_avx512vl(auVar116,local_4e0,auVar117);
          auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar127,auVar113);
          vandps_avx512vl(auVar126,auVar113);
          auVar117 = vmaxps_avx(auVar113,auVar113);
          vandps_avx512vl(auVar120,auVar113);
          auVar117 = vmaxps_avx(auVar117,auVar113);
          uVar93 = vcmpps_avx512vl(auVar117,local_800,1);
          bVar21 = (bool)((byte)uVar93 & 1);
          auVar141._0_4_ = (float)((uint)bVar21 * auVar121._0_4_ | (uint)!bVar21 * auVar127._0_4_);
          bVar21 = (bool)((byte)(uVar93 >> 1) & 1);
          auVar141._4_4_ = (float)((uint)bVar21 * auVar121._4_4_ | (uint)!bVar21 * auVar127._4_4_);
          bVar21 = (bool)((byte)(uVar93 >> 2) & 1);
          auVar141._8_4_ = (float)((uint)bVar21 * auVar121._8_4_ | (uint)!bVar21 * auVar127._8_4_);
          bVar21 = (bool)((byte)(uVar93 >> 3) & 1);
          auVar141._12_4_ =
               (float)((uint)bVar21 * auVar121._12_4_ | (uint)!bVar21 * auVar127._12_4_);
          bVar21 = (bool)((byte)(uVar93 >> 4) & 1);
          auVar141._16_4_ =
               (float)((uint)bVar21 * auVar121._16_4_ | (uint)!bVar21 * auVar127._16_4_);
          bVar21 = (bool)((byte)(uVar93 >> 5) & 1);
          auVar141._20_4_ =
               (float)((uint)bVar21 * auVar121._20_4_ | (uint)!bVar21 * auVar127._20_4_);
          bVar21 = (bool)((byte)(uVar93 >> 6) & 1);
          auVar141._24_4_ =
               (float)((uint)bVar21 * auVar121._24_4_ | (uint)!bVar21 * auVar127._24_4_);
          bVar21 = SUB81(uVar93 >> 7,0);
          auVar141._28_4_ = (uint)bVar21 * auVar121._28_4_ | (uint)!bVar21 * auVar127._28_4_;
          bVar21 = (bool)((byte)uVar93 & 1);
          auVar142._0_4_ = (float)((uint)bVar21 * auVar122._0_4_ | (uint)!bVar21 * auVar126._0_4_);
          bVar21 = (bool)((byte)(uVar93 >> 1) & 1);
          auVar142._4_4_ = (float)((uint)bVar21 * auVar122._4_4_ | (uint)!bVar21 * auVar126._4_4_);
          bVar21 = (bool)((byte)(uVar93 >> 2) & 1);
          auVar142._8_4_ = (float)((uint)bVar21 * auVar122._8_4_ | (uint)!bVar21 * auVar126._8_4_);
          bVar21 = (bool)((byte)(uVar93 >> 3) & 1);
          auVar142._12_4_ =
               (float)((uint)bVar21 * auVar122._12_4_ | (uint)!bVar21 * auVar126._12_4_);
          bVar21 = (bool)((byte)(uVar93 >> 4) & 1);
          auVar142._16_4_ =
               (float)((uint)bVar21 * auVar122._16_4_ | (uint)!bVar21 * auVar126._16_4_);
          bVar21 = (bool)((byte)(uVar93 >> 5) & 1);
          auVar142._20_4_ =
               (float)((uint)bVar21 * auVar122._20_4_ | (uint)!bVar21 * auVar126._20_4_);
          bVar21 = (bool)((byte)(uVar93 >> 6) & 1);
          auVar142._24_4_ =
               (float)((uint)bVar21 * auVar122._24_4_ | (uint)!bVar21 * auVar126._24_4_);
          bVar21 = SUB81(uVar93 >> 7,0);
          auVar142._28_4_ = (uint)bVar21 * auVar122._28_4_ | (uint)!bVar21 * auVar126._28_4_;
          vandps_avx512vl(auVar128,auVar113);
          vandps_avx512vl(auVar124,auVar113);
          auVar117 = vmaxps_avx(auVar142,auVar142);
          vandps_avx512vl(auVar116,auVar113);
          auVar117 = vmaxps_avx(auVar117,auVar142);
          uVar93 = vcmpps_avx512vl(auVar117,local_800,1);
          bVar21 = (bool)((byte)uVar93 & 1);
          auVar143._0_4_ = (uint)bVar21 * auVar121._0_4_ | (uint)!bVar21 * auVar128._0_4_;
          bVar21 = (bool)((byte)(uVar93 >> 1) & 1);
          auVar143._4_4_ = (uint)bVar21 * auVar121._4_4_ | (uint)!bVar21 * auVar128._4_4_;
          bVar21 = (bool)((byte)(uVar93 >> 2) & 1);
          auVar143._8_4_ = (uint)bVar21 * auVar121._8_4_ | (uint)!bVar21 * auVar128._8_4_;
          bVar21 = (bool)((byte)(uVar93 >> 3) & 1);
          auVar143._12_4_ = (uint)bVar21 * auVar121._12_4_ | (uint)!bVar21 * auVar128._12_4_;
          bVar21 = (bool)((byte)(uVar93 >> 4) & 1);
          auVar143._16_4_ = (uint)bVar21 * auVar121._16_4_ | (uint)!bVar21 * auVar128._16_4_;
          bVar21 = (bool)((byte)(uVar93 >> 5) & 1);
          auVar143._20_4_ = (uint)bVar21 * auVar121._20_4_ | (uint)!bVar21 * auVar128._20_4_;
          bVar21 = (bool)((byte)(uVar93 >> 6) & 1);
          auVar143._24_4_ = (uint)bVar21 * auVar121._24_4_ | (uint)!bVar21 * auVar128._24_4_;
          bVar21 = SUB81(uVar93 >> 7,0);
          auVar143._28_4_ = (uint)bVar21 * auVar121._28_4_ | (uint)!bVar21 * auVar128._28_4_;
          bVar21 = (bool)((byte)uVar93 & 1);
          auVar144._0_4_ = (float)((uint)bVar21 * auVar122._0_4_ | (uint)!bVar21 * auVar124._0_4_);
          bVar21 = (bool)((byte)(uVar93 >> 1) & 1);
          auVar144._4_4_ = (float)((uint)bVar21 * auVar122._4_4_ | (uint)!bVar21 * auVar124._4_4_);
          bVar21 = (bool)((byte)(uVar93 >> 2) & 1);
          auVar144._8_4_ = (float)((uint)bVar21 * auVar122._8_4_ | (uint)!bVar21 * auVar124._8_4_);
          bVar21 = (bool)((byte)(uVar93 >> 3) & 1);
          auVar144._12_4_ =
               (float)((uint)bVar21 * auVar122._12_4_ | (uint)!bVar21 * auVar124._12_4_);
          bVar21 = (bool)((byte)(uVar93 >> 4) & 1);
          auVar144._16_4_ =
               (float)((uint)bVar21 * auVar122._16_4_ | (uint)!bVar21 * auVar124._16_4_);
          bVar21 = (bool)((byte)(uVar93 >> 5) & 1);
          auVar144._20_4_ =
               (float)((uint)bVar21 * auVar122._20_4_ | (uint)!bVar21 * auVar124._20_4_);
          bVar21 = (bool)((byte)(uVar93 >> 6) & 1);
          auVar144._24_4_ =
               (float)((uint)bVar21 * auVar122._24_4_ | (uint)!bVar21 * auVar124._24_4_);
          bVar21 = SUB81(uVar93 >> 7,0);
          auVar144._28_4_ = (uint)bVar21 * auVar122._28_4_ | (uint)!bVar21 * auVar124._28_4_;
          auVar230._8_4_ = 0x80000000;
          auVar230._0_8_ = 0x8000000080000000;
          auVar230._12_4_ = 0x80000000;
          auVar230._16_4_ = 0x80000000;
          auVar230._20_4_ = 0x80000000;
          auVar230._24_4_ = 0x80000000;
          auVar230._28_4_ = 0x80000000;
          auVar117 = vxorps_avx512vl(auVar143,auVar230);
          auVar112 = vxorps_avx512vl(auVar113._0_16_,auVar113._0_16_);
          auVar116 = vfmadd213ps_avx512vl(auVar141,auVar141,ZEXT1632(auVar112));
          auVar9 = vfmadd231ps_fma(auVar116,auVar142,auVar142);
          auVar116 = vrsqrt14ps_avx512vl(ZEXT1632(auVar9));
          auVar240._8_4_ = 0xbf000000;
          auVar240._0_8_ = 0xbf000000bf000000;
          auVar240._12_4_ = 0xbf000000;
          auVar240._16_4_ = 0xbf000000;
          auVar240._20_4_ = 0xbf000000;
          auVar240._24_4_ = 0xbf000000;
          auVar240._28_4_ = 0xbf000000;
          fVar192 = auVar116._0_4_;
          fVar184 = auVar116._4_4_;
          fVar185 = auVar116._8_4_;
          fVar186 = auVar116._12_4_;
          fVar191 = auVar116._16_4_;
          fVar200 = auVar116._20_4_;
          fVar103 = auVar116._24_4_;
          auVar62._4_4_ = fVar184 * fVar184 * fVar184 * auVar9._4_4_ * -0.5;
          auVar62._0_4_ = fVar192 * fVar192 * fVar192 * auVar9._0_4_ * -0.5;
          auVar62._8_4_ = fVar185 * fVar185 * fVar185 * auVar9._8_4_ * -0.5;
          auVar62._12_4_ = fVar186 * fVar186 * fVar186 * auVar9._12_4_ * -0.5;
          auVar62._16_4_ = fVar191 * fVar191 * fVar191 * -0.0;
          auVar62._20_4_ = fVar200 * fVar200 * fVar200 * -0.0;
          auVar62._24_4_ = fVar103 * fVar103 * fVar103 * -0.0;
          auVar62._28_4_ = auVar142._28_4_;
          auVar128 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar116 = vfmadd231ps_avx512vl(auVar62,auVar128,auVar116);
          auVar63._4_4_ = auVar142._4_4_ * auVar116._4_4_;
          auVar63._0_4_ = auVar142._0_4_ * auVar116._0_4_;
          auVar63._8_4_ = auVar142._8_4_ * auVar116._8_4_;
          auVar63._12_4_ = auVar142._12_4_ * auVar116._12_4_;
          auVar63._16_4_ = auVar142._16_4_ * auVar116._16_4_;
          auVar63._20_4_ = auVar142._20_4_ * auVar116._20_4_;
          auVar63._24_4_ = auVar142._24_4_ * auVar116._24_4_;
          auVar63._28_4_ = 0;
          auVar64._4_4_ = auVar116._4_4_ * -auVar141._4_4_;
          auVar64._0_4_ = auVar116._0_4_ * -auVar141._0_4_;
          auVar64._8_4_ = auVar116._8_4_ * -auVar141._8_4_;
          auVar64._12_4_ = auVar116._12_4_ * -auVar141._12_4_;
          auVar64._16_4_ = auVar116._16_4_ * -auVar141._16_4_;
          auVar64._20_4_ = auVar116._20_4_ * -auVar141._20_4_;
          auVar64._24_4_ = auVar116._24_4_ * -auVar141._24_4_;
          auVar64._28_4_ = auVar142._28_4_;
          auVar127 = vmulps_avx512vl(auVar116,ZEXT1632(auVar112));
          auVar120 = ZEXT1632(auVar112);
          auVar116 = vfmadd213ps_avx512vl(auVar143,auVar143,auVar120);
          auVar116 = vfmadd231ps_avx512vl(auVar116,auVar144,auVar144);
          auVar126 = vrsqrt14ps_avx512vl(auVar116);
          auVar116 = vmulps_avx512vl(auVar116,auVar240);
          fVar192 = auVar126._0_4_;
          fVar184 = auVar126._4_4_;
          fVar185 = auVar126._8_4_;
          fVar186 = auVar126._12_4_;
          fVar191 = auVar126._16_4_;
          fVar200 = auVar126._20_4_;
          fVar103 = auVar126._24_4_;
          auVar65._4_4_ = fVar184 * fVar184 * fVar184 * auVar116._4_4_;
          auVar65._0_4_ = fVar192 * fVar192 * fVar192 * auVar116._0_4_;
          auVar65._8_4_ = fVar185 * fVar185 * fVar185 * auVar116._8_4_;
          auVar65._12_4_ = fVar186 * fVar186 * fVar186 * auVar116._12_4_;
          auVar65._16_4_ = fVar191 * fVar191 * fVar191 * auVar116._16_4_;
          auVar65._20_4_ = fVar200 * fVar200 * fVar200 * auVar116._20_4_;
          auVar65._24_4_ = fVar103 * fVar103 * fVar103 * auVar116._24_4_;
          auVar65._28_4_ = auVar116._28_4_;
          auVar116 = vfmadd231ps_avx512vl(auVar65,auVar128,auVar126);
          auVar66._4_4_ = auVar144._4_4_ * auVar116._4_4_;
          auVar66._0_4_ = auVar144._0_4_ * auVar116._0_4_;
          auVar66._8_4_ = auVar144._8_4_ * auVar116._8_4_;
          auVar66._12_4_ = auVar144._12_4_ * auVar116._12_4_;
          auVar66._16_4_ = auVar144._16_4_ * auVar116._16_4_;
          auVar66._20_4_ = auVar144._20_4_ * auVar116._20_4_;
          auVar66._24_4_ = auVar144._24_4_ * auVar116._24_4_;
          auVar66._28_4_ = auVar126._28_4_;
          auVar67._4_4_ = auVar116._4_4_ * auVar117._4_4_;
          auVar67._0_4_ = auVar116._0_4_ * auVar117._0_4_;
          auVar67._8_4_ = auVar116._8_4_ * auVar117._8_4_;
          auVar67._12_4_ = auVar116._12_4_ * auVar117._12_4_;
          auVar67._16_4_ = auVar116._16_4_ * auVar117._16_4_;
          auVar67._20_4_ = auVar116._20_4_ * auVar117._20_4_;
          auVar67._24_4_ = auVar116._24_4_ * auVar117._24_4_;
          auVar67._28_4_ = auVar117._28_4_;
          auVar117 = vmulps_avx512vl(auVar116,auVar120);
          auVar9 = vfmadd213ps_fma(auVar63,auVar115,ZEXT1632(auVar106));
          auVar10 = vfmadd213ps_fma(auVar64,auVar115,ZEXT1632(auVar105));
          auVar128 = vfmadd213ps_avx512vl(auVar127,auVar115,auVar119);
          auVar126 = vfmadd213ps_avx512vl(auVar66,auVar123,ZEXT1632(auVar6));
          auVar12 = vfnmadd213ps_fma(auVar63,auVar115,ZEXT1632(auVar106));
          auVar106 = vfmadd213ps_fma(auVar67,auVar123,ZEXT1632(auVar8));
          auVar166 = vfnmadd213ps_fma(auVar64,auVar115,ZEXT1632(auVar105));
          auVar105 = vfmadd213ps_fma(auVar117,auVar123,auVar118);
          auVar110 = vfnmadd231ps_fma(auVar119,auVar115,auVar127);
          auVar107 = vfnmadd213ps_fma(auVar66,auVar123,ZEXT1632(auVar6));
          auVar109 = vfnmadd213ps_fma(auVar67,auVar123,ZEXT1632(auVar8));
          auVar111 = vfnmadd231ps_fma(auVar118,auVar123,auVar117);
          auVar118 = vsubps_avx512vl(auVar126,ZEXT1632(auVar12));
          auVar117 = vsubps_avx(ZEXT1632(auVar106),ZEXT1632(auVar166));
          auVar116 = vsubps_avx(ZEXT1632(auVar105),ZEXT1632(auVar110));
          auVar68._4_4_ = auVar117._4_4_ * auVar110._4_4_;
          auVar68._0_4_ = auVar117._0_4_ * auVar110._0_4_;
          auVar68._8_4_ = auVar117._8_4_ * auVar110._8_4_;
          auVar68._12_4_ = auVar117._12_4_ * auVar110._12_4_;
          auVar68._16_4_ = auVar117._16_4_ * 0.0;
          auVar68._20_4_ = auVar117._20_4_ * 0.0;
          auVar68._24_4_ = auVar117._24_4_ * 0.0;
          auVar68._28_4_ = auVar127._28_4_;
          auVar6 = vfmsub231ps_fma(auVar68,ZEXT1632(auVar166),auVar116);
          auVar69._4_4_ = auVar116._4_4_ * auVar12._4_4_;
          auVar69._0_4_ = auVar116._0_4_ * auVar12._0_4_;
          auVar69._8_4_ = auVar116._8_4_ * auVar12._8_4_;
          auVar69._12_4_ = auVar116._12_4_ * auVar12._12_4_;
          auVar69._16_4_ = auVar116._16_4_ * 0.0;
          auVar69._20_4_ = auVar116._20_4_ * 0.0;
          auVar69._24_4_ = auVar116._24_4_ * 0.0;
          auVar69._28_4_ = auVar116._28_4_;
          auVar8 = vfmsub231ps_fma(auVar69,ZEXT1632(auVar110),auVar118);
          auVar70._4_4_ = auVar166._4_4_ * auVar118._4_4_;
          auVar70._0_4_ = auVar166._0_4_ * auVar118._0_4_;
          auVar70._8_4_ = auVar166._8_4_ * auVar118._8_4_;
          auVar70._12_4_ = auVar166._12_4_ * auVar118._12_4_;
          auVar70._16_4_ = auVar118._16_4_ * 0.0;
          auVar70._20_4_ = auVar118._20_4_ * 0.0;
          auVar70._24_4_ = auVar118._24_4_ * 0.0;
          auVar70._28_4_ = auVar118._28_4_;
          auVar11 = vfmsub231ps_fma(auVar70,ZEXT1632(auVar12),auVar117);
          auVar117 = vfmadd231ps_avx512vl(ZEXT1632(auVar11),auVar120,ZEXT1632(auVar8));
          auVar117 = vfmadd231ps_avx512vl(auVar117,auVar120,ZEXT1632(auVar6));
          auVar113 = ZEXT1632(auVar112);
          uVar93 = vcmpps_avx512vl(auVar117,auVar113,2);
          bVar92 = (byte)uVar93;
          fVar155 = (float)((uint)(bVar92 & 1) * auVar9._0_4_ |
                           (uint)!(bool)(bVar92 & 1) * auVar107._0_4_);
          bVar21 = (bool)((byte)(uVar93 >> 1) & 1);
          fVar157 = (float)((uint)bVar21 * auVar9._4_4_ | (uint)!bVar21 * auVar107._4_4_);
          bVar21 = (bool)((byte)(uVar93 >> 2) & 1);
          fVar160 = (float)((uint)bVar21 * auVar9._8_4_ | (uint)!bVar21 * auVar107._8_4_);
          bVar21 = (bool)((byte)(uVar93 >> 3) & 1);
          fVar161 = (float)((uint)bVar21 * auVar9._12_4_ | (uint)!bVar21 * auVar107._12_4_);
          auVar120 = ZEXT1632(CONCAT412(fVar161,CONCAT48(fVar160,CONCAT44(fVar157,fVar155))));
          fVar156 = (float)((uint)(bVar92 & 1) * auVar10._0_4_ |
                           (uint)!(bool)(bVar92 & 1) * auVar109._0_4_);
          bVar21 = (bool)((byte)(uVar93 >> 1) & 1);
          fVar159 = (float)((uint)bVar21 * auVar10._4_4_ | (uint)!bVar21 * auVar109._4_4_);
          bVar21 = (bool)((byte)(uVar93 >> 2) & 1);
          fVar158 = (float)((uint)bVar21 * auVar10._8_4_ | (uint)!bVar21 * auVar109._8_4_);
          bVar21 = (bool)((byte)(uVar93 >> 3) & 1);
          fVar162 = (float)((uint)bVar21 * auVar10._12_4_ | (uint)!bVar21 * auVar109._12_4_);
          auVar121 = ZEXT1632(CONCAT412(fVar162,CONCAT48(fVar158,CONCAT44(fVar159,fVar156))));
          auVar145._0_4_ =
               (float)((uint)(bVar92 & 1) * auVar128._0_4_ |
                      (uint)!(bool)(bVar92 & 1) * auVar111._0_4_);
          bVar21 = (bool)((byte)(uVar93 >> 1) & 1);
          auVar145._4_4_ = (float)((uint)bVar21 * auVar128._4_4_ | (uint)!bVar21 * auVar111._4_4_);
          bVar21 = (bool)((byte)(uVar93 >> 2) & 1);
          auVar145._8_4_ = (float)((uint)bVar21 * auVar128._8_4_ | (uint)!bVar21 * auVar111._8_4_);
          bVar21 = (bool)((byte)(uVar93 >> 3) & 1);
          auVar145._12_4_ =
               (float)((uint)bVar21 * auVar128._12_4_ | (uint)!bVar21 * auVar111._12_4_);
          fVar192 = (float)((uint)((byte)(uVar93 >> 4) & 1) * auVar128._16_4_);
          auVar145._16_4_ = fVar192;
          fVar184 = (float)((uint)((byte)(uVar93 >> 5) & 1) * auVar128._20_4_);
          auVar145._20_4_ = fVar184;
          fVar185 = (float)((uint)((byte)(uVar93 >> 6) & 1) * auVar128._24_4_);
          auVar145._24_4_ = fVar185;
          iVar1 = (uint)(byte)(uVar93 >> 7) * auVar128._28_4_;
          auVar145._28_4_ = iVar1;
          auVar117 = vblendmps_avx512vl(ZEXT1632(auVar12),auVar126);
          auVar146._0_4_ =
               (uint)(bVar92 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar92 & 1) * auVar6._0_4_;
          bVar21 = (bool)((byte)(uVar93 >> 1) & 1);
          auVar146._4_4_ = (uint)bVar21 * auVar117._4_4_ | (uint)!bVar21 * auVar6._4_4_;
          bVar21 = (bool)((byte)(uVar93 >> 2) & 1);
          auVar146._8_4_ = (uint)bVar21 * auVar117._8_4_ | (uint)!bVar21 * auVar6._8_4_;
          bVar21 = (bool)((byte)(uVar93 >> 3) & 1);
          auVar146._12_4_ = (uint)bVar21 * auVar117._12_4_ | (uint)!bVar21 * auVar6._12_4_;
          auVar146._16_4_ = (uint)((byte)(uVar93 >> 4) & 1) * auVar117._16_4_;
          auVar146._20_4_ = (uint)((byte)(uVar93 >> 5) & 1) * auVar117._20_4_;
          auVar146._24_4_ = (uint)((byte)(uVar93 >> 6) & 1) * auVar117._24_4_;
          auVar146._28_4_ = (uint)(byte)(uVar93 >> 7) * auVar117._28_4_;
          auVar117 = vblendmps_avx512vl(ZEXT1632(auVar166),ZEXT1632(auVar106));
          auVar147._0_4_ =
               (float)((uint)(bVar92 & 1) * auVar117._0_4_ |
                      (uint)!(bool)(bVar92 & 1) * auVar9._0_4_);
          bVar21 = (bool)((byte)(uVar93 >> 1) & 1);
          auVar147._4_4_ = (float)((uint)bVar21 * auVar117._4_4_ | (uint)!bVar21 * auVar9._4_4_);
          bVar21 = (bool)((byte)(uVar93 >> 2) & 1);
          auVar147._8_4_ = (float)((uint)bVar21 * auVar117._8_4_ | (uint)!bVar21 * auVar9._8_4_);
          bVar21 = (bool)((byte)(uVar93 >> 3) & 1);
          auVar147._12_4_ = (float)((uint)bVar21 * auVar117._12_4_ | (uint)!bVar21 * auVar9._12_4_);
          fVar191 = (float)((uint)((byte)(uVar93 >> 4) & 1) * auVar117._16_4_);
          auVar147._16_4_ = fVar191;
          fVar186 = (float)((uint)((byte)(uVar93 >> 5) & 1) * auVar117._20_4_);
          auVar147._20_4_ = fVar186;
          fVar200 = (float)((uint)((byte)(uVar93 >> 6) & 1) * auVar117._24_4_);
          auVar147._24_4_ = fVar200;
          auVar147._28_4_ = (uint)(byte)(uVar93 >> 7) * auVar117._28_4_;
          auVar117 = vblendmps_avx512vl(ZEXT1632(auVar110),ZEXT1632(auVar105));
          auVar148._0_4_ =
               (float)((uint)(bVar92 & 1) * auVar117._0_4_ |
                      (uint)!(bool)(bVar92 & 1) * auVar10._0_4_);
          bVar21 = (bool)((byte)(uVar93 >> 1) & 1);
          auVar148._4_4_ = (float)((uint)bVar21 * auVar117._4_4_ | (uint)!bVar21 * auVar10._4_4_);
          bVar21 = (bool)((byte)(uVar93 >> 2) & 1);
          auVar148._8_4_ = (float)((uint)bVar21 * auVar117._8_4_ | (uint)!bVar21 * auVar10._8_4_);
          bVar21 = (bool)((byte)(uVar93 >> 3) & 1);
          auVar148._12_4_ = (float)((uint)bVar21 * auVar117._12_4_ | (uint)!bVar21 * auVar10._12_4_)
          ;
          fVar154 = (float)((uint)((byte)(uVar93 >> 4) & 1) * auVar117._16_4_);
          auVar148._16_4_ = fVar154;
          fVar104 = (float)((uint)((byte)(uVar93 >> 5) & 1) * auVar117._20_4_);
          auVar148._20_4_ = fVar104;
          fVar103 = (float)((uint)((byte)(uVar93 >> 6) & 1) * auVar117._24_4_);
          auVar148._24_4_ = fVar103;
          iVar2 = (uint)(byte)(uVar93 >> 7) * auVar117._28_4_;
          auVar148._28_4_ = iVar2;
          auVar149._0_4_ =
               (uint)(bVar92 & 1) * (int)auVar12._0_4_ | (uint)!(bool)(bVar92 & 1) * auVar126._0_4_;
          bVar21 = (bool)((byte)(uVar93 >> 1) & 1);
          auVar149._4_4_ = (uint)bVar21 * (int)auVar12._4_4_ | (uint)!bVar21 * auVar126._4_4_;
          bVar21 = (bool)((byte)(uVar93 >> 2) & 1);
          auVar149._8_4_ = (uint)bVar21 * (int)auVar12._8_4_ | (uint)!bVar21 * auVar126._8_4_;
          bVar21 = (bool)((byte)(uVar93 >> 3) & 1);
          auVar149._12_4_ = (uint)bVar21 * (int)auVar12._12_4_ | (uint)!bVar21 * auVar126._12_4_;
          auVar149._16_4_ = (uint)!(bool)((byte)(uVar93 >> 4) & 1) * auVar126._16_4_;
          auVar149._20_4_ = (uint)!(bool)((byte)(uVar93 >> 5) & 1) * auVar126._20_4_;
          auVar149._24_4_ = (uint)!(bool)((byte)(uVar93 >> 6) & 1) * auVar126._24_4_;
          auVar149._28_4_ = (uint)!SUB81(uVar93 >> 7,0) * auVar126._28_4_;
          bVar21 = (bool)((byte)(uVar93 >> 1) & 1);
          bVar23 = (bool)((byte)(uVar93 >> 2) & 1);
          bVar25 = (bool)((byte)(uVar93 >> 3) & 1);
          bVar22 = (bool)((byte)(uVar93 >> 1) & 1);
          bVar24 = (bool)((byte)(uVar93 >> 2) & 1);
          bVar26 = (bool)((byte)(uVar93 >> 3) & 1);
          auVar126 = vsubps_avx512vl(auVar149,auVar120);
          auVar116 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar25 * (int)auVar166._12_4_ |
                                                   (uint)!bVar25 * auVar106._12_4_,
                                                   CONCAT48((uint)bVar23 * (int)auVar166._8_4_ |
                                                            (uint)!bVar23 * auVar106._8_4_,
                                                            CONCAT44((uint)bVar21 *
                                                                     (int)auVar166._4_4_ |
                                                                     (uint)!bVar21 * auVar106._4_4_,
                                                                     (uint)(bVar92 & 1) *
                                                                     (int)auVar166._0_4_ |
                                                                     (uint)!(bool)(bVar92 & 1) *
                                                                     auVar106._0_4_)))),auVar121);
          auVar219 = ZEXT3264(auVar116);
          auVar128 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar26 * (int)auVar110._12_4_ |
                                                   (uint)!bVar26 * auVar105._12_4_,
                                                   CONCAT48((uint)bVar24 * (int)auVar110._8_4_ |
                                                            (uint)!bVar24 * auVar105._8_4_,
                                                            CONCAT44((uint)bVar22 *
                                                                     (int)auVar110._4_4_ |
                                                                     (uint)!bVar22 * auVar105._4_4_,
                                                                     (uint)(bVar92 & 1) *
                                                                     (int)auVar110._0_4_ |
                                                                     (uint)!(bool)(bVar92 & 1) *
                                                                     auVar105._0_4_)))),auVar145);
          auVar127 = vsubps_avx(auVar120,auVar146);
          auVar224 = ZEXT3264(auVar127);
          auVar118 = vsubps_avx(auVar121,auVar147);
          auVar119 = vsubps_avx(auVar145,auVar148);
          auVar71._4_4_ = auVar128._4_4_ * fVar157;
          auVar71._0_4_ = auVar128._0_4_ * fVar155;
          auVar71._8_4_ = auVar128._8_4_ * fVar160;
          auVar71._12_4_ = auVar128._12_4_ * fVar161;
          auVar71._16_4_ = auVar128._16_4_ * 0.0;
          auVar71._20_4_ = auVar128._20_4_ * 0.0;
          auVar71._24_4_ = auVar128._24_4_ * 0.0;
          auVar71._28_4_ = 0;
          auVar106 = vfmsub231ps_fma(auVar71,auVar145,auVar126);
          auVar207._0_4_ = fVar156 * auVar126._0_4_;
          auVar207._4_4_ = fVar159 * auVar126._4_4_;
          auVar207._8_4_ = fVar158 * auVar126._8_4_;
          auVar207._12_4_ = fVar162 * auVar126._12_4_;
          auVar207._16_4_ = auVar126._16_4_ * 0.0;
          auVar207._20_4_ = auVar126._20_4_ * 0.0;
          auVar207._24_4_ = auVar126._24_4_ * 0.0;
          auVar207._28_4_ = 0;
          auVar105 = vfmsub231ps_fma(auVar207,auVar120,auVar116);
          auVar117 = vfmadd231ps_avx512vl(ZEXT1632(auVar105),auVar113,ZEXT1632(auVar106));
          auVar211._0_4_ = auVar116._0_4_ * auVar145._0_4_;
          auVar211._4_4_ = auVar116._4_4_ * auVar145._4_4_;
          auVar211._8_4_ = auVar116._8_4_ * auVar145._8_4_;
          auVar211._12_4_ = auVar116._12_4_ * auVar145._12_4_;
          auVar211._16_4_ = auVar116._16_4_ * fVar192;
          auVar211._20_4_ = auVar116._20_4_ * fVar184;
          auVar211._24_4_ = auVar116._24_4_ * fVar185;
          auVar211._28_4_ = 0;
          auVar106 = vfmsub231ps_fma(auVar211,auVar121,auVar128);
          auVar122 = vfmadd231ps_avx512vl(auVar117,auVar113,ZEXT1632(auVar106));
          auVar117 = vmulps_avx512vl(auVar119,auVar146);
          auVar117 = vfmsub231ps_avx512vl(auVar117,auVar127,auVar148);
          auVar72._4_4_ = auVar118._4_4_ * auVar148._4_4_;
          auVar72._0_4_ = auVar118._0_4_ * auVar148._0_4_;
          auVar72._8_4_ = auVar118._8_4_ * auVar148._8_4_;
          auVar72._12_4_ = auVar118._12_4_ * auVar148._12_4_;
          auVar72._16_4_ = auVar118._16_4_ * fVar154;
          auVar72._20_4_ = auVar118._20_4_ * fVar104;
          auVar72._24_4_ = auVar118._24_4_ * fVar103;
          auVar72._28_4_ = iVar2;
          auVar106 = vfmsub231ps_fma(auVar72,auVar147,auVar119);
          auVar212._0_4_ = auVar147._0_4_ * auVar127._0_4_;
          auVar212._4_4_ = auVar147._4_4_ * auVar127._4_4_;
          auVar212._8_4_ = auVar147._8_4_ * auVar127._8_4_;
          auVar212._12_4_ = auVar147._12_4_ * auVar127._12_4_;
          auVar212._16_4_ = fVar191 * auVar127._16_4_;
          auVar212._20_4_ = fVar186 * auVar127._20_4_;
          auVar212._24_4_ = fVar200 * auVar127._24_4_;
          auVar212._28_4_ = 0;
          auVar105 = vfmsub231ps_fma(auVar212,auVar118,auVar146);
          auVar117 = vfmadd231ps_avx512vl(ZEXT1632(auVar105),auVar113,auVar117);
          auVar124 = vfmadd231ps_avx512vl(auVar117,auVar113,ZEXT1632(auVar106));
          auVar213 = ZEXT3264(auVar124);
          auVar117 = vmaxps_avx(auVar122,auVar124);
          uVar187 = vcmpps_avx512vl(auVar117,auVar113,2);
          bVar101 = bVar101 & (byte)uVar187;
          if (bVar101 != 0) {
            uVar165 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar241._4_4_ = uVar165;
            auVar241._0_4_ = uVar165;
            auVar241._8_4_ = uVar165;
            auVar241._12_4_ = uVar165;
            auVar241._16_4_ = uVar165;
            auVar241._20_4_ = uVar165;
            auVar241._24_4_ = uVar165;
            auVar241._28_4_ = uVar165;
            auVar181 = ZEXT3264(auVar241);
            auVar73._4_4_ = auVar119._4_4_ * auVar116._4_4_;
            auVar73._0_4_ = auVar119._0_4_ * auVar116._0_4_;
            auVar73._8_4_ = auVar119._8_4_ * auVar116._8_4_;
            auVar73._12_4_ = auVar119._12_4_ * auVar116._12_4_;
            auVar73._16_4_ = auVar119._16_4_ * auVar116._16_4_;
            auVar73._20_4_ = auVar119._20_4_ * auVar116._20_4_;
            auVar73._24_4_ = auVar119._24_4_ * auVar116._24_4_;
            auVar73._28_4_ = auVar117._28_4_;
            auVar8 = vfmsub231ps_fma(auVar73,auVar118,auVar128);
            auVar74._4_4_ = auVar128._4_4_ * auVar127._4_4_;
            auVar74._0_4_ = auVar128._0_4_ * auVar127._0_4_;
            auVar74._8_4_ = auVar128._8_4_ * auVar127._8_4_;
            auVar74._12_4_ = auVar128._12_4_ * auVar127._12_4_;
            auVar74._16_4_ = auVar128._16_4_ * auVar127._16_4_;
            auVar74._20_4_ = auVar128._20_4_ * auVar127._20_4_;
            auVar74._24_4_ = auVar128._24_4_ * auVar127._24_4_;
            auVar74._28_4_ = auVar128._28_4_;
            auVar6 = vfmsub231ps_fma(auVar74,auVar126,auVar119);
            auVar75._4_4_ = auVar118._4_4_ * auVar126._4_4_;
            auVar75._0_4_ = auVar118._0_4_ * auVar126._0_4_;
            auVar75._8_4_ = auVar118._8_4_ * auVar126._8_4_;
            auVar75._12_4_ = auVar118._12_4_ * auVar126._12_4_;
            auVar75._16_4_ = auVar118._16_4_ * auVar126._16_4_;
            auVar75._20_4_ = auVar118._20_4_ * auVar126._20_4_;
            auVar75._24_4_ = auVar118._24_4_ * auVar126._24_4_;
            auVar75._28_4_ = auVar118._28_4_;
            auVar9 = vfmsub231ps_fma(auVar75,auVar127,auVar116);
            auVar106 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar6),ZEXT1632(auVar9));
            auVar105 = vfmadd231ps_fma(ZEXT1632(auVar106),ZEXT1632(auVar8),
                                       ZEXT1232(ZEXT412(0)) << 0x20);
            auVar117 = vrcp14ps_avx512vl(ZEXT1632(auVar105));
            auVar42._8_4_ = 0x3f800000;
            auVar42._0_8_ = 0x3f8000003f800000;
            auVar42._12_4_ = 0x3f800000;
            auVar42._16_4_ = 0x3f800000;
            auVar42._20_4_ = 0x3f800000;
            auVar42._24_4_ = 0x3f800000;
            auVar42._28_4_ = 0x3f800000;
            auVar116 = vfnmadd213ps_avx512vl(auVar117,ZEXT1632(auVar105),auVar42);
            auVar106 = vfmadd132ps_fma(auVar116,auVar117,auVar117);
            auVar219 = ZEXT1664(auVar106);
            auVar76._4_4_ = auVar9._4_4_ * auVar145._4_4_;
            auVar76._0_4_ = auVar9._0_4_ * auVar145._0_4_;
            auVar76._8_4_ = auVar9._8_4_ * auVar145._8_4_;
            auVar76._12_4_ = auVar9._12_4_ * auVar145._12_4_;
            auVar76._16_4_ = fVar192 * 0.0;
            auVar76._20_4_ = fVar184 * 0.0;
            auVar76._24_4_ = fVar185 * 0.0;
            auVar76._28_4_ = iVar1;
            auVar6 = vfmadd231ps_fma(auVar76,auVar121,ZEXT1632(auVar6));
            auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar120,ZEXT1632(auVar8));
            fVar192 = auVar106._0_4_;
            fVar184 = auVar106._4_4_;
            fVar185 = auVar106._8_4_;
            fVar186 = auVar106._12_4_;
            local_620._28_4_ = auVar117._28_4_;
            local_620._0_28_ =
                 ZEXT1628(CONCAT412(auVar6._12_4_ * fVar186,
                                    CONCAT48(auVar6._8_4_ * fVar185,
                                             CONCAT44(auVar6._4_4_ * fVar184,auVar6._0_4_ * fVar192)
                                            )));
            auVar224 = ZEXT3264(local_620);
            uVar187 = vcmpps_avx512vl(local_620,auVar241,2);
            auVar91._4_4_ = uStack_7dc;
            auVar91._0_4_ = local_7e0;
            auVar91._8_4_ = uStack_7d8;
            auVar91._12_4_ = uStack_7d4;
            auVar91._16_4_ = uStack_7d0;
            auVar91._20_4_ = uStack_7cc;
            auVar91._24_4_ = uStack_7c8;
            auVar91._28_4_ = uStack_7c4;
            uVar36 = vcmpps_avx512vl(local_620,auVar91,0xd);
            bVar101 = (byte)uVar187 & (byte)uVar36 & bVar101;
            if (bVar101 != 0) {
              uVar102 = vcmpps_avx512vl(ZEXT1632(auVar105),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar102 = bVar101 & uVar102;
              if ((char)uVar102 != '\0') {
                fVar191 = auVar122._0_4_ * fVar192;
                fVar200 = auVar122._4_4_ * fVar184;
                auVar77._4_4_ = fVar200;
                auVar77._0_4_ = fVar191;
                fVar103 = auVar122._8_4_ * fVar185;
                auVar77._8_4_ = fVar103;
                fVar104 = auVar122._12_4_ * fVar186;
                auVar77._12_4_ = fVar104;
                fVar154 = auVar122._16_4_ * 0.0;
                auVar77._16_4_ = fVar154;
                fVar155 = auVar122._20_4_ * 0.0;
                auVar77._20_4_ = fVar155;
                fVar156 = auVar122._24_4_ * 0.0;
                auVar77._24_4_ = fVar156;
                auVar77._28_4_ = auVar122._28_4_;
                auVar199._8_4_ = 0x3f800000;
                auVar199._0_8_ = 0x3f8000003f800000;
                auVar199._12_4_ = 0x3f800000;
                auVar199._16_4_ = 0x3f800000;
                auVar199._20_4_ = 0x3f800000;
                auVar199._24_4_ = 0x3f800000;
                auVar199._28_4_ = 0x3f800000;
                auVar117 = vsubps_avx(auVar199,auVar77);
                local_660._0_4_ =
                     (float)((uint)(bVar92 & 1) * (int)fVar191 |
                            (uint)!(bool)(bVar92 & 1) * auVar117._0_4_);
                bVar21 = (bool)((byte)(uVar93 >> 1) & 1);
                local_660._4_4_ =
                     (float)((uint)bVar21 * (int)fVar200 | (uint)!bVar21 * auVar117._4_4_);
                bVar21 = (bool)((byte)(uVar93 >> 2) & 1);
                local_660._8_4_ =
                     (float)((uint)bVar21 * (int)fVar103 | (uint)!bVar21 * auVar117._8_4_);
                bVar21 = (bool)((byte)(uVar93 >> 3) & 1);
                local_660._12_4_ =
                     (float)((uint)bVar21 * (int)fVar104 | (uint)!bVar21 * auVar117._12_4_);
                bVar21 = (bool)((byte)(uVar93 >> 4) & 1);
                local_660._16_4_ =
                     (float)((uint)bVar21 * (int)fVar154 | (uint)!bVar21 * auVar117._16_4_);
                bVar21 = (bool)((byte)(uVar93 >> 5) & 1);
                local_660._20_4_ =
                     (float)((uint)bVar21 * (int)fVar155 | (uint)!bVar21 * auVar117._20_4_);
                bVar21 = (bool)((byte)(uVar93 >> 6) & 1);
                local_660._24_4_ =
                     (float)((uint)bVar21 * (int)fVar156 | (uint)!bVar21 * auVar117._24_4_);
                bVar21 = SUB81(uVar93 >> 7,0);
                local_660._28_4_ =
                     (float)((uint)bVar21 * auVar122._28_4_ | (uint)!bVar21 * auVar117._28_4_);
                auVar117 = vsubps_avx(auVar123,auVar115);
                auVar106 = vfmadd213ps_fma(auVar117,local_660,auVar115);
                uVar165 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
                auVar43._4_4_ = uVar165;
                auVar43._0_4_ = uVar165;
                auVar43._8_4_ = uVar165;
                auVar43._12_4_ = uVar165;
                auVar43._16_4_ = uVar165;
                auVar43._20_4_ = uVar165;
                auVar43._24_4_ = uVar165;
                auVar43._28_4_ = uVar165;
                auVar117 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar106._12_4_ + auVar106._12_4_,
                                                              CONCAT48(auVar106._8_4_ +
                                                                       auVar106._8_4_,
                                                                       CONCAT44(auVar106._4_4_ +
                                                                                auVar106._4_4_,
                                                                                auVar106._0_4_ +
                                                                                auVar106._0_4_)))),
                                           auVar43);
                uVar35 = vcmpps_avx512vl(local_620,auVar117,6);
                uVar102 = uVar102 & uVar35;
                bVar101 = (byte)uVar102;
                if (bVar101 != 0) {
                  auVar190._0_4_ = auVar124._0_4_ * fVar192;
                  auVar190._4_4_ = auVar124._4_4_ * fVar184;
                  auVar190._8_4_ = auVar124._8_4_ * fVar185;
                  auVar190._12_4_ = auVar124._12_4_ * fVar186;
                  auVar190._16_4_ = auVar124._16_4_ * 0.0;
                  auVar190._20_4_ = auVar124._20_4_ * 0.0;
                  auVar190._24_4_ = auVar124._24_4_ * 0.0;
                  auVar190._28_4_ = 0;
                  auVar208._8_4_ = 0x3f800000;
                  auVar208._0_8_ = 0x3f8000003f800000;
                  auVar208._12_4_ = 0x3f800000;
                  auVar208._16_4_ = 0x3f800000;
                  auVar208._20_4_ = 0x3f800000;
                  auVar208._24_4_ = 0x3f800000;
                  auVar208._28_4_ = 0x3f800000;
                  auVar117 = vsubps_avx(auVar208,auVar190);
                  auVar150._0_4_ =
                       (uint)(bVar92 & 1) * (int)auVar190._0_4_ |
                       (uint)!(bool)(bVar92 & 1) * auVar117._0_4_;
                  bVar21 = (bool)((byte)(uVar93 >> 1) & 1);
                  auVar150._4_4_ =
                       (uint)bVar21 * (int)auVar190._4_4_ | (uint)!bVar21 * auVar117._4_4_;
                  bVar21 = (bool)((byte)(uVar93 >> 2) & 1);
                  auVar150._8_4_ =
                       (uint)bVar21 * (int)auVar190._8_4_ | (uint)!bVar21 * auVar117._8_4_;
                  bVar21 = (bool)((byte)(uVar93 >> 3) & 1);
                  auVar150._12_4_ =
                       (uint)bVar21 * (int)auVar190._12_4_ | (uint)!bVar21 * auVar117._12_4_;
                  bVar21 = (bool)((byte)(uVar93 >> 4) & 1);
                  auVar150._16_4_ =
                       (uint)bVar21 * (int)auVar190._16_4_ | (uint)!bVar21 * auVar117._16_4_;
                  bVar21 = (bool)((byte)(uVar93 >> 5) & 1);
                  auVar150._20_4_ =
                       (uint)bVar21 * (int)auVar190._20_4_ | (uint)!bVar21 * auVar117._20_4_;
                  bVar21 = (bool)((byte)(uVar93 >> 6) & 1);
                  auVar150._24_4_ =
                       (uint)bVar21 * (int)auVar190._24_4_ | (uint)!bVar21 * auVar117._24_4_;
                  auVar150._28_4_ = (uint)!SUB81(uVar93 >> 7,0) * auVar117._28_4_;
                  auVar44._8_4_ = 0x40000000;
                  auVar44._0_8_ = 0x4000000040000000;
                  auVar44._12_4_ = 0x40000000;
                  auVar44._16_4_ = 0x40000000;
                  auVar44._20_4_ = 0x40000000;
                  auVar44._24_4_ = 0x40000000;
                  auVar44._28_4_ = 0x40000000;
                  local_640 = vfmsub132ps_avx512vl(auVar150,auVar208,auVar44);
                  local_600 = (undefined4)lVar97;
                  local_5f0 = local_890;
                  uStack_5e8 = uStack_888;
                  local_5e0 = local_8b0;
                  uStack_5d8 = uStack_8a8;
                  local_5d0 = local_8c0;
                  uStack_5c8 = uStack_8b8;
                  local_5c0 = local_8a0;
                  uStack_5b8 = uStack_898;
                  pGVar98 = (context->scene->geometries).items[uVar99].ptr;
                  if ((pGVar98->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                    auVar106 = vcvtsi2ss_avx512f(auVar112,local_600);
                    fVar192 = auVar106._0_4_;
                    local_5a0[0] = (fVar192 + local_660._0_4_ + 0.0) * local_3c0;
                    local_5a0[1] = (fVar192 + local_660._4_4_ + 1.0) * fStack_3bc;
                    local_5a0[2] = (fVar192 + local_660._8_4_ + 2.0) * fStack_3b8;
                    local_5a0[3] = (fVar192 + local_660._12_4_ + 3.0) * fStack_3b4;
                    fStack_590 = (fVar192 + local_660._16_4_ + 4.0) * fStack_3b0;
                    fStack_58c = (fVar192 + local_660._20_4_ + 5.0) * fStack_3ac;
                    fStack_588 = (fVar192 + local_660._24_4_ + 6.0) * fStack_3a8;
                    fStack_584 = fVar192 + local_660._28_4_ + 7.0;
                    local_580 = local_640;
                    local_560 = local_620;
                    auVar176._8_4_ = 0x7f800000;
                    auVar176._0_8_ = 0x7f8000007f800000;
                    auVar176._12_4_ = 0x7f800000;
                    auVar176._16_4_ = 0x7f800000;
                    auVar176._20_4_ = 0x7f800000;
                    auVar176._24_4_ = 0x7f800000;
                    auVar176._28_4_ = 0x7f800000;
                    auVar117 = vblendmps_avx512vl(auVar176,local_620);
                    auVar151._0_4_ =
                         (uint)(bVar101 & 1) * auVar117._0_4_ |
                         (uint)!(bool)(bVar101 & 1) * 0x7f800000;
                    bVar21 = (bool)((byte)(uVar102 >> 1) & 1);
                    auVar151._4_4_ = (uint)bVar21 * auVar117._4_4_ | (uint)!bVar21 * 0x7f800000;
                    bVar21 = (bool)((byte)(uVar102 >> 2) & 1);
                    auVar151._8_4_ = (uint)bVar21 * auVar117._8_4_ | (uint)!bVar21 * 0x7f800000;
                    bVar21 = (bool)((byte)(uVar102 >> 3) & 1);
                    auVar151._12_4_ = (uint)bVar21 * auVar117._12_4_ | (uint)!bVar21 * 0x7f800000;
                    bVar21 = (bool)((byte)(uVar102 >> 4) & 1);
                    auVar151._16_4_ = (uint)bVar21 * auVar117._16_4_ | (uint)!bVar21 * 0x7f800000;
                    bVar21 = (bool)((byte)(uVar102 >> 5) & 1);
                    auVar151._20_4_ = (uint)bVar21 * auVar117._20_4_ | (uint)!bVar21 * 0x7f800000;
                    bVar21 = (bool)((byte)(uVar102 >> 6) & 1);
                    auVar151._24_4_ = (uint)bVar21 * auVar117._24_4_ | (uint)!bVar21 * 0x7f800000;
                    bVar21 = SUB81(uVar102 >> 7,0);
                    auVar151._28_4_ = (uint)bVar21 * auVar117._28_4_ | (uint)!bVar21 * 0x7f800000;
                    auVar117 = vshufps_avx(auVar151,auVar151,0xb1);
                    auVar117 = vminps_avx(auVar151,auVar117);
                    auVar116 = vshufpd_avx(auVar117,auVar117,5);
                    auVar117 = vminps_avx(auVar117,auVar116);
                    auVar116 = vpermpd_avx2(auVar117,0x4e);
                    auVar117 = vminps_avx(auVar117,auVar116);
                    uVar187 = vcmpps_avx512vl(auVar151,auVar117,0);
                    uVar94 = (uint)uVar102;
                    if (((byte)uVar187 & bVar101) != 0) {
                      uVar94 = (uint)((byte)uVar187 & bVar101);
                    }
                    uVar95 = 0;
                    for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
                      uVar95 = uVar95 + 1;
                    }
                    uVar93 = (ulong)uVar95;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar98->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_3e0 = vmovdqa64_avx512vl(auVar244._0_32_);
                      local_4c0._0_32_ = local_620;
                      local_840._0_8_ = pGVar98;
                      local_5fc = iVar15;
                      do {
                        local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_5a0[uVar93]));
                        local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_580 + uVar93 * 4)))
                        ;
                        *(undefined4 *)(ray + k * 4 + 0x200) =
                             *(undefined4 *)(local_560 + uVar93 * 4);
                        local_880.context = context->user;
                        fVar186 = local_200._0_4_;
                        fVar184 = 1.0 - fVar186;
                        fVar192 = fVar184 * fVar184 * -3.0;
                        auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar184 * fVar184)),
                                                   ZEXT416((uint)(fVar186 * fVar184)),
                                                   ZEXT416(0xc0000000));
                        auVar105 = vfmsub132ss_fma(ZEXT416((uint)(fVar186 * fVar184)),
                                                   ZEXT416((uint)(fVar186 * fVar186)),
                                                   ZEXT416(0x40000000));
                        fVar184 = auVar106._0_4_ * 3.0;
                        fVar185 = auVar105._0_4_ * 3.0;
                        fVar186 = fVar186 * fVar186 * 3.0;
                        auVar216._0_4_ = fVar186 * fVar163;
                        auVar216._4_4_ = fVar186 * fVar164;
                        auVar216._8_4_ = fVar186 * fVar182;
                        auVar216._12_4_ = fVar186 * fVar183;
                        auVar167._4_4_ = fVar185;
                        auVar167._0_4_ = fVar185;
                        auVar167._8_4_ = fVar185;
                        auVar167._12_4_ = fVar185;
                        auVar106 = vfmadd132ps_fma(auVar167,auVar216,auVar108);
                        auVar204._4_4_ = fVar184;
                        auVar204._0_4_ = fVar184;
                        auVar204._8_4_ = fVar184;
                        auVar204._12_4_ = fVar184;
                        auVar106 = vfmadd132ps_fma(auVar204,auVar106,auVar188);
                        auVar168._4_4_ = fVar192;
                        auVar168._0_4_ = fVar192;
                        auVar168._8_4_ = fVar192;
                        auVar168._12_4_ = fVar192;
                        auVar106 = vfmadd132ps_fma(auVar168,auVar106,auVar7);
                        auVar242 = vbroadcastss_avx512f(auVar106);
                        auVar243 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar213 = vpermps_avx512f(auVar243,ZEXT1664(auVar106));
                        auVar219 = vbroadcastss_avx512f(ZEXT416(2));
                        local_240 = vpermps_avx512f(auVar219,ZEXT1664(auVar106));
                        local_2c0[0] = (RTCHitN)auVar242[0];
                        local_2c0[1] = (RTCHitN)auVar242[1];
                        local_2c0[2] = (RTCHitN)auVar242[2];
                        local_2c0[3] = (RTCHitN)auVar242[3];
                        local_2c0[4] = (RTCHitN)auVar242[4];
                        local_2c0[5] = (RTCHitN)auVar242[5];
                        local_2c0[6] = (RTCHitN)auVar242[6];
                        local_2c0[7] = (RTCHitN)auVar242[7];
                        local_2c0[8] = (RTCHitN)auVar242[8];
                        local_2c0[9] = (RTCHitN)auVar242[9];
                        local_2c0[10] = (RTCHitN)auVar242[10];
                        local_2c0[0xb] = (RTCHitN)auVar242[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar242[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar242[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar242[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar242[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar242[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar242[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar242[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar242[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar242[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar242[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar242[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar242[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar242[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar242[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar242[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar242[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar242[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar242[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar242[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar242[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar242[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar242[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar242[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar242[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar242[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar242[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar242[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar242[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar242[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar242[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar242[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar242[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar242[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar242[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar242[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar242[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar242[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar242[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar242[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar242[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar242[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar242[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar242[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar242[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar242[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar242[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar242[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar242[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar242[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar242[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar242[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar242[0x3f];
                        local_280 = auVar213;
                        local_180 = local_440._0_8_;
                        uStack_178 = local_440._8_8_;
                        uStack_170 = local_440._16_8_;
                        uStack_168 = local_440._24_8_;
                        uStack_160 = local_440._32_8_;
                        uStack_158 = local_440._40_8_;
                        uStack_150 = local_440._48_8_;
                        uStack_148 = local_440._56_8_;
                        auVar242 = vmovdqa64_avx512f(local_480);
                        local_140 = vmovdqa64_avx512f(auVar242);
                        auVar117 = vpcmpeqd_avx2(auVar242._0_32_,auVar242._0_32_);
                        local_850[3] = auVar117;
                        local_850[2] = auVar117;
                        local_850[1] = auVar117;
                        *local_850 = auVar117;
                        local_100 = vbroadcastss_avx512f(ZEXT416((local_880.context)->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416((local_880.context)->instPrimID[0]))
                        ;
                        auVar242 = vmovdqa64_avx512f(local_300);
                        local_7c0 = vmovdqa64_avx512f(auVar242);
                        local_880.valid = (int *)local_7c0;
                        local_880.geometryUserPtr = pGVar98->userPtr;
                        local_880.hit = local_2c0;
                        local_880.N = 0x10;
                        local_820 = auVar181._0_32_;
                        local_880.ray = (RTCRayN *)ray;
                        if (pGVar98->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar213 = ZEXT1664(auVar213._0_16_);
                          auVar219 = ZEXT1664(auVar219._0_16_);
                          (*pGVar98->intersectionFilterN)(&local_880);
                          auVar224 = ZEXT3264(local_4c0._0_32_);
                          auVar181 = ZEXT3264(local_820);
                          auVar242 = vmovdqa64_avx512f(local_7c0);
                          pGVar98 = (Geometry *)local_840._0_8_;
                        }
                        uVar187 = vptestmd_avx512f(auVar242,auVar242);
                        if ((short)uVar187 == 0) {
LAB_01e4f591:
                          *(int *)(ray + k * 4 + 0x200) = auVar181._0_4_;
                        }
                        else {
                          p_Var20 = context->args->filter;
                          if ((p_Var20 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar98->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar213 = ZEXT1664(auVar213._0_16_);
                            auVar219 = ZEXT1664(auVar219._0_16_);
                            (*p_Var20)(&local_880);
                            auVar224 = ZEXT3264(local_4c0._0_32_);
                            auVar181 = ZEXT3264(local_820);
                            auVar242 = vmovdqa64_avx512f(local_7c0);
                            pGVar98 = (Geometry *)local_840._0_8_;
                          }
                          uVar35 = vptestmd_avx512f(auVar242,auVar242);
                          if ((short)uVar35 == 0) goto LAB_01e4f591;
                          iVar1 = *(int *)(local_880.hit + 4);
                          iVar2 = *(int *)(local_880.hit + 8);
                          iVar78 = *(int *)(local_880.hit + 0xc);
                          iVar79 = *(int *)(local_880.hit + 0x10);
                          iVar80 = *(int *)(local_880.hit + 0x14);
                          iVar81 = *(int *)(local_880.hit + 0x18);
                          iVar82 = *(int *)(local_880.hit + 0x1c);
                          iVar83 = *(int *)(local_880.hit + 0x20);
                          iVar84 = *(int *)(local_880.hit + 0x24);
                          iVar85 = *(int *)(local_880.hit + 0x28);
                          iVar86 = *(int *)(local_880.hit + 0x2c);
                          iVar87 = *(int *)(local_880.hit + 0x30);
                          iVar88 = *(int *)(local_880.hit + 0x34);
                          iVar89 = *(int *)(local_880.hit + 0x38);
                          iVar90 = *(int *)(local_880.hit + 0x3c);
                          bVar101 = (byte)uVar35;
                          bVar21 = (bool)((byte)(uVar35 >> 1) & 1);
                          bVar22 = (bool)((byte)(uVar35 >> 2) & 1);
                          bVar23 = (bool)((byte)(uVar35 >> 3) & 1);
                          bVar24 = (bool)((byte)(uVar35 >> 4) & 1);
                          bVar25 = (bool)((byte)(uVar35 >> 5) & 1);
                          bVar26 = (bool)((byte)(uVar35 >> 6) & 1);
                          bVar27 = (bool)((byte)(uVar35 >> 7) & 1);
                          bVar92 = (byte)(uVar35 >> 8);
                          bVar28 = (bool)((byte)(uVar35 >> 9) & 1);
                          bVar29 = (bool)((byte)(uVar35 >> 10) & 1);
                          bVar30 = (bool)((byte)(uVar35 >> 0xb) & 1);
                          bVar31 = (bool)((byte)(uVar35 >> 0xc) & 1);
                          bVar32 = (bool)((byte)(uVar35 >> 0xd) & 1);
                          bVar33 = (bool)((byte)(uVar35 >> 0xe) & 1);
                          bVar34 = SUB81(uVar35 >> 0xf,0);
                          *(uint *)(local_880.ray + 0x300) =
                               (uint)(bVar101 & 1) * *(int *)local_880.hit |
                               (uint)!(bool)(bVar101 & 1) * *(int *)(local_880.ray + 0x300);
                          *(uint *)(local_880.ray + 0x304) =
                               (uint)bVar21 * iVar1 |
                               (uint)!bVar21 * *(int *)(local_880.ray + 0x304);
                          *(uint *)(local_880.ray + 0x308) =
                               (uint)bVar22 * iVar2 |
                               (uint)!bVar22 * *(int *)(local_880.ray + 0x308);
                          *(uint *)(local_880.ray + 0x30c) =
                               (uint)bVar23 * iVar78 |
                               (uint)!bVar23 * *(int *)(local_880.ray + 0x30c);
                          *(uint *)(local_880.ray + 0x310) =
                               (uint)bVar24 * iVar79 |
                               (uint)!bVar24 * *(int *)(local_880.ray + 0x310);
                          *(uint *)(local_880.ray + 0x314) =
                               (uint)bVar25 * iVar80 |
                               (uint)!bVar25 * *(int *)(local_880.ray + 0x314);
                          *(uint *)(local_880.ray + 0x318) =
                               (uint)bVar26 * iVar81 |
                               (uint)!bVar26 * *(int *)(local_880.ray + 0x318);
                          *(uint *)(local_880.ray + 0x31c) =
                               (uint)bVar27 * iVar82 |
                               (uint)!bVar27 * *(int *)(local_880.ray + 0x31c);
                          *(uint *)(local_880.ray + 800) =
                               (uint)(bVar92 & 1) * iVar83 |
                               (uint)!(bool)(bVar92 & 1) * *(int *)(local_880.ray + 800);
                          *(uint *)(local_880.ray + 0x324) =
                               (uint)bVar28 * iVar84 |
                               (uint)!bVar28 * *(int *)(local_880.ray + 0x324);
                          *(uint *)(local_880.ray + 0x328) =
                               (uint)bVar29 * iVar85 |
                               (uint)!bVar29 * *(int *)(local_880.ray + 0x328);
                          *(uint *)(local_880.ray + 0x32c) =
                               (uint)bVar30 * iVar86 |
                               (uint)!bVar30 * *(int *)(local_880.ray + 0x32c);
                          *(uint *)(local_880.ray + 0x330) =
                               (uint)bVar31 * iVar87 |
                               (uint)!bVar31 * *(int *)(local_880.ray + 0x330);
                          *(uint *)(local_880.ray + 0x334) =
                               (uint)bVar32 * iVar88 |
                               (uint)!bVar32 * *(int *)(local_880.ray + 0x334);
                          *(uint *)(local_880.ray + 0x338) =
                               (uint)bVar33 * iVar89 |
                               (uint)!bVar33 * *(int *)(local_880.ray + 0x338);
                          *(uint *)(local_880.ray + 0x33c) =
                               (uint)bVar34 * iVar90 |
                               (uint)!bVar34 * *(int *)(local_880.ray + 0x33c);
                          iVar1 = *(int *)(local_880.hit + 0x44);
                          iVar2 = *(int *)(local_880.hit + 0x48);
                          iVar78 = *(int *)(local_880.hit + 0x4c);
                          iVar79 = *(int *)(local_880.hit + 0x50);
                          iVar80 = *(int *)(local_880.hit + 0x54);
                          iVar81 = *(int *)(local_880.hit + 0x58);
                          iVar82 = *(int *)(local_880.hit + 0x5c);
                          iVar83 = *(int *)(local_880.hit + 0x60);
                          iVar84 = *(int *)(local_880.hit + 100);
                          iVar85 = *(int *)(local_880.hit + 0x68);
                          iVar86 = *(int *)(local_880.hit + 0x6c);
                          iVar87 = *(int *)(local_880.hit + 0x70);
                          iVar88 = *(int *)(local_880.hit + 0x74);
                          iVar89 = *(int *)(local_880.hit + 0x78);
                          iVar90 = *(int *)(local_880.hit + 0x7c);
                          bVar21 = (bool)((byte)(uVar35 >> 1) & 1);
                          bVar22 = (bool)((byte)(uVar35 >> 2) & 1);
                          bVar23 = (bool)((byte)(uVar35 >> 3) & 1);
                          bVar24 = (bool)((byte)(uVar35 >> 4) & 1);
                          bVar25 = (bool)((byte)(uVar35 >> 5) & 1);
                          bVar26 = (bool)((byte)(uVar35 >> 6) & 1);
                          bVar27 = (bool)((byte)(uVar35 >> 7) & 1);
                          bVar28 = (bool)((byte)(uVar35 >> 9) & 1);
                          bVar29 = (bool)((byte)(uVar35 >> 10) & 1);
                          bVar30 = (bool)((byte)(uVar35 >> 0xb) & 1);
                          bVar31 = (bool)((byte)(uVar35 >> 0xc) & 1);
                          bVar32 = (bool)((byte)(uVar35 >> 0xd) & 1);
                          bVar33 = (bool)((byte)(uVar35 >> 0xe) & 1);
                          bVar34 = SUB81(uVar35 >> 0xf,0);
                          *(uint *)(local_880.ray + 0x340) =
                               (uint)(bVar101 & 1) * *(int *)(local_880.hit + 0x40) |
                               (uint)!(bool)(bVar101 & 1) * *(int *)(local_880.ray + 0x340);
                          *(uint *)(local_880.ray + 0x344) =
                               (uint)bVar21 * iVar1 |
                               (uint)!bVar21 * *(int *)(local_880.ray + 0x344);
                          *(uint *)(local_880.ray + 0x348) =
                               (uint)bVar22 * iVar2 |
                               (uint)!bVar22 * *(int *)(local_880.ray + 0x348);
                          *(uint *)(local_880.ray + 0x34c) =
                               (uint)bVar23 * iVar78 |
                               (uint)!bVar23 * *(int *)(local_880.ray + 0x34c);
                          *(uint *)(local_880.ray + 0x350) =
                               (uint)bVar24 * iVar79 |
                               (uint)!bVar24 * *(int *)(local_880.ray + 0x350);
                          *(uint *)(local_880.ray + 0x354) =
                               (uint)bVar25 * iVar80 |
                               (uint)!bVar25 * *(int *)(local_880.ray + 0x354);
                          *(uint *)(local_880.ray + 0x358) =
                               (uint)bVar26 * iVar81 |
                               (uint)!bVar26 * *(int *)(local_880.ray + 0x358);
                          *(uint *)(local_880.ray + 0x35c) =
                               (uint)bVar27 * iVar82 |
                               (uint)!bVar27 * *(int *)(local_880.ray + 0x35c);
                          *(uint *)(local_880.ray + 0x360) =
                               (uint)(bVar92 & 1) * iVar83 |
                               (uint)!(bool)(bVar92 & 1) * *(int *)(local_880.ray + 0x360);
                          *(uint *)(local_880.ray + 0x364) =
                               (uint)bVar28 * iVar84 |
                               (uint)!bVar28 * *(int *)(local_880.ray + 0x364);
                          *(uint *)(local_880.ray + 0x368) =
                               (uint)bVar29 * iVar85 |
                               (uint)!bVar29 * *(int *)(local_880.ray + 0x368);
                          *(uint *)(local_880.ray + 0x36c) =
                               (uint)bVar30 * iVar86 |
                               (uint)!bVar30 * *(int *)(local_880.ray + 0x36c);
                          *(uint *)(local_880.ray + 0x370) =
                               (uint)bVar31 * iVar87 |
                               (uint)!bVar31 * *(int *)(local_880.ray + 0x370);
                          *(uint *)(local_880.ray + 0x374) =
                               (uint)bVar32 * iVar88 |
                               (uint)!bVar32 * *(int *)(local_880.ray + 0x374);
                          *(uint *)(local_880.ray + 0x378) =
                               (uint)bVar33 * iVar89 |
                               (uint)!bVar33 * *(int *)(local_880.ray + 0x378);
                          *(uint *)(local_880.ray + 0x37c) =
                               (uint)bVar34 * iVar90 |
                               (uint)!bVar34 * *(int *)(local_880.ray + 0x37c);
                          iVar1 = *(int *)(local_880.hit + 0x84);
                          iVar2 = *(int *)(local_880.hit + 0x88);
                          iVar78 = *(int *)(local_880.hit + 0x8c);
                          iVar79 = *(int *)(local_880.hit + 0x90);
                          iVar80 = *(int *)(local_880.hit + 0x94);
                          iVar81 = *(int *)(local_880.hit + 0x98);
                          iVar82 = *(int *)(local_880.hit + 0x9c);
                          iVar83 = *(int *)(local_880.hit + 0xa0);
                          iVar84 = *(int *)(local_880.hit + 0xa4);
                          iVar85 = *(int *)(local_880.hit + 0xa8);
                          iVar86 = *(int *)(local_880.hit + 0xac);
                          iVar87 = *(int *)(local_880.hit + 0xb0);
                          iVar88 = *(int *)(local_880.hit + 0xb4);
                          iVar89 = *(int *)(local_880.hit + 0xb8);
                          iVar90 = *(int *)(local_880.hit + 0xbc);
                          bVar21 = (bool)((byte)(uVar35 >> 1) & 1);
                          bVar22 = (bool)((byte)(uVar35 >> 2) & 1);
                          bVar23 = (bool)((byte)(uVar35 >> 3) & 1);
                          bVar24 = (bool)((byte)(uVar35 >> 4) & 1);
                          bVar25 = (bool)((byte)(uVar35 >> 5) & 1);
                          bVar26 = (bool)((byte)(uVar35 >> 6) & 1);
                          bVar27 = (bool)((byte)(uVar35 >> 7) & 1);
                          bVar28 = (bool)((byte)(uVar35 >> 9) & 1);
                          bVar29 = (bool)((byte)(uVar35 >> 10) & 1);
                          bVar30 = (bool)((byte)(uVar35 >> 0xb) & 1);
                          bVar31 = (bool)((byte)(uVar35 >> 0xc) & 1);
                          bVar32 = (bool)((byte)(uVar35 >> 0xd) & 1);
                          bVar33 = (bool)((byte)(uVar35 >> 0xe) & 1);
                          bVar34 = SUB81(uVar35 >> 0xf,0);
                          *(uint *)(local_880.ray + 0x380) =
                               (uint)(bVar101 & 1) * *(int *)(local_880.hit + 0x80) |
                               (uint)!(bool)(bVar101 & 1) * *(int *)(local_880.ray + 0x380);
                          *(uint *)(local_880.ray + 900) =
                               (uint)bVar21 * iVar1 | (uint)!bVar21 * *(int *)(local_880.ray + 900);
                          *(uint *)(local_880.ray + 0x388) =
                               (uint)bVar22 * iVar2 |
                               (uint)!bVar22 * *(int *)(local_880.ray + 0x388);
                          *(uint *)(local_880.ray + 0x38c) =
                               (uint)bVar23 * iVar78 |
                               (uint)!bVar23 * *(int *)(local_880.ray + 0x38c);
                          *(uint *)(local_880.ray + 0x390) =
                               (uint)bVar24 * iVar79 |
                               (uint)!bVar24 * *(int *)(local_880.ray + 0x390);
                          *(uint *)(local_880.ray + 0x394) =
                               (uint)bVar25 * iVar80 |
                               (uint)!bVar25 * *(int *)(local_880.ray + 0x394);
                          *(uint *)(local_880.ray + 0x398) =
                               (uint)bVar26 * iVar81 |
                               (uint)!bVar26 * *(int *)(local_880.ray + 0x398);
                          *(uint *)(local_880.ray + 0x39c) =
                               (uint)bVar27 * iVar82 |
                               (uint)!bVar27 * *(int *)(local_880.ray + 0x39c);
                          *(uint *)(local_880.ray + 0x3a0) =
                               (uint)(bVar92 & 1) * iVar83 |
                               (uint)!(bool)(bVar92 & 1) * *(int *)(local_880.ray + 0x3a0);
                          *(uint *)(local_880.ray + 0x3a4) =
                               (uint)bVar28 * iVar84 |
                               (uint)!bVar28 * *(int *)(local_880.ray + 0x3a4);
                          *(uint *)(local_880.ray + 0x3a8) =
                               (uint)bVar29 * iVar85 |
                               (uint)!bVar29 * *(int *)(local_880.ray + 0x3a8);
                          *(uint *)(local_880.ray + 0x3ac) =
                               (uint)bVar30 * iVar86 |
                               (uint)!bVar30 * *(int *)(local_880.ray + 0x3ac);
                          *(uint *)(local_880.ray + 0x3b0) =
                               (uint)bVar31 * iVar87 |
                               (uint)!bVar31 * *(int *)(local_880.ray + 0x3b0);
                          *(uint *)(local_880.ray + 0x3b4) =
                               (uint)bVar32 * iVar88 |
                               (uint)!bVar32 * *(int *)(local_880.ray + 0x3b4);
                          *(uint *)(local_880.ray + 0x3b8) =
                               (uint)bVar33 * iVar89 |
                               (uint)!bVar33 * *(int *)(local_880.ray + 0x3b8);
                          *(uint *)(local_880.ray + 0x3bc) =
                               (uint)bVar34 * iVar90 |
                               (uint)!bVar34 * *(int *)(local_880.ray + 0x3bc);
                          iVar1 = *(int *)(local_880.hit + 0xc4);
                          iVar2 = *(int *)(local_880.hit + 200);
                          iVar78 = *(int *)(local_880.hit + 0xcc);
                          iVar79 = *(int *)(local_880.hit + 0xd0);
                          iVar80 = *(int *)(local_880.hit + 0xd4);
                          iVar81 = *(int *)(local_880.hit + 0xd8);
                          iVar82 = *(int *)(local_880.hit + 0xdc);
                          iVar83 = *(int *)(local_880.hit + 0xe0);
                          iVar84 = *(int *)(local_880.hit + 0xe4);
                          iVar85 = *(int *)(local_880.hit + 0xe8);
                          iVar86 = *(int *)(local_880.hit + 0xec);
                          iVar87 = *(int *)(local_880.hit + 0xf0);
                          iVar88 = *(int *)(local_880.hit + 0xf4);
                          iVar89 = *(int *)(local_880.hit + 0xf8);
                          iVar90 = *(int *)(local_880.hit + 0xfc);
                          bVar21 = (bool)((byte)(uVar35 >> 1) & 1);
                          bVar22 = (bool)((byte)(uVar35 >> 2) & 1);
                          bVar23 = (bool)((byte)(uVar35 >> 3) & 1);
                          bVar24 = (bool)((byte)(uVar35 >> 4) & 1);
                          bVar25 = (bool)((byte)(uVar35 >> 5) & 1);
                          bVar26 = (bool)((byte)(uVar35 >> 6) & 1);
                          bVar27 = (bool)((byte)(uVar35 >> 7) & 1);
                          bVar28 = (bool)((byte)(uVar35 >> 9) & 1);
                          bVar29 = (bool)((byte)(uVar35 >> 10) & 1);
                          bVar30 = (bool)((byte)(uVar35 >> 0xb) & 1);
                          bVar31 = (bool)((byte)(uVar35 >> 0xc) & 1);
                          bVar32 = (bool)((byte)(uVar35 >> 0xd) & 1);
                          bVar33 = (bool)((byte)(uVar35 >> 0xe) & 1);
                          bVar34 = SUB81(uVar35 >> 0xf,0);
                          *(uint *)(local_880.ray + 0x3c0) =
                               (uint)(bVar101 & 1) * *(int *)(local_880.hit + 0xc0) |
                               (uint)!(bool)(bVar101 & 1) * *(int *)(local_880.ray + 0x3c0);
                          *(uint *)(local_880.ray + 0x3c4) =
                               (uint)bVar21 * iVar1 |
                               (uint)!bVar21 * *(int *)(local_880.ray + 0x3c4);
                          *(uint *)(local_880.ray + 0x3c8) =
                               (uint)bVar22 * iVar2 |
                               (uint)!bVar22 * *(int *)(local_880.ray + 0x3c8);
                          *(uint *)(local_880.ray + 0x3cc) =
                               (uint)bVar23 * iVar78 |
                               (uint)!bVar23 * *(int *)(local_880.ray + 0x3cc);
                          *(uint *)(local_880.ray + 0x3d0) =
                               (uint)bVar24 * iVar79 |
                               (uint)!bVar24 * *(int *)(local_880.ray + 0x3d0);
                          *(uint *)(local_880.ray + 0x3d4) =
                               (uint)bVar25 * iVar80 |
                               (uint)!bVar25 * *(int *)(local_880.ray + 0x3d4);
                          *(uint *)(local_880.ray + 0x3d8) =
                               (uint)bVar26 * iVar81 |
                               (uint)!bVar26 * *(int *)(local_880.ray + 0x3d8);
                          *(uint *)(local_880.ray + 0x3dc) =
                               (uint)bVar27 * iVar82 |
                               (uint)!bVar27 * *(int *)(local_880.ray + 0x3dc);
                          *(uint *)(local_880.ray + 0x3e0) =
                               (uint)(bVar92 & 1) * iVar83 |
                               (uint)!(bool)(bVar92 & 1) * *(int *)(local_880.ray + 0x3e0);
                          *(uint *)(local_880.ray + 0x3e4) =
                               (uint)bVar28 * iVar84 |
                               (uint)!bVar28 * *(int *)(local_880.ray + 0x3e4);
                          *(uint *)(local_880.ray + 1000) =
                               (uint)bVar29 * iVar85 |
                               (uint)!bVar29 * *(int *)(local_880.ray + 1000);
                          *(uint *)(local_880.ray + 0x3ec) =
                               (uint)bVar30 * iVar86 |
                               (uint)!bVar30 * *(int *)(local_880.ray + 0x3ec);
                          *(uint *)(local_880.ray + 0x3f0) =
                               (uint)bVar31 * iVar87 |
                               (uint)!bVar31 * *(int *)(local_880.ray + 0x3f0);
                          *(uint *)(local_880.ray + 0x3f4) =
                               (uint)bVar32 * iVar88 |
                               (uint)!bVar32 * *(int *)(local_880.ray + 0x3f4);
                          *(uint *)(local_880.ray + 0x3f8) =
                               (uint)bVar33 * iVar89 |
                               (uint)!bVar33 * *(int *)(local_880.ray + 0x3f8);
                          *(uint *)(local_880.ray + 0x3fc) =
                               (uint)bVar34 * iVar90 |
                               (uint)!bVar34 * *(int *)(local_880.ray + 0x3fc);
                          iVar1 = *(int *)(local_880.hit + 0x104);
                          iVar2 = *(int *)(local_880.hit + 0x108);
                          iVar78 = *(int *)(local_880.hit + 0x10c);
                          iVar79 = *(int *)(local_880.hit + 0x110);
                          iVar80 = *(int *)(local_880.hit + 0x114);
                          iVar81 = *(int *)(local_880.hit + 0x118);
                          iVar82 = *(int *)(local_880.hit + 0x11c);
                          iVar83 = *(int *)(local_880.hit + 0x120);
                          iVar84 = *(int *)(local_880.hit + 0x124);
                          iVar85 = *(int *)(local_880.hit + 0x128);
                          iVar86 = *(int *)(local_880.hit + 300);
                          iVar87 = *(int *)(local_880.hit + 0x130);
                          iVar88 = *(int *)(local_880.hit + 0x134);
                          iVar89 = *(int *)(local_880.hit + 0x138);
                          iVar90 = *(int *)(local_880.hit + 0x13c);
                          bVar21 = (bool)((byte)(uVar35 >> 1) & 1);
                          bVar22 = (bool)((byte)(uVar35 >> 2) & 1);
                          bVar23 = (bool)((byte)(uVar35 >> 3) & 1);
                          bVar24 = (bool)((byte)(uVar35 >> 4) & 1);
                          bVar25 = (bool)((byte)(uVar35 >> 5) & 1);
                          bVar26 = (bool)((byte)(uVar35 >> 6) & 1);
                          bVar27 = (bool)((byte)(uVar35 >> 7) & 1);
                          bVar28 = (bool)((byte)(uVar35 >> 9) & 1);
                          bVar29 = (bool)((byte)(uVar35 >> 10) & 1);
                          bVar30 = (bool)((byte)(uVar35 >> 0xb) & 1);
                          bVar31 = (bool)((byte)(uVar35 >> 0xc) & 1);
                          bVar32 = (bool)((byte)(uVar35 >> 0xd) & 1);
                          bVar33 = (bool)((byte)(uVar35 >> 0xe) & 1);
                          bVar34 = SUB81(uVar35 >> 0xf,0);
                          *(uint *)(local_880.ray + 0x400) =
                               (uint)(bVar101 & 1) * *(int *)(local_880.hit + 0x100) |
                               (uint)!(bool)(bVar101 & 1) * *(int *)(local_880.ray + 0x400);
                          *(uint *)(local_880.ray + 0x404) =
                               (uint)bVar21 * iVar1 |
                               (uint)!bVar21 * *(int *)(local_880.ray + 0x404);
                          *(uint *)(local_880.ray + 0x408) =
                               (uint)bVar22 * iVar2 |
                               (uint)!bVar22 * *(int *)(local_880.ray + 0x408);
                          *(uint *)(local_880.ray + 0x40c) =
                               (uint)bVar23 * iVar78 |
                               (uint)!bVar23 * *(int *)(local_880.ray + 0x40c);
                          *(uint *)(local_880.ray + 0x410) =
                               (uint)bVar24 * iVar79 |
                               (uint)!bVar24 * *(int *)(local_880.ray + 0x410);
                          *(uint *)(local_880.ray + 0x414) =
                               (uint)bVar25 * iVar80 |
                               (uint)!bVar25 * *(int *)(local_880.ray + 0x414);
                          *(uint *)(local_880.ray + 0x418) =
                               (uint)bVar26 * iVar81 |
                               (uint)!bVar26 * *(int *)(local_880.ray + 0x418);
                          *(uint *)(local_880.ray + 0x41c) =
                               (uint)bVar27 * iVar82 |
                               (uint)!bVar27 * *(int *)(local_880.ray + 0x41c);
                          *(uint *)(local_880.ray + 0x420) =
                               (uint)(bVar92 & 1) * iVar83 |
                               (uint)!(bool)(bVar92 & 1) * *(int *)(local_880.ray + 0x420);
                          *(uint *)(local_880.ray + 0x424) =
                               (uint)bVar28 * iVar84 |
                               (uint)!bVar28 * *(int *)(local_880.ray + 0x424);
                          *(uint *)(local_880.ray + 0x428) =
                               (uint)bVar29 * iVar85 |
                               (uint)!bVar29 * *(int *)(local_880.ray + 0x428);
                          *(uint *)(local_880.ray + 0x42c) =
                               (uint)bVar30 * iVar86 |
                               (uint)!bVar30 * *(int *)(local_880.ray + 0x42c);
                          *(uint *)(local_880.ray + 0x430) =
                               (uint)bVar31 * iVar87 |
                               (uint)!bVar31 * *(int *)(local_880.ray + 0x430);
                          *(uint *)(local_880.ray + 0x434) =
                               (uint)bVar32 * iVar88 |
                               (uint)!bVar32 * *(int *)(local_880.ray + 0x434);
                          *(uint *)(local_880.ray + 0x438) =
                               (uint)bVar33 * iVar89 |
                               (uint)!bVar33 * *(int *)(local_880.ray + 0x438);
                          *(uint *)(local_880.ray + 0x43c) =
                               (uint)bVar34 * iVar90 |
                               (uint)!bVar34 * *(int *)(local_880.ray + 0x43c);
                          auVar242 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_880.hit + 0x140)
                                                      );
                          auVar242 = vmovdqu32_avx512f(auVar242);
                          *(undefined1 (*) [64])(local_880.ray + 0x440) = auVar242;
                          auVar242 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_880.hit + 0x180)
                                                      );
                          auVar242 = vmovdqu32_avx512f(auVar242);
                          *(undefined1 (*) [64])(local_880.ray + 0x480) = auVar242;
                          auVar242 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_880.hit + 0x1c0)
                                                      );
                          auVar242 = vmovdqa32_avx512f(auVar242);
                          *(undefined1 (*) [64])(local_880.ray + 0x4c0) = auVar242;
                          auVar242 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_880.hit + 0x200)
                                                      );
                          auVar242 = vmovdqa32_avx512f(auVar242);
                          *(undefined1 (*) [64])(local_880.ray + 0x500) = auVar242;
                          auVar181 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
                        }
                        bVar101 = ~(byte)(1 << ((uint)uVar93 & 0x1f)) & (byte)uVar102;
                        uVar165 = auVar181._0_4_;
                        auVar177._4_4_ = uVar165;
                        auVar177._0_4_ = uVar165;
                        auVar177._8_4_ = uVar165;
                        auVar177._12_4_ = uVar165;
                        auVar177._16_4_ = uVar165;
                        auVar177._20_4_ = uVar165;
                        auVar177._24_4_ = uVar165;
                        auVar177._28_4_ = uVar165;
                        uVar187 = vcmpps_avx512vl(auVar224._0_32_,auVar177,2);
                        if ((bVar101 & (byte)uVar187) == 0) goto LAB_01e4f629;
                        bVar101 = bVar101 & (byte)uVar187;
                        uVar102 = (ulong)bVar101;
                        auVar178._8_4_ = 0x7f800000;
                        auVar178._0_8_ = 0x7f8000007f800000;
                        auVar178._12_4_ = 0x7f800000;
                        auVar178._16_4_ = 0x7f800000;
                        auVar178._20_4_ = 0x7f800000;
                        auVar178._24_4_ = 0x7f800000;
                        auVar178._28_4_ = 0x7f800000;
                        auVar117 = vblendmps_avx512vl(auVar178,auVar224._0_32_);
                        auVar152._0_4_ =
                             (uint)(bVar101 & 1) * auVar117._0_4_ |
                             (uint)!(bool)(bVar101 & 1) * 0x7f800000;
                        bVar21 = (bool)(bVar101 >> 1 & 1);
                        auVar152._4_4_ = (uint)bVar21 * auVar117._4_4_ | (uint)!bVar21 * 0x7f800000;
                        bVar21 = (bool)(bVar101 >> 2 & 1);
                        auVar152._8_4_ = (uint)bVar21 * auVar117._8_4_ | (uint)!bVar21 * 0x7f800000;
                        bVar21 = (bool)(bVar101 >> 3 & 1);
                        auVar152._12_4_ =
                             (uint)bVar21 * auVar117._12_4_ | (uint)!bVar21 * 0x7f800000;
                        bVar21 = (bool)(bVar101 >> 4 & 1);
                        auVar152._16_4_ =
                             (uint)bVar21 * auVar117._16_4_ | (uint)!bVar21 * 0x7f800000;
                        bVar21 = (bool)(bVar101 >> 5 & 1);
                        auVar152._20_4_ =
                             (uint)bVar21 * auVar117._20_4_ | (uint)!bVar21 * 0x7f800000;
                        bVar21 = (bool)(bVar101 >> 6 & 1);
                        auVar152._24_4_ =
                             (uint)bVar21 * auVar117._24_4_ | (uint)!bVar21 * 0x7f800000;
                        auVar152._28_4_ =
                             (uint)(bVar101 >> 7) * auVar117._28_4_ |
                             (uint)!(bool)(bVar101 >> 7) * 0x7f800000;
                        auVar117 = vshufps_avx(auVar152,auVar152,0xb1);
                        auVar117 = vminps_avx(auVar152,auVar117);
                        auVar116 = vshufpd_avx(auVar117,auVar117,5);
                        auVar117 = vminps_avx(auVar117,auVar116);
                        auVar116 = vpermpd_avx2(auVar117,0x4e);
                        auVar117 = vminps_avx(auVar117,auVar116);
                        uVar187 = vcmpps_avx512vl(auVar152,auVar117,0);
                        bVar92 = (byte)uVar187 & bVar101;
                        if (bVar92 != 0) {
                          bVar101 = bVar92;
                        }
                        uVar94 = 0;
                        for (uVar95 = (uint)bVar101; (uVar95 & 1) == 0;
                            uVar95 = uVar95 >> 1 | 0x80000000) {
                          uVar94 = uVar94 + 1;
                        }
                        uVar93 = (ulong)uVar94;
                      } while( true );
                    }
                    fVar192 = local_5a0[uVar93];
                    uVar165 = *(undefined4 *)(local_580 + uVar93 * 4);
                    fVar185 = 1.0 - fVar192;
                    fVar184 = fVar185 * fVar185 * -3.0;
                    auVar213 = ZEXT464((uint)fVar184);
                    auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar185 * fVar185)),
                                               ZEXT416((uint)(fVar192 * fVar185)),
                                               ZEXT416(0xc0000000));
                    auVar105 = vfmsub132ss_fma(ZEXT416((uint)(fVar192 * fVar185)),
                                               ZEXT416((uint)(fVar192 * fVar192)),
                                               ZEXT416(0x40000000));
                    fVar185 = auVar106._0_4_ * 3.0;
                    fVar186 = auVar105._0_4_ * 3.0;
                    fVar191 = fVar192 * fVar192 * 3.0;
                    auVar215._0_4_ = fVar191 * fVar163;
                    auVar215._4_4_ = fVar191 * fVar164;
                    auVar215._8_4_ = fVar191 * fVar182;
                    auVar215._12_4_ = fVar191 * fVar183;
                    auVar219 = ZEXT1664(auVar215);
                    auVar195._4_4_ = fVar186;
                    auVar195._0_4_ = fVar186;
                    auVar195._8_4_ = fVar186;
                    auVar195._12_4_ = fVar186;
                    auVar106 = vfmadd132ps_fma(auVar195,auVar215,auVar108);
                    auVar203._4_4_ = fVar185;
                    auVar203._0_4_ = fVar185;
                    auVar203._8_4_ = fVar185;
                    auVar203._12_4_ = fVar185;
                    auVar106 = vfmadd132ps_fma(auVar203,auVar106,auVar188);
                    auVar196._4_4_ = fVar184;
                    auVar196._0_4_ = fVar184;
                    auVar196._8_4_ = fVar184;
                    auVar196._12_4_ = fVar184;
                    auVar106 = vfmadd132ps_fma(auVar196,auVar106,auVar7);
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_560 + uVar93 * 4);
                    *(int *)(ray + k * 4 + 0x300) = auVar106._0_4_;
                    uVar16 = vextractps_avx(auVar106,1);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar16;
                    uVar16 = vextractps_avx(auVar106,2);
                    *(undefined4 *)(ray + k * 4 + 0x380) = uVar16;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar192;
                    *(undefined4 *)(ray + k * 4 + 0x400) = uVar165;
                    *(uint *)(ray + k * 4 + 0x440) = uVar14;
                    *(uint *)(ray + k * 4 + 0x480) = uVar99;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01e4f263;
      }
LAB_01e4e917:
      uVar165 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar41._4_4_ = uVar165;
      auVar41._0_4_ = uVar165;
      auVar41._8_4_ = uVar165;
      auVar41._12_4_ = uVar165;
      auVar41._16_4_ = uVar165;
      auVar41._20_4_ = uVar165;
      auVar41._24_4_ = uVar165;
      auVar41._28_4_ = uVar165;
      uVar187 = vcmpps_avx512vl(local_320,auVar41,2);
      uVar99 = (uint)uVar100 & (uint)uVar100 + 0xff & (uint)uVar187;
      uVar100 = (ulong)uVar99;
    } while (uVar99 != 0);
  }
  return;
LAB_01e4f629:
  auVar117 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar242 = ZEXT3264(auVar117);
  auVar243 = ZEXT464(0xbf800000);
  auVar117 = vmovdqa64_avx512vl(local_3e0);
  auVar244 = ZEXT3264(auVar117);
LAB_01e4f263:
  lVar97 = lVar97 + 8;
  if (iVar15 <= (int)lVar97) goto LAB_01e4e917;
  goto LAB_01e4e9be;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }